

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::reflux
          (MLNodeLaplacian *this,int crse_amrlev,MultiFab *res,MultiFab *crse_sol,MultiFab *crse_rhs
          ,MultiFab *a_fine_res,MultiFab *fine_sol,MultiFab *fine_rhs)

{
  DistributionMapping *dm;
  long lVar1;
  int iVar2;
  LinOpBCType LVar3;
  LinOpBCType LVar4;
  pointer pVVar5;
  Geometry *this_00;
  Geometry *this_01;
  pointer paVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer puVar10;
  FabArray<amrex::IArrayBox> *this_02;
  pointer puVar11;
  undefined8 *puVar12;
  FabArray<amrex::FArrayBox> *this_03;
  int iVar13;
  int i;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  uint uVar48;
  int iVar49;
  long lVar50;
  int iVar51;
  uint uVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  int iVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  int iVar73;
  long lVar74;
  long lVar75;
  int iVar76;
  int iVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  int iVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  int ioff;
  int iVar85;
  long lVar86;
  long lVar87;
  bool bVar88;
  bool bVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  undefined *puVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  undefined1 auVar137 [16];
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar161;
  undefined1 auVar155 [16];
  double dVar154;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar173;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  double dVar196;
  double dVar197;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  double dVar203;
  double dVar204;
  double dVar205;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  double dVar206;
  double dVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  double dVar219;
  double dVar220;
  double dVar221;
  undefined1 auVar224 [16];
  double dVar222;
  double dVar228;
  undefined1 auVar225 [16];
  double dVar223;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  double dVar229;
  double dVar230;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  double dVar237;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  Periodicity PVar246;
  Real facx;
  Real facy;
  Real facz;
  Box bx_2;
  MFIter mfi_2;
  Box bx;
  Box bx_1;
  MultiFab fine_contrib_on_crse;
  MultiFab fine_contrib;
  MultiFab fine_res_for_coarse;
  int local_c48;
  int local_c38;
  long local_c18;
  int local_bf8;
  int local_b98;
  int local_b64;
  int local_b60;
  int local_b5c;
  int local_b58;
  int local_b54;
  int local_b50;
  long local_a58;
  long local_9d0;
  long local_8f8;
  FabArray<amrex::FArrayBox> *local_8e8;
  Array4<const_double> local_8c8;
  pointer local_888;
  undefined8 uStack_880;
  long local_870;
  Array4<const_double> local_868;
  double *local_828;
  undefined8 uStack_820;
  double *local_818;
  undefined8 uStack_810;
  double *local_808;
  undefined8 uStack_800;
  double *local_7f8;
  undefined8 uStack_7f0;
  FabArray<amrex::FArrayBox> *local_7e0;
  Real local_7d8;
  DistributionMapping *local_7d0;
  BoxArray *local_7c8;
  pointer local_7c0;
  ulong local_7b8;
  long local_7b0;
  long local_7a8;
  int *local_7a0;
  long local_798;
  Array4<const_double> local_790;
  undefined1 local_750 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_740;
  int local_728;
  Vector<int,_std::allocator<int>_> *local_710;
  Array4<const_double> local_6f0;
  FabArray<amrex::FArrayBox> *local_6b0;
  pointer local_6a8;
  long local_6a0;
  Array4<const_int> local_698;
  undefined8 local_658;
  LinOpBCType local_650;
  undefined8 local_648;
  LinOpBCType local_640;
  undefined8 local_638;
  int local_630;
  int local_62c [2];
  undefined8 uStack_624;
  Array4<const_int> local_618;
  Box local_5d4;
  Array4<const_double> local_5b8;
  undefined8 local_578;
  int local_570;
  int local_56c [2];
  undefined8 uStack_564;
  Geometry *local_550;
  FabArray<amrex::FArrayBox> *local_548;
  tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> local_540;
  Real local_538;
  Real local_530;
  Real local_528;
  Real local_520;
  Real local_518;
  FabArray<amrex::FArrayBox> *local_510;
  undefined1 local_508 [192];
  IntVect local_448;
  int local_43c;
  Array4<const_double> local_388;
  MFItInfo local_344;
  undefined1 local_330 [384];
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_6a0 = (long)crse_amrlev;
  iVar2 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[local_6a0];
  local_6b0 = &res->super_FabArray<amrex::FArrayBox>;
  local_548 = &crse_sol->super_FabArray<amrex::FArrayBox>;
  local_510 = &crse_rhs->super_FabArray<amrex::FArrayBox>;
  if ((iVar2 != 2) && ((this->super_MLNodeLinOp).m_coarsening_strategy != Sigma)) {
    Assert_host("amrrr == 2 || m_coarsening_strategy == CoarseningStrategy::Sigma",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sync.cpp"
                ,0x277,(char *)0x0);
  }
  pVVar5 = (this->super_MLNodeLinOp).super_MLLinOp.m_geom.
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(Geometry **)
             &pVVar5[local_6a0].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_7b8 = (ulong)((int)local_6a0 + 1);
  local_6a8 = (pointer)(local_7b8 * 3);
  this_01 = *(Geometry **)
             &pVVar5[local_7b8].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_538 = (this_00->super_CoordSys).inv_dx[0];
  local_530 = (this_00->super_CoordSys).inv_dx[1];
  local_528 = (this_00->super_CoordSys).inv_dx[2];
  local_520 = (this_01->super_CoordSys).inv_dx[0];
  local_7d8 = (this_01->super_CoordSys).inv_dx[1];
  local_518 = (this_01->super_CoordSys).inv_dx[2];
  Geometry::growPeriodicDomain(this_00,1);
  local_638 = *(undefined8 *)(this_00->domain).smallend.vect;
  uVar7 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
  local_62c[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
  uStack_624 = *(undefined8 *)((this_00->domain).bigend.vect + 2);
  local_630 = (int)uVar7;
  local_62c[0] = (int)((ulong)uVar7 >> 0x20);
  lVar16 = 0;
  do {
    if ((uStack_624._4_4_ >> ((uint)lVar16 & 0x1f) & 1) == 0) {
      local_62c[lVar16] = local_62c[lVar16] + 1;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  uStack_624 = CONCAT44(7,(int)uStack_624);
  local_578 = *(undefined8 *)(this_01->domain).smallend.vect;
  uVar7 = *(undefined8 *)((this_01->domain).smallend.vect + 2);
  local_56c[1] = (int)((ulong)*(undefined8 *)(this_01->domain).bigend.vect >> 0x20);
  uStack_564 = *(undefined8 *)((this_01->domain).bigend.vect + 2);
  local_570 = (int)uVar7;
  local_56c[0] = (int)((ulong)uVar7 >> 0x20);
  lVar16 = 0;
  do {
    if ((uStack_564._4_4_ >> ((uint)lVar16 & 0x1f) & 1) == 0) {
      local_56c[lVar16] = local_56c[lVar16] + 1;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  uStack_564 = CONCAT44(7,(int)uStack_564);
  paVar6 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = *(undefined8 *)paVar6->_M_elems;
  LVar3 = paVar6->_M_elems[2];
  local_648 = uVar7;
  local_640 = LVar3;
  paVar6 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = *(undefined8 *)paVar6->_M_elems;
  LVar4 = paVar6->_M_elems[2];
  local_658 = uVar8;
  local_650 = LVar4;
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
    lVar16 = 0;
    bVar89 = false;
    do {
      bVar88 = true;
      if (((!bVar89) && (iVar56 = *(int *)((long)&local_648 + lVar16 * 4), iVar56 != 0x66)) &&
         (iVar56 != 0x6a)) {
        bVar88 = (*(int *)((long)&local_658 + lVar16 * 4) - 0x66U & 0xfffffffb) == 0;
      }
      lVar16 = lVar16 + 1;
      bVar89 = bVar88;
    } while (lVar16 != 3);
  }
  else {
    bVar88 = false;
  }
  local_7c8 = &(fine_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(fine_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  local_540.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
        &(&(((this->super_MLNodeLinOp).m_dirichlet_mask.
             super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
             .
             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)[(long)local_6a8]->_M_t;
  local_7c0 = (this->m_nosigma_stencil).
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_550 = this_00;
  amrex::coarsen((BoxArray *)local_330,local_7c8,iVar2);
  local_508._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_508._8_8_ = (Arena *)0x0;
  local_508._16_8_ = (pointer)0x0;
  local_508._24_8_ = (pointer)0x0;
  local_508._32_8_ = (pointer)0x0;
  local_750._0_4_ = 0x712918;
  local_750._4_4_ = 0;
  local_7d0 = dm;
  MultiFab::MultiFab((MultiFab *)&local_1b0,(BoxArray *)local_330,dm,1,0,(MFInfo *)local_508,
                     (FabFactory<amrex::FArrayBox> *)local_750);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_508 + 0x10));
  BoxArray::~BoxArray((BoxArray *)local_330);
  if ((iVar2 == 4) &&
     (((uVar9 = *(undefined8 *)
                 (a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect,
       (int)uVar9 < 3 || ((int)((ulong)uVar9 >> 0x20) < 3)) ||
      ((a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] < 3)))) {
    local_8e8 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    local_330._0_8_ =
         (_Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    local_330._8_4_ = 0;
    local_330._12_4_ = 0;
    local_330._16_8_ = 0;
    local_330._24_8_ = 0;
    local_330._32_8_ = 0;
    local_508._0_8_ = &PTR__FabFactory_00712918;
    MultiFab::MultiFab((MultiFab *)local_8e8,
                       &(a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                       &(a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                        distributionMap,1,3,(MFInfo *)local_330,
                       (FabFactory<amrex::FArrayBox> *)local_508);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_330 + 0x10));
    local_7e0 = local_8e8;
    MultiFab::Copy((MultiFab *)local_8e8,a_fine_res,0,0,1,0);
  }
  else {
    local_7e0 = (FabArray<amrex::FArrayBox> *)0x0;
    local_8e8 = &a_fine_res->super_FabArray<amrex::FArrayBox>;
  }
  PVar246 = Geometry::periodicity(this_01);
  local_330._0_8_ = PVar246.period.vect._0_8_;
  local_330._8_4_ = PVar246.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>(local_8e8,(Periodicity *)local_330,false);
  MFIter::MFIter((MFIter *)local_330,&local_1b0.super_FabArrayBase,true);
  iVar68 = local_56c[1];
  iVar61 = local_56c[0];
  iVar56 = local_570;
  if ((int)local_330._32_4_ < (int)local_330._40_4_) {
    iVar85 = (int)local_578;
    iVar73 = local_578._4_4_;
    iVar62 = (int)uStack_564;
    do {
      MFIter::tilebox((Box *)&local_868,(MFIter *)local_330);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_508,&local_1b0,(MFIter *)local_330);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)local_750,local_8e8,(MFIter *)local_330);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_8c8,
                 (FabArray<amrex::IArrayBox> *)
                 local_540.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,(MFIter *)local_330);
      if ((this->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
        local_c48 = (int)uVar7;
        local_c38 = (int)uVar8;
        local_b98 = (int)((ulong)uVar7 >> 0x20);
        local_bf8 = (int)((ulong)uVar8 >> 0x20);
        if (iVar2 == 2) {
          if ((int)local_868.jstride <= local_868.kstride._4_4_) {
            iVar24 = (int)local_868.jstride;
            do {
              if (local_868.p._4_4_ <= (int)local_868.kstride) {
                lVar16 = (long)iVar24 * 2;
                local_c18 = (long)local_868.p._4_4_;
                do {
                  if ((int)local_868.p <= local_868.jstride._4_4_) {
                    lVar20 = (long)(int)local_868.p;
                    iVar60 = (int)local_868.p * 2;
                    do {
                      dVar101 = 0.0;
                      dVar100 = 0.0;
                      if (*(int *)((long)local_8c8.p +
                                  (lVar20 * 2 - (long)local_8c8.begin.x) * 4 +
                                  (local_c18 * 2 - (long)local_8c8.begin.y) * local_8c8.jstride * 4
                                  + (lVar16 - local_8c8.begin.z) * local_8c8.kstride * 4) == 0) {
                        iVar30 = -1;
                        do {
                          iVar29 = -iVar30;
                          if (iVar30 < 1) {
                            iVar29 = iVar30;
                          }
                          iVar51 = (int)lVar16;
                          iVar76 = iVar30 + iVar51;
                          iVar44 = -1;
                          do {
                            iVar14 = -iVar44;
                            if (iVar44 < 1) {
                              iVar14 = iVar44;
                            }
                            iVar15 = (int)(local_c18 * 2);
                            iVar81 = iVar44 + iVar15;
                            iVar28 = -1;
                            do {
                              iVar77 = -iVar28;
                              if (iVar28 < 1) {
                                iVar77 = iVar28;
                              }
                              iVar25 = iVar60 + iVar28;
                              if (((iVar25 < iVar85) && ((local_c48 == 0x66 || (local_c48 == 0x6a)))
                                  ) || ((iVar61 < iVar25 &&
                                        ((local_c38 == 0x66 || (local_c38 == 0x6a)))))) {
                                iVar25 = (int)(lVar20 * 2) - iVar28;
                              }
                              if (((iVar81 < iVar73) && ((local_b98 == 0x66 || (local_b98 == 0x6a)))
                                  ) || ((iVar53 = iVar81, iVar68 < iVar81 &&
                                        ((local_bf8 == 0x6a || (local_bf8 == 0x66)))))) {
                                iVar53 = iVar15 - iVar44;
                              }
                              if (((iVar76 < iVar56) && ((LVar3 == Neumann || (LVar3 == inflow))))
                                 || ((iVar26 = iVar76, iVar62 < iVar76 &&
                                     ((LVar4 == inflow || (LVar4 == Neumann)))))) {
                                iVar26 = iVar51 - iVar30;
                              }
                              dVar100 = dVar100 + (double)(iVar77 + 2) * (double)(iVar14 + 2) *
                                                  (double)(iVar29 + 2) *
                                                  *(double *)
                                                   (CONCAT44(local_750._4_4_,local_750._0_4_) +
                                                    ((long)iVar53 -
                                                    (long)vStack_740.
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_) * CONCAT44(local_750._12_4_,
                                                                     local_750._8_4_) * 8 +
                                                  ((long)iVar25 -
                                                  (long)(int)vStack_740.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) * 8 + ((long)iVar26 - (long)local_728) *
                                                          (long)vStack_740.
                                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 8);
                              iVar28 = iVar28 + 1;
                            } while (iVar28 != 2);
                            iVar44 = iVar44 + 1;
                          } while (iVar44 != 2);
                          iVar30 = iVar30 + 1;
                        } while (iVar30 != 2);
                        dVar101 = dVar100 * 0.015625;
                      }
                      *(double *)
                       (local_508._0_8_ +
                       (lVar20 - (int)local_508._32_4_) * 8 +
                       ((long)iVar24 - (long)(int)local_508._40_4_) * local_508._16_8_ * 8 +
                       (local_c18 - (int)local_508._36_4_) * local_508._8_8_ * 8) = dVar101;
                      lVar20 = lVar20 + 1;
                      iVar60 = iVar60 + 2;
                    } while (local_868.jstride._4_4_ + 1 != (int)lVar20);
                  }
                  local_c18 = local_c18 + 1;
                } while ((int)local_868.kstride + 1 != (int)local_c18);
              }
              bVar89 = iVar24 != local_868.kstride._4_4_;
              iVar24 = iVar24 + 1;
            } while (bVar89);
          }
        }
        else if ((int)local_868.jstride <= local_868.kstride._4_4_) {
          iVar24 = (int)local_868.jstride;
          do {
            if (local_868.p._4_4_ <= (int)local_868.kstride) {
              lVar16 = (long)iVar24 * 4;
              local_c18 = (long)local_868.p._4_4_;
              do {
                if ((int)local_868.p <= local_868.jstride._4_4_) {
                  lVar20 = (long)(int)local_868.p;
                  iVar60 = (int)local_868.p * 4;
                  do {
                    dVar100 = 0.0;
                    if (*(int *)((long)local_8c8.p +
                                (lVar20 * 4 - (long)local_8c8.begin.x) * 4 +
                                (local_c18 * 4 - (long)local_8c8.begin.y) * local_8c8.jstride * 4 +
                                (lVar16 - local_8c8.begin.z) * local_8c8.kstride * 4) == 0) {
                      iVar30 = -3;
                      do {
                        iVar29 = -iVar30;
                        if (iVar30 < 1) {
                          iVar29 = iVar30;
                        }
                        iVar51 = (int)lVar16;
                        iVar76 = iVar30 + iVar51;
                        iVar44 = -3;
                        do {
                          iVar14 = -iVar44;
                          if (iVar44 < 1) {
                            iVar14 = iVar44;
                          }
                          iVar15 = (int)(local_c18 * 4);
                          iVar81 = iVar44 + iVar15;
                          iVar28 = -3;
                          do {
                            iVar77 = -iVar28;
                            if (iVar28 < 1) {
                              iVar77 = iVar28;
                            }
                            iVar25 = iVar60 + iVar28;
                            if (((iVar25 < iVar85) && ((local_c48 == 0x66 || (local_c48 == 0x6a))))
                               || ((iVar61 < iVar25 && ((local_c38 == 0x66 || (local_c38 == 0x6a))))
                                  )) {
                              iVar25 = (int)(lVar20 * 4) - iVar28;
                            }
                            if (((iVar81 < iVar73) && ((local_b98 == 0x66 || (local_b98 == 0x6a))))
                               || ((iVar53 = iVar81, iVar68 < iVar81 &&
                                   ((local_bf8 == 0x6a || (local_bf8 == 0x66)))))) {
                              iVar53 = iVar15 - iVar44;
                            }
                            if (((iVar76 < iVar56) && ((LVar3 == Neumann || (LVar3 == inflow)))) ||
                               ((iVar26 = iVar76, iVar62 < iVar76 &&
                                ((LVar4 == inflow || (LVar4 == Neumann)))))) {
                              iVar26 = iVar51 - iVar30;
                            }
                            dVar100 = dVar100 + (double)(iVar77 + 4) * (double)(iVar14 + 4) *
                                                (double)(iVar29 + 4) *
                                                *(double *)
                                                 (CONCAT44(local_750._4_4_,local_750._0_4_) +
                                                  ((long)iVar53 -
                                                  (long)vStack_740.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_) * CONCAT44(local_750._12_4_,
                                                                     local_750._8_4_) * 8 +
                                                  ((long)iVar25 -
                                                  (long)(int)vStack_740.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) * 8 + ((long)iVar26 - (long)local_728) *
                                                          (long)vStack_740.
                                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start * 8);
                            iVar28 = iVar28 + 1;
                          } while (iVar28 != 4);
                          iVar44 = iVar44 + 1;
                        } while (iVar44 != 4);
                        iVar30 = iVar30 + 1;
                      } while (iVar30 != 4);
                      dVar100 = dVar100 * 0.000244140625;
                    }
                    *(double *)
                     (local_508._0_8_ +
                     (lVar20 - (int)local_508._32_4_) * 8 +
                     ((long)iVar24 - (long)(int)local_508._40_4_) * local_508._16_8_ * 8 +
                     (local_c18 - (int)local_508._36_4_) * local_508._8_8_ * 8) = dVar100;
                    lVar20 = lVar20 + 1;
                    iVar60 = iVar60 + 4;
                  } while (local_868.jstride._4_4_ + 1 != (int)lVar20);
                }
                local_c18 = local_c18 + 1;
              } while ((int)local_868.kstride + 1 != (int)local_c18);
            }
            bVar89 = iVar24 != local_868.kstride._4_4_;
            iVar24 = iVar24 + 1;
          } while (bVar89);
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_6f0,
                   (FabArray<amrex::FArrayBox> *)
                   local_7c0[local_7b8]._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                   (MFIter *)local_330);
        if ((int)local_868.jstride <= local_868.kstride._4_4_) {
          local_870 = (long)local_868.p._4_4_;
          iVar24 = (int)local_868.jstride;
          do {
            if (local_868.p._4_4_ <= (int)local_868.kstride) {
              local_798 = (long)iVar24 * 2;
              local_7a0 = (int *)(long)local_8c8.begin.y;
              local_7b0 = local_8c8.jstride;
              local_7a8 = (local_798 - local_8c8.begin.z) * local_8c8.kstride * 4 +
                          (long)local_8c8.p;
              iVar60 = (int)local_798;
              local_9d0 = local_870;
              do {
                if ((int)local_868.p <= local_868.jstride._4_4_) {
                  lVar70 = local_9d0 * 2;
                  lVar31 = (long)vStack_740.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                  lVar38 = CONCAT44(local_750._4_4_,local_750._0_4_);
                  lVar46 = CONCAT44(local_750._12_4_,local_750._8_4_);
                  lVar16 = lVar38 + (lVar70 - lVar31) * lVar46 * 8;
                  lVar69 = (long)local_6f0.begin.y;
                  lVar20 = local_9d0 * 2 + -1;
                  lVar45 = local_9d0 * 2 + 1;
                  lVar63 = (lVar70 - lVar69) * local_6f0.jstride;
                  lVar78 = (((int)lVar70 - local_6f0.begin.y) + -2) * local_6f0.jstride;
                  lVar82 = (lVar20 - lVar69) * local_6f0.jstride;
                  lVar74 = (lVar45 - lVar69) * local_6f0.jstride;
                  lVar20 = lVar38 + (lVar20 - lVar31) * lVar46 * 8;
                  lVar38 = lVar38 + (lVar45 - lVar31) * lVar46 * 8;
                  lVar64 = (iVar60 - local_6f0.begin.z) * local_6f0.kstride;
                  lVar33 = ((iVar60 + -2) - local_6f0.begin.z) * local_6f0.kstride;
                  lVar34 = ((iVar60 + -1) - local_6f0.begin.z) * local_6f0.kstride;
                  lVar35 = ((iVar60 + 1) - local_6f0.begin.z) * local_6f0.kstride;
                  lVar36 = (long)(iVar60 - local_728) *
                           (long)vStack_740.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar17 = (long)((iVar60 + -1) - local_728) *
                           (long)vStack_740.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar18 = (long)((iVar60 + 1) - local_728) *
                           (long)vStack_740.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar79 = (long)(int)vStack_740.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  lVar19 = (long)local_6f0.begin.x;
                  lVar45 = lVar16 + lVar36 * 8;
                  lVar46 = lVar20 + lVar36 * 8;
                  lVar31 = lVar38 + lVar36 * 8;
                  lVar69 = (long)(int)local_868.p;
                  do {
                    uVar47 = lVar69 * 2;
                    puVar97 = (undefined *)0x0;
                    if (*(int *)(local_7a8 +
                                ((lVar70 - (long)local_7a0) * local_8c8.jstride +
                                (uVar47 - (long)local_8c8.begin.x)) * 4) == 0) {
                      lVar83 = uVar47 - lVar79;
                      lVar21 = lVar16 + lVar83 * 8;
                      lVar57 = (long)(((int)uVar47 - local_6f0.begin.x) + -2);
                      lVar84 = uVar47 - 1;
                      lVar37 = lVar84 - lVar19;
                      dVar100 = local_6f0.p[lVar63 + lVar37 + lVar64 + local_6f0.nstride];
                      if (((local_6f0.p[lVar63 + lVar57 + lVar64 + local_6f0.nstride] != 0.0) ||
                          (dVar100 != 0.0)) || (NAN(dVar100))) {
                        dVar100 = (*(double *)(lVar45 + (lVar84 - lVar79) * 8) * ABS(dVar100)) /
                                  (ABS(local_6f0.p[lVar63 + lVar57 + lVar64 + local_6f0.nstride]) +
                                  ABS(dVar100));
                      }
                      else {
                        dVar100 = *(double *)(lVar45 + (lVar84 - lVar79) * 8) * 0.5;
                      }
                      lVar65 = uVar47 - lVar19;
                      uVar47 = uVar47 | 1;
                      dVar101 = local_6f0.p[lVar63 + lVar65 + lVar64 + local_6f0.nstride];
                      dVar102 = (local_6f0.p + lVar63 + lVar65 + lVar64 + local_6f0.nstride)[1];
                      if (((dVar101 != 0.0) || (NAN(dVar101))) ||
                         ((dVar102 != 0.0 || (NAN(dVar102))))) {
                        dVar101 = (*(double *)(lVar45 + (uVar47 - lVar79) * 8) * ABS(dVar101)) /
                                  (ABS(dVar102) + ABS(dVar101));
                      }
                      else {
                        dVar101 = *(double *)(lVar45 + (uVar47 - lVar79) * 8) * 0.5;
                      }
                      dVar102 = local_6f0.p[lVar78 + lVar65 + lVar64 + local_6f0.nstride * 2];
                      dVar103 = local_6f0.p[lVar82 + lVar65 + lVar64 + local_6f0.nstride * 2];
                      if (((dVar102 != 0.0) || (NAN(dVar102))) ||
                         ((dVar103 != 0.0 || (NAN(dVar103))))) {
                        dVar102 = (*(double *)(lVar46 + lVar83 * 8) * ABS(dVar103)) /
                                  (ABS(dVar102) + ABS(dVar103));
                      }
                      else {
                        dVar102 = *(double *)(lVar46 + lVar83 * 8) * 0.5;
                      }
                      dVar103 = local_6f0.p[lVar63 + lVar65 + lVar64 + local_6f0.nstride * 2];
                      dVar104 = local_6f0.p[lVar74 + lVar65 + lVar64 + local_6f0.nstride * 2];
                      if ((((dVar103 != 0.0) || (NAN(dVar103))) || (dVar104 != 0.0)) ||
                         (NAN(dVar104))) {
                        dVar103 = (*(double *)(lVar31 + lVar83 * 8) * ABS(dVar103)) /
                                  (ABS(dVar103) + ABS(dVar104));
                      }
                      else {
                        dVar103 = *(double *)(lVar31 + lVar83 * 8) * 0.5;
                      }
                      dVar104 = local_6f0.p[lVar63 + lVar65 + lVar33 + local_6f0.nstride * 3];
                      dVar105 = local_6f0.p[lVar63 + lVar65 + lVar34 + local_6f0.nstride * 3];
                      if (((dVar104 != 0.0) || (NAN(dVar104))) ||
                         ((dVar105 != 0.0 || (NAN(dVar105))))) {
                        dVar104 = (*(double *)(lVar21 + lVar17 * 8) * ABS(dVar105)) /
                                  (ABS(dVar104) + ABS(dVar105));
                      }
                      else {
                        dVar104 = *(double *)(lVar21 + lVar17 * 8) * 0.5;
                      }
                      lVar66 = uVar47 - lVar19;
                      dVar105 = local_6f0.p[lVar63 + lVar65 + lVar64 + local_6f0.nstride * 3];
                      dVar90 = local_6f0.p[lVar63 + lVar65 + lVar35 + local_6f0.nstride * 3];
                      if (((dVar105 != 0.0) || (NAN(dVar105))) || ((dVar90 != 0.0 || (NAN(dVar90))))
                         ) {
                        dVar105 = (*(double *)(lVar21 + lVar18 * 8) * ABS(dVar105)) /
                                  (ABS(dVar105) + ABS(dVar90));
                      }
                      else {
                        dVar105 = *(double *)(lVar21 + lVar18 * 8) * 0.5;
                      }
                      dVar138 = ABS(local_6f0.p[lVar78 + lVar57 + lVar64 + local_6f0.nstride * 4]);
                      dVar106 = ABS(local_6f0.p[lVar82 + lVar57 + lVar64 + local_6f0.nstride * 4]);
                      dVar162 = ABS(local_6f0.p[lVar78 + lVar37 + lVar64 + local_6f0.nstride * 4]);
                      dVar146 = ABS(local_6f0.p[lVar82 + lVar37 + lVar64 + local_6f0.nstride * 4]);
                      dVar174 = ABS(local_6f0.p[lVar78 + lVar37 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar138 + dVar162 + 1e-100);
                      dVar183 = ABS(local_6f0.p[lVar82 + lVar37 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar106 + dVar146 + 1e-100);
                      dVar114 = ABS(local_6f0.p[lVar82 + lVar57 + lVar64 + local_6f0.nstride]) /
                                (dVar138 + dVar106 + 1e-100) + 1.0;
                      dVar132 = ABS(local_6f0.p[lVar82 + lVar37 + lVar64 + local_6f0.nstride]) /
                                (dVar162 + dVar146 + 1e-100) + 1.0;
                      dVar146 = (dVar132 + dVar183) * dVar146;
                      lVar84 = lVar84 - lVar79;
                      lVar32 = lVar20 + lVar84 * 8;
                      dVar139 = ABS(local_6f0.p[lVar78 + lVar65 + lVar64 + local_6f0.nstride * 4]);
                      dVar90 = ABS(local_6f0.p[lVar82 + lVar65 + lVar64 + local_6f0.nstride * 4]);
                      dVar175 = ABS(local_6f0.p[lVar78 + lVar66 + lVar64 + local_6f0.nstride * 4]);
                      dVar147 = ABS(local_6f0.p[lVar82 + lVar66 + lVar64 + local_6f0.nstride * 4]);
                      dVar163 = ABS(local_6f0.p[lVar78 + lVar66 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar139 + dVar175 + 1e-100);
                      dVar184 = ABS(local_6f0.p[lVar82 + lVar66 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar90 + dVar147 + 1e-100);
                      dVar115 = ABS(local_6f0.p[lVar82 + lVar65 + lVar64 + local_6f0.nstride]) /
                                (dVar139 + dVar90 + 1e-100) + 1.0;
                      dVar133 = ABS(local_6f0.p[lVar82 + lVar66 + lVar64 + local_6f0.nstride]) /
                                (dVar175 + dVar147 + 1e-100) + 1.0;
                      dVar90 = (dVar115 + dVar184) * dVar90;
                      lVar54 = uVar47 - lVar79;
                      lVar39 = lVar20 + lVar54 * 8;
                      dVar148 = ABS(local_6f0.p[lVar63 + lVar57 + lVar64 + local_6f0.nstride * 4]);
                      dVar140 = ABS(local_6f0.p[lVar74 + lVar57 + lVar64 + local_6f0.nstride * 4]);
                      dVar176 = ABS(local_6f0.p[lVar63 + lVar37 + lVar64 + local_6f0.nstride * 4]);
                      dVar164 = ABS(local_6f0.p[lVar74 + lVar37 + lVar64 + local_6f0.nstride * 4]);
                      dVar107 = ABS(local_6f0.p[lVar63 + lVar37 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar148 + dVar176 + 1e-100);
                      dVar185 = ABS(local_6f0.p[lVar74 + lVar37 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar140 + dVar164 + 1e-100);
                      dVar116 = ABS(local_6f0.p[lVar74 + lVar57 + lVar64 + local_6f0.nstride]) /
                                (dVar148 + dVar140 + 1e-100) + 1.0;
                      dVar134 = ABS(local_6f0.p[lVar74 + lVar37 + lVar64 + local_6f0.nstride]) /
                                (dVar176 + dVar164 + 1e-100) + 1.0;
                      dVar176 = (dVar107 + dVar134) * dVar176;
                      lVar40 = lVar38 + lVar84 * 8;
                      dVar91 = ABS(local_6f0.p[lVar74 + lVar65 + lVar64 + local_6f0.nstride * 4]);
                      dVar149 = ABS(local_6f0.p[lVar63 + lVar65 + lVar64 + local_6f0.nstride * 4]);
                      dVar165 = ABS(local_6f0.p[lVar74 + lVar66 + lVar64 + local_6f0.nstride * 4]);
                      dVar177 = ABS(local_6f0.p[lVar63 + lVar66 + lVar64 + local_6f0.nstride * 4]);
                      dVar141 = ABS(local_6f0.p[lVar63 + lVar66 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar149 + dVar177 + 1e-100);
                      dVar186 = ABS(local_6f0.p[lVar74 + lVar66 + lVar64 + local_6f0.nstride * 2]) /
                                (dVar91 + dVar165 + 1e-100);
                      dVar117 = ABS(local_6f0.p[lVar74 + lVar65 + lVar64 + local_6f0.nstride]) /
                                (dVar91 + dVar149 + 1e-100) + 1.0;
                      dVar149 = (dVar117 + dVar141) * dVar149;
                      dVar135 = ABS(local_6f0.p[lVar74 + lVar66 + lVar64 + local_6f0.nstride]) /
                                (dVar165 + dVar177 + 1e-100) + 1.0;
                      lVar41 = lVar38 + lVar54 * 8;
                      dVar108 = ABS(local_6f0.p[lVar63 + lVar57 + lVar33 + local_6f0.nstride * 5]);
                      dVar118 = ABS(local_6f0.p[lVar63 + lVar57 + lVar34 + local_6f0.nstride * 5]);
                      dVar229 = ABS(local_6f0.p[lVar63 + lVar37 + lVar33 + local_6f0.nstride * 5]);
                      dVar219 = ABS(local_6f0.p[lVar63 + lVar37 + lVar34 + local_6f0.nstride * 5]);
                      dVar237 = ABS(local_6f0.p[lVar63 + lVar37 + lVar33 + local_6f0.nstride * 3]) /
                                (dVar108 + dVar229 + 1e-100);
                      dVar242 = ABS(local_6f0.p[lVar63 + lVar37 + lVar34 + local_6f0.nstride * 3]) /
                                (dVar118 + dVar219 + 1e-100);
                      dVar136 = ABS(local_6f0.p[lVar63 + lVar57 + lVar34 + local_6f0.nstride]) /
                                (dVar108 + dVar118 + 1e-100) + 1.0;
                      dVar92 = ABS(local_6f0.p[lVar63 + lVar57 + lVar35 + local_6f0.nstride * 5]);
                      uStack_7f0 = 0;
                      dVar203 = ABS(local_6f0.p[lVar63 + lVar57 + lVar64 + local_6f0.nstride * 5]);
                      dVar109 = ABS(local_6f0.p[lVar63 + lVar37 + lVar35 + local_6f0.nstride * 5]);
                      uStack_800 = 0;
                      dVar93 = ABS(local_6f0.p[lVar63 + lVar37 + lVar64 + local_6f0.nstride * 5]);
                      dVar110 = ABS(local_6f0.p[lVar63 + lVar37 + lVar64 + local_6f0.nstride * 3]) /
                                (dVar203 + dVar93 + 1e-100);
                      dVar142 = ABS(local_6f0.p[lVar63 + lVar57 + lVar35 + local_6f0.nstride]) /
                                (dVar92 + dVar203 + 1e-100) + 1.0;
                      lVar84 = lVar16 + lVar84 * 8;
                      dVar119 = ABS(local_6f0.p[lVar63 + lVar37 + lVar35 + local_6f0.nstride]) /
                                (dVar109 + dVar93 + 1e-100) + 1.0;
                      uStack_820 = 0;
                      dVar93 = (dVar110 + dVar119) * dVar93;
                      dVar196 = ABS(local_6f0.p[lVar63 + lVar37 + lVar34 + local_6f0.nstride]) /
                                (dVar229 + dVar219 + 1e-100) + 1.0;
                      dVar219 = (dVar196 + dVar242) * dVar219;
                      dVar150 = ABS(local_6f0.p[lVar63 + lVar65 + lVar33 + local_6f0.nstride * 5]);
                      dVar94 = ABS(local_6f0.p[lVar63 + lVar65 + lVar34 + local_6f0.nstride * 5]);
                      dVar197 = ABS(local_6f0.p[lVar63 + lVar66 + lVar33 + local_6f0.nstride * 5]);
                      dVar120 = ABS(local_6f0.p[lVar63 + lVar66 + lVar34 + local_6f0.nstride * 5]);
                      uStack_810 = 0;
                      dVar243 = ABS(local_6f0.p[lVar63 + lVar66 + lVar33 + local_6f0.nstride * 3]) /
                                (dVar150 + dVar197 + 1e-100);
                      dVar121 = ABS(local_6f0.p[lVar63 + lVar66 + lVar34 + local_6f0.nstride * 3]) /
                                (dVar94 + dVar120 + 1e-100);
                      dVar220 = ABS(local_6f0.p[lVar63 + lVar65 + lVar34 + local_6f0.nstride]) /
                                (dVar150 + dVar94 + 1e-100) + 1.0;
                      dVar230 = ABS(local_6f0.p[lVar63 + lVar66 + lVar34 + local_6f0.nstride]) /
                                (dVar197 + dVar120 + 1e-100) + 1.0;
                      lVar54 = lVar16 + lVar54 * 8;
                      dVar94 = (dVar220 + dVar121) * dVar94;
                      lVar42 = lVar20 + lVar83 * 8;
                      lVar83 = lVar38 + lVar83 * 8;
                      dVar151 = ABS(local_6f0.p[lVar63 + lVar37 + lVar35 + local_6f0.nstride * 3]) /
                                (dVar92 + dVar109 + 1e-100);
                      dVar143 = ABS(local_6f0.p[lVar63 + lVar65 + lVar35 + local_6f0.nstride * 5]);
                      dVar95 = ABS(local_6f0.p[lVar63 + lVar65 + lVar64 + local_6f0.nstride * 5]);
                      dVar166 = ABS(local_6f0.p[lVar63 + lVar66 + lVar35 + local_6f0.nstride * 5]);
                      dVar187 = ABS(local_6f0.p[lVar63 + lVar66 + lVar64 + local_6f0.nstride * 5]);
                      dVar204 = ABS(local_6f0.p[lVar63 + lVar66 + lVar64 + local_6f0.nstride * 3]) /
                                (dVar95 + dVar187 + 1e-100);
                      dVar221 = ABS(local_6f0.p[lVar63 + lVar66 + lVar35 + local_6f0.nstride * 3]) /
                                (dVar143 + dVar166 + 1e-100);
                      dVar122 = ABS(local_6f0.p[lVar63 + lVar65 + lVar35 + local_6f0.nstride]) /
                                (dVar143 + dVar95 + 1e-100) + 1.0;
                      dVar95 = (dVar122 + dVar204) * dVar95;
                      dVar152 = ABS(local_6f0.p[lVar63 + lVar66 + lVar35 + local_6f0.nstride]) /
                                (dVar166 + dVar187 + 1e-100) + 1.0;
                      local_7f8 = local_6f0.p + lVar78 + lVar65 + lVar34;
                      dVar205 = ABS(local_7f8[local_6f0.nstride * 6]);
                      local_818 = local_6f0.p + lVar74 + lVar65 + lVar34;
                      dVar123 = ABS(local_818[local_6f0.nstride * 6]);
                      dVar153 = ABS(local_6f0.p[lVar78 + lVar65 + lVar33 + local_6f0.nstride * 6]);
                      dVar161 = ABS(local_6f0.p[lVar63 + lVar65 + lVar33 + local_6f0.nstride * 6]);
                      dVar96 = ABS(local_7f8[local_6f0.nstride * 2]) / (dVar153 + dVar205 + 1e-100)
                               + 1.0;
                      dVar167 = ABS(local_6f0.p[lVar82 + lVar65 + lVar34 + local_6f0.nstride * 6]);
                      dVar173 = ABS(local_6f0.p[lVar63 + lVar65 + lVar34 + local_6f0.nstride * 6]);
                      auVar212._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar34 + local_6f0.nstride * 3]);
                      auVar212._8_8_ = ABS(local_818[local_6f0.nstride * 3]);
                      auVar224._0_8_ = dVar167 + dVar205 + 1e-100;
                      auVar224._8_8_ = dVar123 + dVar173 + 1e-100;
                      auVar144 = divpd(auVar212,auVar224);
                      auVar207._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar34 + local_6f0.nstride * 2]);
                      auVar207._8_8_ =
                           ABS(local_6f0.p[lVar63 + lVar65 + lVar34 + local_6f0.nstride * 2]);
                      local_808 = local_6f0.p + lVar82 + lVar65 + lVar33;
                      local_828 = local_6f0.p + lVar74 + lVar65 + lVar33;
                      dVar222 = ABS(local_808[local_6f0.nstride * 6]);
                      dVar228 = ABS(local_828[local_6f0.nstride * 6]);
                      auVar238._0_8_ = dVar222 + dVar167 + 1e-100;
                      auVar238._8_8_ = dVar173 + dVar161 + 1e-100;
                      auVar208 = divpd(auVar207,auVar238);
                      auVar231._0_8_ = ABS(local_808[local_6f0.nstride * 3]);
                      auVar231._8_8_ = ABS(local_828[local_6f0.nstride * 3]);
                      auVar239._0_8_ = dVar153 + dVar222 + 1e-100;
                      auVar239._8_8_ = dVar161 + dVar228 + 1e-100;
                      auVar232 = divpd(auVar231,auVar239);
                      dVar206 = auVar208._0_8_ + 1.0;
                      dVar218 = auVar208._8_8_ + 1.0;
                      dVar111 = ABS(local_818[local_6f0.nstride * 2]) / (dVar228 + dVar123 + 1e-100)
                                + 1.0;
                      dVar167 = (auVar144._0_8_ + dVar206) * dVar167;
                      dVar173 = (auVar144._8_8_ + dVar218) * dVar173;
                      auVar208._0_8_ = *(double *)(lVar42 + lVar17 * 8) * dVar167;
                      auVar208._8_8_ = *(double *)(lVar83 + lVar17 * 8) * dVar173;
                      auVar214._0_8_ =
                           dVar167 + (dVar96 + auVar144._0_8_) * dVar205 +
                                     (dVar206 + auVar232._0_8_) * dVar222 +
                                     (dVar96 + auVar232._0_8_) * dVar153 + 1e-100;
                      auVar214._8_8_ =
                           (auVar144._8_8_ + dVar111) * dVar123 +
                           dVar173 + (dVar111 + auVar232._8_8_) * dVar228 +
                                     (dVar218 + auVar232._8_8_) * dVar161 + 1e-100;
                      auVar208 = divpd(auVar208,auVar214);
                      dVar96 = ABS(local_6f0.p[lVar78 + lVar65 + lVar64 + local_6f0.nstride * 6]);
                      dVar161 = ABS(local_6f0.p[lVar74 + lVar65 + lVar64 + local_6f0.nstride * 6]);
                      dVar153 = ABS(local_6f0.p[lVar78 + lVar65 + lVar35 + local_6f0.nstride * 6]);
                      dVar167 = ABS(local_6f0.p[lVar63 + lVar65 + lVar35 + local_6f0.nstride * 6]);
                      dVar228 = ABS(local_6f0.p[lVar78 + lVar65 + lVar35 + local_6f0.nstride * 2]) /
                                (dVar153 + dVar96 + 1e-100) + 1.0;
                      dVar111 = ABS(local_6f0.p[lVar82 + lVar65 + lVar64 + local_6f0.nstride * 6]);
                      dVar123 = ABS(local_6f0.p[lVar63 + lVar65 + lVar64 + local_6f0.nstride * 6]);
                      auVar209._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar64 + local_6f0.nstride * 3]);
                      auVar209._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar65 + lVar64 + local_6f0.nstride * 3]);
                      auVar234._0_8_ = dVar111 + dVar96 + 1e-100;
                      auVar234._8_8_ = dVar161 + dVar123 + 1e-100;
                      auVar210 = divpd(auVar209,auVar234);
                      auVar171._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar35 + local_6f0.nstride * 2]);
                      auVar171._8_8_ =
                           ABS(local_6f0.p[lVar63 + lVar65 + lVar35 + local_6f0.nstride * 2]);
                      dVar206 = ABS(local_6f0.p[lVar82 + lVar65 + lVar35 + local_6f0.nstride * 6]);
                      dVar218 = ABS(local_6f0.p[lVar74 + lVar65 + lVar35 + local_6f0.nstride * 6]);
                      auVar137._0_8_ = dVar206 + dVar111 + 1e-100;
                      auVar137._8_8_ = dVar123 + dVar167 + 1e-100;
                      auVar232 = divpd(auVar171,auVar137);
                      local_888 = (pointer)local_6f0.p
                                           [lVar74 + lVar65 + lVar35 + local_6f0.nstride * 7];
                      uStack_880 = 0;
                      auVar158._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar35 + local_6f0.nstride * 3]);
                      auVar158._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar65 + lVar35 + local_6f0.nstride * 3]);
                      auVar225._0_8_ = dVar153 + dVar206 + 1e-100;
                      auVar225._8_8_ = dVar218 + dVar167 + 1e-100;
                      auVar144 = divpd(auVar158,auVar225);
                      dVar173 = auVar232._0_8_ + 1.0;
                      dVar205 = auVar232._8_8_ + 1.0;
                      dVar111 = (auVar210._0_8_ + dVar173) * dVar111;
                      dVar123 = (auVar210._8_8_ + dVar205) * dVar123;
                      dVar222 = ABS(local_6f0.p[lVar74 + lVar65 + lVar35 + local_6f0.nstride * 2]) /
                                (dVar218 + dVar161 + 1e-100) + 1.0;
                      auVar232._0_8_ =
                           dVar111 + (dVar228 + auVar210._0_8_) * dVar96 +
                           (dVar228 + auVar144._0_8_) * dVar153 +
                           (dVar173 + auVar144._0_8_) * dVar206 + 1e-100;
                      auVar232._8_8_ =
                           (auVar210._8_8_ + dVar222) * dVar161 + dVar123 +
                           (dVar205 + auVar144._8_8_) * dVar167 +
                           (dVar222 + auVar144._8_8_) * dVar218 + 1e-100;
                      auVar199._8_8_ = *(double *)(lVar83 + lVar18 * 8) * dVar123;
                      auVar199._0_8_ = *(double *)(lVar42 + lVar18 * 8) * dVar111;
                      auVar137 = divpd(auVar199,auVar232);
                      dVar205 = ABS(local_6f0.p[lVar63 + lVar65 + lVar64 + local_6f0.nstride * 7]);
                      dVar188 = ABS(local_6f0.p[lVar63 + lVar65 + lVar35 + local_6f0.nstride * 7]);
                      auVar210._8_4_ = SUB84(dVar205,0);
                      auVar210._0_8_ = dVar205;
                      auVar210._12_4_ = (int)((ulong)dVar205 >> 0x20);
                      dVar96 = dVar205 + ABS(local_6f0.p
                                             [lVar63 + lVar66 + lVar64 + local_6f0.nstride * 7]);
                      dVar123 = auVar210._8_8_ +
                                ABS(local_6f0.p[lVar74 + lVar65 + lVar64 + local_6f0.nstride * 7]);
                      auVar211._0_8_ =
                           ABS(local_6f0.p[lVar63 + lVar66 + lVar64 + local_6f0.nstride * 6]);
                      auVar211._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar65 + lVar64 + local_6f0.nstride * 5]);
                      auVar113._0_8_ = dVar96 + 1e-100;
                      auVar113._8_8_ = dVar123 + 1e-100;
                      auVar212 = divpd(auVar211,auVar113);
                      dVar228 = ABS(local_6f0.p[lVar63 + lVar37 + lVar64 + local_6f0.nstride * 7]);
                      dVar206 = ABS(local_6f0.p[lVar63 + lVar37 + lVar35 + local_6f0.nstride * 7]);
                      auVar180._8_4_ = SUB84(dVar228,0);
                      auVar180._0_8_ = dVar228;
                      auVar180._12_4_ = (int)((ulong)dVar228 >> 0x20);
                      dVar153 = dVar228 + ABS(local_6f0.p
                                              [lVar63 + lVar57 + lVar64 + local_6f0.nstride * 7]);
                      dVar167 = auVar180._8_8_ +
                                ABS(local_6f0.p[lVar74 + lVar37 + lVar64 + local_6f0.nstride * 7]);
                      auVar198._0_8_ =
                           ABS(local_6f0.p[lVar63 + lVar37 + lVar64 + local_6f0.nstride * 6]);
                      auVar198._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar37 + lVar64 + local_6f0.nstride * 5]);
                      auVar182._0_8_ = dVar153 + 1e-100;
                      auVar182._8_8_ = dVar167 + 1e-100;
                      auVar199 = divpd(auVar198,auVar182);
                      dVar223 = ABS(local_6f0.p[lVar82 + lVar65 + lVar64 + local_6f0.nstride * 7]);
                      dVar189 = ABS(local_6f0.p[lVar82 + lVar65 + lVar35 + local_6f0.nstride * 7]);
                      dVar218 = ABS(local_6f0.p[lVar82 + lVar66 + lVar64 + local_6f0.nstride * 7]) +
                                dVar223;
                      dVar222 = dVar223 + ABS(local_6f0.p
                                              [lVar78 + lVar65 + lVar64 + local_6f0.nstride * 7]);
                      auVar179._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar35 + local_6f0.nstride * 4]);
                      auVar179._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar66 + lVar64 + local_6f0.nstride * 3]);
                      auVar155._0_8_ = dVar223 + dVar189 + 1e-100;
                      auVar155._8_8_ =
                           ABS(local_6f0.p[lVar78 + lVar65 + lVar64 + local_6f0.nstride * 7]) +
                           ABS(local_6f0.p[lVar78 + lVar66 + lVar64 + local_6f0.nstride * 7]) +
                           dVar223 + ABS(local_6f0.p
                                         [lVar82 + lVar66 + lVar64 + local_6f0.nstride * 7]) +
                           1e-100;
                      auVar180 = divpd(auVar179,auVar155);
                      auVar213._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar66 + lVar64 + local_6f0.nstride * 6]);
                      auVar213._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar64 + local_6f0.nstride * 5]);
                      auVar201._0_8_ = dVar218 + 1e-100;
                      auVar201._8_8_ = dVar222 + 1e-100;
                      auVar214 = divpd(auVar213,auVar201);
                      dVar161 = ABS(local_6f0.p[lVar82 + lVar37 + lVar64 + local_6f0.nstride * 7]);
                      dVar244 = ABS(local_6f0.p[lVar82 + lVar57 + lVar64 + local_6f0.nstride * 7]) +
                                dVar161;
                      dVar245 = dVar161 + ABS(local_6f0.p
                                              [lVar78 + lVar37 + lVar64 + local_6f0.nstride * 7]);
                      dVar154 = ABS(local_6f0.p[lVar82 + lVar37 + lVar35 + local_6f0.nstride * 7]);
                      auVar129._8_4_ = SUB84(dVar161,0);
                      auVar129._0_8_ = dVar161;
                      auVar129._12_4_ = (int)((ulong)dVar161 >> 0x20);
                      auVar233._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar35 + local_6f0.nstride * 4]);
                      auVar233._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar64 + local_6f0.nstride * 3]);
                      auVar156._0_8_ = dVar154 + dVar161 + 1e-100;
                      auVar156._8_8_ =
                           ABS(local_6f0.p[lVar78 + lVar37 + lVar64 + local_6f0.nstride * 7]) +
                           ABS(local_6f0.p[lVar78 + lVar57 + lVar64 + local_6f0.nstride * 7]) +
                           ABS(local_6f0.p[lVar82 + lVar57 + lVar64 + local_6f0.nstride * 7]) +
                           auVar129._8_8_ + 1e-100;
                      auVar234 = divpd(auVar233,auVar156);
                      auVar200._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar64 + local_6f0.nstride * 6]);
                      auVar200._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar64 + local_6f0.nstride * 5]);
                      auVar144._8_8_ = dVar245 + 1e-100;
                      auVar144._0_8_ = dVar244 + 1e-100;
                      auVar201 = divpd(auVar200,auVar144);
                      dVar190 = ABS(local_6f0.p[lVar63 + lVar65 + lVar33 + local_6f0.nstride * 7]);
                      dVar111 = ABS(local_818[local_6f0.nstride * 7]);
                      dVar168 = ABS(local_6f0.p[lVar63 + lVar65 + lVar34 + local_6f0.nstride * 7]);
                      auVar131._0_8_ =
                           ABS(local_6f0.p[lVar63 + lVar66 + lVar34 + local_6f0.nstride * 2]);
                      auVar131._8_8_ = ABS(local_818[local_6f0.nstride]);
                      auVar235._8_4_ = SUB84(dVar190,0);
                      auVar235._0_8_ = dVar190;
                      auVar235._12_4_ = (int)((ulong)dVar190 >> 0x20);
                      auVar124._8_4_ = SUB84(dVar168,0);
                      auVar124._0_8_ = dVar168;
                      auVar124._12_4_ = (int)((ulong)dVar168 >> 0x20);
                      auVar236._0_8_ =
                           dVar190 + ABS(local_6f0.p
                                         [lVar63 + lVar66 + lVar33 + local_6f0.nstride * 7]) +
                           dVar168 + ABS(local_6f0.p
                                         [lVar63 + lVar66 + lVar34 + local_6f0.nstride * 7]) +
                           1e-100;
                      auVar236._8_8_ =
                           auVar235._8_8_ + ABS(local_828[local_6f0.nstride * 7]) + auVar124._8_8_ +
                           dVar111 + 1e-100;
                      auVar144 = divpd(auVar131,auVar236);
                      auVar181._0_8_ =
                           ABS(local_6f0.p[lVar63 + lVar65 + lVar34 + local_6f0.nstride * 4]);
                      auVar181._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar66 + lVar34 + local_6f0.nstride * 3]);
                      dVar173 = dVar168 + ABS(local_6f0.p
                                              [lVar63 + lVar66 + lVar34 + local_6f0.nstride * 7]);
                      auVar191._0_8_ = dVar190 + dVar168 + 1e-100;
                      auVar191._8_8_ =
                           dVar111 + dVar173 +
                           ABS(local_6f0.p[lVar74 + lVar66 + lVar34 + local_6f0.nstride * 7]) +
                           1e-100;
                      auVar182 = divpd(auVar181,auVar191);
                      auVar157._0_8_ =
                           ABS(local_6f0.p[lVar63 + lVar66 + lVar34 + local_6f0.nstride * 6]);
                      auVar157._8_8_ = ABS(local_818[local_6f0.nstride * 5]);
                      auVar125._0_8_ = dVar173 + 1e-100;
                      auVar125._8_8_ = auVar124._8_8_ + dVar111 + 1e-100;
                      auVar158 = divpd(auVar157,auVar125);
                      dVar190 = ABS(local_6f0.p[lVar63 + lVar37 + lVar33 + local_6f0.nstride * 7]);
                      dVar178 = ABS(local_6f0.p[lVar63 + lVar37 + lVar34 + local_6f0.nstride * 7]);
                      dVar173 = ABS(local_6f0.p[lVar74 + lVar37 + lVar34 + local_6f0.nstride * 7]);
                      auVar193._8_4_ = SUB84(dVar190,0);
                      auVar193._0_8_ = dVar190;
                      auVar193._12_4_ = (int)((ulong)dVar190 >> 0x20);
                      auVar241._0_8_ =
                           ABS(local_6f0.p[lVar74 + lVar37 + lVar34 + local_6f0.nstride]);
                      auVar241._8_8_ =
                           ABS(local_6f0.p[lVar63 + lVar37 + lVar34 + local_6f0.nstride * 2]);
                      auVar217._0_8_ =
                           dVar173 + dVar178 + dVar190 + ABS(local_6f0.p
                                                             [lVar74 + lVar37 + lVar33 + local_6f0.
                                                                                         nstride * 7
                                                             ]) + 1e-100;
                      auVar217._8_8_ =
                           dVar178 + ABS(local_6f0.p
                                         [lVar63 + lVar57 + lVar34 + local_6f0.nstride * 7]) +
                                     auVar193._8_8_ +
                                     ABS(local_6f0.p
                                         [lVar63 + lVar57 + lVar33 + local_6f0.nstride * 7]) +
                           1e-100;
                      auVar210 = divpd(auVar241,auVar217);
                      auVar227._8_4_ = SUB84(dVar178,0);
                      auVar227._0_8_ = dVar178;
                      auVar227._12_4_ = (int)((ulong)dVar178 >> 0x20);
                      dVar111 = dVar178 + ABS(local_6f0.p
                                              [lVar63 + lVar57 + lVar34 + local_6f0.nstride * 7]);
                      auVar240._0_8_ =
                           ABS(local_6f0.p[lVar63 + lVar37 + lVar34 + local_6f0.nstride * 4]);
                      auVar240._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar37 + lVar34 + local_6f0.nstride * 3]);
                      auVar215._0_8_ = dVar178 + dVar190 + 1e-100;
                      auVar215._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar57 + lVar34 + local_6f0.nstride * 7]) +
                           dVar111 + dVar173 + 1e-100;
                      auVar241 = divpd(auVar240,auVar215);
                      auVar192._0_8_ =
                           ABS(local_6f0.p[lVar63 + lVar37 + lVar34 + local_6f0.nstride * 6]);
                      auVar192._8_8_ =
                           ABS(local_6f0.p[lVar74 + lVar37 + lVar34 + local_6f0.nstride * 5]);
                      auVar98._0_8_ = dVar111 + 1e-100;
                      auVar98._8_8_ = auVar227._8_8_ + dVar173 + 1e-100;
                      auVar193 = divpd(auVar192,auVar98);
                      dVar169 = ABS(local_6f0.p[lVar82 + lVar65 + lVar34 + local_6f0.nstride * 7]);
                      dVar190 = ABS(local_7f8[local_6f0.nstride * 7]);
                      dVar111 = ABS(local_808[local_6f0.nstride * 7]);
                      dVar173 = ABS(local_6f0.p[lVar82 + lVar66 + lVar34 + local_6f0.nstride * 7]);
                      auVar194._8_4_ = SUB84(dVar111,0);
                      auVar194._0_8_ = dVar111;
                      auVar194._12_4_ = (int)((ulong)dVar111 >> 0x20);
                      auVar216._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar66 + lVar34 + local_6f0.nstride * 2]);
                      auVar216._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar34 + local_6f0.nstride]);
                      auVar195._0_8_ =
                           dVar111 + ABS(local_6f0.p
                                         [lVar82 + lVar66 + lVar33 + local_6f0.nstride * 7]) +
                           dVar169 + dVar173 + 1e-100;
                      auVar195._8_8_ =
                           auVar194._8_8_ +
                           ABS(local_6f0.p[lVar78 + lVar65 + lVar33 + local_6f0.nstride * 7]) +
                           dVar190 + dVar169 + 1e-100;
                      auVar217 = divpd(auVar216,auVar195);
                      auVar112._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar34 + local_6f0.nstride * 4]);
                      auVar112._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar66 + lVar34 + local_6f0.nstride * 3]);
                      auVar202._0_8_ = dVar169 + dVar111 + 1e-100;
                      auVar202._8_8_ =
                           dVar190 + ABS(local_6f0.p
                                         [lVar78 + lVar66 + lVar34 + local_6f0.nstride * 7]) +
                           dVar169 + dVar173 + 1e-100;
                      auVar113 = divpd(auVar112,auVar202);
                      auVar226._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar66 + lVar34 + local_6f0.nstride * 6]);
                      auVar226._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar65 + lVar34 + local_6f0.nstride * 5]);
                      auVar159._0_8_ = dVar173 + dVar169 + 1e-100;
                      auVar159._8_8_ = dVar169 + dVar190 + 1e-100;
                      auVar227 = divpd(auVar226,auVar159);
                      dVar170 = ABS(local_6f0.p[lVar82 + lVar37 + lVar33 + local_6f0.nstride * 7]);
                      dVar190 = ABS(local_6f0.p[lVar82 + lVar57 + lVar34 + local_6f0.nstride * 7]);
                      dVar111 = ABS(local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride * 7]);
                      dVar173 = ABS(local_6f0.p[lVar78 + lVar37 + lVar34 + local_6f0.nstride * 7]);
                      auVar99._0_8_ = ABS(local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride])
                      ;
                      auVar99._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride * 2]);
                      auVar126._8_4_ = SUB84(dVar170,0);
                      auVar126._0_8_ = dVar170;
                      auVar126._12_4_ = (int)((ulong)dVar170 >> 0x20);
                      auVar127._8_4_ = SUB84(dVar111,0);
                      auVar127._0_8_ = dVar111;
                      auVar127._12_4_ = (int)((ulong)dVar111 >> 0x20);
                      auVar145._0_8_ =
                           dVar173 + dVar170 + ABS(local_6f0.p
                                                   [lVar78 + lVar37 + lVar33 + local_6f0.nstride * 7
                                                   ]) + dVar111 + 1e-100;
                      auVar145._8_8_ =
                           dVar190 + auVar126._8_8_ +
                                     ABS(local_6f0.p
                                         [lVar82 + lVar57 + lVar33 + local_6f0.nstride * 7]) +
                           auVar127._8_8_ + 1e-100;
                      auVar232 = divpd(auVar99,auVar145);
                      auVar128._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride * 4]);
                      auVar128._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride * 3]);
                      auVar172._0_8_ = dVar170 + dVar111 + 1e-100;
                      auVar172._8_8_ =
                           dVar173 + ABS(local_6f0.p
                                         [lVar78 + lVar57 + lVar34 + local_6f0.nstride * 7]) +
                           dVar190 + auVar127._8_8_ + 1e-100;
                      auVar129 = divpd(auVar128,auVar172);
                      auVar130._0_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride * 6]);
                      auVar130._8_8_ =
                           ABS(local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride * 5]);
                      auVar160._0_8_ = dVar190 + dVar111 + 1e-100;
                      auVar160._8_8_ = dVar111 + dVar173 + 1e-100;
                      auVar131 = divpd(auVar130,auVar160);
                      puVar97 = (undefined *)
                                (((auVar131._8_8_ +
                                   auVar129._8_8_ + auVar232._8_8_ + auVar232._0_8_ + 1.0 +
                                   auVar129._0_8_ + auVar131._0_8_) * dVar111 *
                                  *(double *)(lVar32 + lVar17 * 8) *
                                  local_6f0.p[lVar82 + lVar37 + lVar34 + local_6f0.nstride * 8] +
                                 (auVar227._8_8_ +
                                  auVar113._8_8_ + auVar217._8_8_ + 1.0 + auVar217._0_8_ +
                                  auVar113._0_8_ + auVar227._0_8_) * dVar169 *
                                 *(double *)(lVar39 + lVar17 * 8) *
                                 local_6f0.p[lVar82 + lVar66 + lVar34 + local_6f0.nstride * 8] +
                                 (auVar193._8_8_ +
                                  auVar241._8_8_ + auVar210._8_8_ + auVar210._0_8_ + 1.0 +
                                  auVar241._0_8_ + auVar193._0_8_) * dVar178 *
                                 *(double *)(lVar40 + lVar17 * 8) *
                                 local_6f0.p[lVar74 + lVar37 + lVar34 + local_6f0.nstride * 8] +
                                 (auVar158._8_8_ +
                                  auVar182._8_8_ + auVar144._8_8_ + 1.0 + auVar144._0_8_ +
                                  auVar182._0_8_ + auVar158._0_8_) * dVar168 *
                                 *(double *)(lVar41 + lVar17 * 8) *
                                 local_6f0.p[lVar74 + lVar66 + lVar34 + local_6f0.nstride * 8] +
                                 (auVar201._8_8_ +
                                  auVar234._8_8_ +
                                  ABS(local_6f0.p[lVar82 + lVar37 + lVar35 + local_6f0.nstride * 2])
                                  / (ABS(local_6f0.p
                                         [lVar82 + lVar57 + lVar35 + local_6f0.nstride * 7]) +
                                     dVar244 + dVar154 + 1e-100) +
                                  ABS(local_6f0.p[lVar82 + lVar37 + lVar35 + local_6f0.nstride]) /
                                  (dVar245 + ABS(local_6f0.p
                                                 [lVar78 + lVar37 + lVar35 + local_6f0.nstride * 7])
                                   + dVar154 + 1e-100) + 1.0 + auVar234._0_8_ + auVar201._0_8_) *
                                 dVar161 * *(double *)(lVar32 + lVar18 * 8) *
                                 local_6f0.p[lVar82 + lVar37 + lVar35 + local_6f0.nstride * 8] +
                                 (auVar214._8_8_ +
                                  auVar180._8_8_ +
                                  ABS(local_6f0.p[lVar82 + lVar66 + lVar35 + local_6f0.nstride * 2])
                                  / (dVar189 + dVar218 +
                                     ABS(local_6f0.p
                                         [lVar82 + lVar66 + lVar35 + local_6f0.nstride * 7]) +
                                    1e-100) +
                                  ABS(local_6f0.p[lVar82 + lVar65 + lVar35 + local_6f0.nstride]) /
                                  (dVar222 + ABS(local_6f0.p
                                                 [lVar78 + lVar65 + lVar35 + local_6f0.nstride * 7])
                                   + dVar189 + 1e-100) + 1.0 + auVar180._0_8_ + auVar214._0_8_) *
                                 dVar223 * *(double *)(lVar39 + lVar18 * 8) *
                                 local_6f0.p[lVar82 + lVar66 + lVar35 + local_6f0.nstride * 8] +
                                 (auVar199._8_8_ +
                                  ABS(local_6f0.p[lVar74 + lVar37 + lVar64 + local_6f0.nstride * 3])
                                  / (ABS(local_6f0.p
                                         [lVar74 + lVar37 + lVar64 + local_6f0.nstride * 7]) +
                                     ABS(local_6f0.p
                                         [lVar74 + lVar57 + lVar64 + local_6f0.nstride * 7]) +
                                     dVar153 + 1e-100) +
                                  ABS(local_6f0.p[lVar63 + lVar37 + lVar35 + local_6f0.nstride * 2])
                                  / (ABS(local_6f0.p
                                         [lVar63 + lVar57 + lVar35 + local_6f0.nstride * 7]) +
                                     dVar153 + dVar206 + 1e-100) +
                                  ABS(local_6f0.p[lVar74 + lVar37 + lVar35 + local_6f0.nstride]) /
                                  (dVar167 + dVar206 +
                                   ABS(local_6f0.p[lVar74 + lVar37 + lVar35 + local_6f0.nstride * 7]
                                      ) + 1e-100) + 1.0 +
                                  ABS(local_6f0.p[lVar63 + lVar37 + lVar35 + local_6f0.nstride * 4])
                                  / (dVar228 + dVar206 + 1e-100) + auVar199._0_8_) * dVar228 *
                                 *(double *)(lVar40 + lVar18 * 8) *
                                 local_6f0.p[lVar74 + lVar37 + lVar35 + local_6f0.nstride * 8] +
                                 (auVar212._8_8_ +
                                  ABS(local_6f0.p[lVar74 + lVar66 + lVar64 + local_6f0.nstride * 3])
                                  / (ABS(local_6f0.p
                                         [lVar74 + lVar65 + lVar64 + local_6f0.nstride * 7]) +
                                     dVar96 + ABS(local_6f0.p
                                                  [lVar74 + lVar66 + lVar64 + local_6f0.nstride * 7]
                                                 ) + 1e-100) +
                                  ABS(local_6f0.p[lVar63 + lVar66 + lVar35 + local_6f0.nstride * 2])
                                  / (dVar188 + dVar96 +
                                     ABS(local_6f0.p
                                         [lVar63 + lVar66 + lVar35 + local_6f0.nstride * 7]) +
                                    1e-100) +
                                  ABS(local_6f0.p[lVar74 + lVar65 + lVar35 + local_6f0.nstride]) /
                                  (dVar123 + dVar188 + ABS((double)local_888) + 1e-100) + 1.0 +
                                  ABS(local_6f0.p[lVar63 + lVar65 + lVar35 + local_6f0.nstride * 4])
                                  / (dVar205 + dVar188 + 1e-100) + auVar212._0_8_) * dVar205 *
                                 *(double *)(lVar41 + lVar18 * 8) *
                                 local_6f0.p[lVar74 + lVar66 + lVar35 + local_6f0.nstride * 8] +
                                 auVar137._8_8_ +
                                 auVar208._8_8_ +
                                 (*(double *)(lVar54 + lVar18 * 8) * dVar95) /
                                 ((dVar204 + dVar152) * dVar187 + dVar95 +
                                  (dVar122 + dVar221) * dVar143 + (dVar152 + dVar221) * dVar166 +
                                 1e-100) + (dVar93 * *(double *)(lVar84 + lVar18 * 8)) /
                                           ((dVar142 + dVar110) * dVar203 + dVar93 +
                                            (dVar142 + dVar151) * dVar92 +
                                            (dVar119 + dVar151) * dVar109 + 1e-100) +
                                           (*(double *)(lVar54 + lVar17 * 8) * dVar94) /
                                           (dVar94 + (dVar243 + dVar230) * dVar197 +
                                                     (dVar220 + dVar243) * dVar150 +
                                            (dVar230 + dVar121) * dVar120 + 1e-100) +
                                           (*(double *)(lVar84 + lVar17 * 8) * dVar219) /
                                           (dVar219 + (dVar136 + dVar242) * dVar118 +
                                                      (dVar237 + dVar196) * dVar229 +
                                                      (dVar136 + dVar237) * dVar108 + 1e-100) +
                                           (*(double *)(lVar41 + lVar36 * 8) * dVar149) /
                                           ((dVar141 + dVar135) * dVar177 + dVar149 +
                                            (dVar117 + dVar186) * dVar91 +
                                            (dVar135 + dVar186) * dVar165 + 1e-100) +
                                           (dVar176 * *(double *)(lVar40 + lVar36 * 8)) /
                                           ((dVar116 + dVar107) * dVar148 + dVar176 +
                                            (dVar116 + dVar185) * dVar140 +
                                            (dVar134 + dVar185) * dVar164 + 1e-100) +
                                           (*(double *)(lVar39 + lVar36 * 8) * dVar90) /
                                           (dVar90 + (dVar163 + dVar133) * dVar175 +
                                                     (dVar115 + dVar163) * dVar139 +
                                            (dVar133 + dVar184) * dVar147 + 1e-100) +
                                           (*(double *)(lVar32 + lVar36 * 8) * dVar146) /
                                           (dVar146 + (dVar114 + dVar183) * dVar106 +
                                                      (dVar174 + dVar132) * dVar162 +
                                                      (dVar114 + dVar174) * dVar138 + 1e-100) +
                                           *(double *)(lVar21 + lVar36 * 8) + dVar100 + dVar101 +
                                           dVar102 + dVar103 + dVar104 + dVar105 + auVar208._0_8_ +
                                 auVar137._0_8_) * 0.125);
                    }
                    ((undefined **)
                    ((local_9d0 - (int)local_508._36_4_) * local_508._8_8_ * 8 + local_508._0_8_))
                    [((long)iVar24 - (long)(int)local_508._40_4_) * local_508._16_8_ +
                     (lVar69 - (int)local_508._32_4_)] = puVar97;
                    lVar69 = lVar69 + 1;
                  } while (local_868.jstride._4_4_ + 1 != (int)lVar69);
                }
                local_9d0 = local_9d0 + 1;
              } while ((int)local_868.kstride + 1 != (int)local_9d0);
            }
            bVar89 = iVar24 != local_868.kstride._4_4_;
            iVar24 = iVar24 + 1;
          } while (bVar89);
        }
      }
      MFIter::operator++((MFIter *)local_330);
    } while ((int)local_330._32_4_ < (int)local_330._40_4_);
  }
  MFIter::~MFIter((MFIter *)local_330);
  PVar246 = Geometry::periodicity(local_550);
  local_330._0_8_ = PVar246.period.vect._0_8_;
  local_330._8_4_ = PVar246.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy(local_6b0,&local_1b0,(Periodicity *)local_330,COPY);
  amrex::coarsen((BoxArray *)local_508,local_7c8,iVar2);
  local_750._4_4_ = 0;
  local_750._0_4_ = 1;
  local_750._8_4_ = 0;
  local_750._12_4_ = 0;
  vStack_740.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_740.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_740.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8c8.p = (double *)&PTR__FabFactory_00712918;
  MultiFab::MultiFab((MultiFab *)local_330,(BoxArray *)local_508,local_7d0,1,0,(MFInfo *)local_750,
                     (FabFactory<amrex::FArrayBox> *)&local_8c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_740);
  BoxArray::~BoxArray((BoxArray *)local_508);
  local_6a8 = (&(((this->m_sigma).
                  super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                ).
                super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start)[(long)local_6a8];
  local_344.num_streams = Gpu::Device::max_gpu_streams;
  local_344.do_tiling = true;
  local_344.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_344.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_344.tilesize.vect[2] = DAT_00717ec0;
  local_344.dynamic = true;
  local_344.device_sync = true;
  MFIter::MFIter((MFIter *)local_508,(FabArrayBase *)local_330,&local_344);
  if ((int)local_508._32_4_ < (int)local_508._40_4_) {
    local_7d0 = (DistributionMapping *)(local_520 * 0.027777777777777776 * local_520);
    local_7d8 = local_7d8 * 0.027777777777777776 * local_7d8;
    local_7c8 = (BoxArray *)(local_518 * 0.027777777777777776 * local_518);
    do {
      MFIter::tilebox((Box *)&local_618,(MFIter *)local_508);
      BATransformer::operator()
                ((Box *)local_750,(BATransformer *)(local_508._8_8_ + 8),
                 (Box *)((long)*(int *)(*(long *)local_508._56_8_ + (long)(int)local_508._32_4_ * 4)
                         * 0x1c + *(long *)((ArenaInfo *)(local_508._8_8_ + 0x50))->
                                           release_threshold));
      iVar56 = local_750._4_4_;
      iVar61 = local_750._8_4_;
      iVar68 = local_750._12_4_;
      iVar85 = (int)vStack_740.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      iVar73 = vStack_740.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._4_4_;
      local_790.p._0_4_ = local_750._0_4_;
      if (iVar2 != 1) {
        local_790.p._0_4_ = local_750._0_4_ * iVar2;
        iVar56 = local_750._4_4_ * iVar2;
        iVar61 = local_750._8_4_ * iVar2;
        uVar52 = (uint)(((ulong)vStack_740.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 2) == 0);
        uVar48 = (uint)(((ulong)vStack_740.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 4) == 0);
        iVar68 = (local_750._12_4_ +
                 (~(uint)vStack_740.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 1)) * iVar2 -
                 (~(uint)vStack_740.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish & 1);
        iVar85 = ((int)vStack_740.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar52) * iVar2 - uVar52;
        iVar73 = (vStack_740.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ + uVar48) * iVar2 - uVar48;
      }
      local_790.jstride._4_4_ = iVar68;
      local_790.kstride._0_4_ = iVar85;
      local_790.kstride._4_4_ = iVar73;
      lVar16 = 0;
      do {
        if (((uint)vStack_740.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish >> ((uint)lVar16 & 0x1f) & 1) != 0) {
          *(int *)(local_750 + lVar16 * 4 + -0x34) = *(int *)(local_750 + lVar16 * 4 + -0x34) + -1;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      local_828 = (double *)CONCAT44(local_828._4_4_,iVar68);
      local_818 = (double *)CONCAT44(local_818._4_4_,(int)local_790.p);
      local_790.nstride._0_4_ = 0;
      local_790.p._4_4_ = iVar56;
      local_790.jstride._0_4_ = iVar61;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_750,(FabArray<amrex::FArrayBox> *)local_330,
                 (MFIter *)local_508);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_8c8,local_8e8,(MFIter *)local_508);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_6f0,&fine_rhs->super_FabArray<amrex::FArrayBox>,(MFIter *)local_508);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_868,&fine_sol->super_FabArray<amrex::FArrayBox>,(MFIter *)local_508);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_698,
                 (FabArray<amrex::IArrayBox> *)
                 local_540.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,(MFIter *)local_508);
      if (*(FabArray<amrex::FArrayBox> **)local_6a8->_M_elems == (FabArray<amrex::FArrayBox> *)0x0)
      {
        dVar100 = this->m_const_sigma;
        lVar16 = (long)(int)local_618.jstride;
        if (iVar2 == 2) {
          if ((int)local_618.jstride <= local_618.kstride._4_4_) {
            lVar31 = (long)(int)local_818;
            iVar68 = (int)local_618.jstride * 2 + -1;
            lVar46 = (long)(int)local_790.p;
            lVar70 = (long)local_790.jstride._4_4_;
            lVar20 = (long)local_790.p._4_4_;
            lVar69 = (long)(int)local_790.kstride;
            lVar38 = (long)(int)local_790.jstride;
            lVar45 = (long)local_790.kstride._4_4_;
            local_808 = (double *)CONCAT44(local_808._4_4_,local_618.jstride._4_4_ + 1);
            do {
              iVar62 = iVar68;
              if (iVar68 < iVar61) {
                iVar62 = iVar61;
              }
              if (local_618.p._4_4_ <= (int)(uint)local_618.kstride) {
                iVar24 = (int)(lVar16 * 2);
                iVar60 = iVar24 + -1;
                if (iVar24 + -1 <= iVar61) {
                  iVar60 = iVar61;
                }
                iVar30 = iVar24 + 1;
                if (iVar73 < iVar24 + 1) {
                  iVar30 = iVar73;
                }
                local_7f8 = (double *)CONCAT44(local_7f8._4_4_,iVar30);
                iVar29 = local_618.p._4_4_ * 2 + -1;
                local_8f8 = (long)local_618.p._4_4_;
                do {
                  iVar51 = iVar29;
                  if (iVar29 < iVar56) {
                    iVar51 = iVar56;
                  }
                  if ((int)local_618.p <= local_618.jstride._4_4_) {
                    local_888 = (pointer)(long)iVar51;
                    iVar51 = (int)(local_8f8 * 2);
                    iVar44 = iVar51 + -1;
                    if (iVar51 + -1 <= iVar56) {
                      iVar44 = iVar56;
                    }
                    iVar76 = iVar51 + 1;
                    if (iVar85 < iVar51 + 1) {
                      iVar76 = iVar85;
                    }
                    lVar17 = (long)(int)local_618.p;
                    iVar15 = (int)local_618.p * 2 + -1;
                    iVar14 = (int)local_618.p * 2;
                    do {
                      lVar18 = (long)iVar15;
                      if (iVar15 < lVar31) {
                        lVar18 = lVar31;
                      }
                      dVar101 = 0.0;
                      if ((local_698.p
                           [(lVar16 * 2 - (long)local_698.begin.z) * local_698.kstride +
                            (local_8f8 * 2 - (long)local_698.begin.y) * local_698.jstride +
                            (lVar17 * 2 - (long)local_698.begin.x)] != 0) && (iVar60 <= iVar30)) {
                        lVar19 = lVar18 * 8;
                        uVar48 = (uint)(lVar17 * 2);
                        uVar52 = uVar48 | 1;
                        if ((int)(uint)local_828 < (int)uVar52) {
                          uVar52 = (uint)local_828;
                        }
                        iVar81 = uVar48 - 1;
                        if (iVar81 <= (int)local_818) {
                          iVar81 = (int)local_818;
                        }
                        lVar35 = CONCAT44(local_868.p._4_4_,(int)local_868.p);
                        lVar36 = CONCAT44(local_868.jstride._4_4_,(int)local_868.jstride);
                        lVar63 = CONCAT44(local_868.kstride._4_4_,(int)local_868.kstride);
                        iVar28 = ((int)lVar18 - local_868.begin.x) + 1;
                        lVar74 = lVar19 + (long)local_868.begin.x * -8 + lVar35;
                        lVar33 = lVar63 * 8;
                        lVar34 = lVar36 * 8;
                        lVar64 = (long)iVar62;
                        do {
                          if (iVar44 <= iVar76) {
                            iVar25 = iVar24 - (int)lVar64;
                            iVar77 = -iVar25;
                            if (iVar25 < 1) {
                              iVar77 = iVar25;
                            }
                            lVar78 = lVar64 + -1;
                            lVar21 = lVar64 - local_868.begin.z;
                            lVar37 = lVar63 * lVar21;
                            lVar57 = lVar78 - local_868.begin.z;
                            lVar82 = lVar63 * lVar57;
                            lVar79 = (long)(((int)lVar64 + 1) - local_868.begin.z);
                            lVar84 = lVar63 * lVar79;
                            lVar57 = lVar57 * lVar33 + lVar74;
                            lVar21 = lVar21 * lVar33 + lVar74;
                            lVar79 = lVar79 * lVar33 + lVar74;
                            dVar102 = (double)local_888;
                            do {
                              if (iVar81 <= (int)uVar52) {
                                iVar53 = iVar51 - SUB84(dVar102,0);
                                iVar25 = -iVar53;
                                if (iVar53 < 1) {
                                  iVar25 = iVar53;
                                }
                                lVar83 = (long)dVar102 + -1;
                                lVar55 = (long)dVar102 - (long)local_868.begin.y;
                                lVar65 = lVar35 + lVar36 * lVar55 * 8;
                                lVar59 = lVar83 - local_868.begin.y;
                                lVar66 = lVar35 + lVar36 * lVar59 * 8;
                                lVar42 = (long)((SUB84(dVar102,0) + 1) - local_868.begin.y);
                                lVar32 = lVar35 + lVar36 * lVar42 * 8;
                                lVar55 = lVar55 * lVar34;
                                lVar39 = lVar57 + lVar55;
                                lVar40 = lVar21 + lVar55;
                                lVar59 = lVar59 * lVar34;
                                lVar41 = lVar57 + lVar59;
                                lVar54 = lVar21 + lVar59;
                                lVar42 = lVar42 * lVar34;
                                lVar55 = lVar55 + lVar79;
                                lVar59 = lVar59 + lVar79;
                                lVar50 = lVar57 + lVar42;
                                lVar43 = lVar21 + lVar42;
                                lVar42 = lVar42 + lVar79;
                                lVar58 = 0;
                                iVar53 = iVar14 - (int)lVar18;
                                do {
                                  lVar67 = lVar18 + lVar58;
                                  iVar26 = -iVar53;
                                  if (iVar53 < 1) {
                                    iVar26 = iVar53;
                                  }
                                  if (((((lVar31 < lVar67) && (lVar67 < (int)(uint)local_828)) &&
                                       ((long)iVar56 < (long)dVar102)) &&
                                      (((long)dVar102 < (long)iVar85 && (iVar61 < lVar64)))) &&
                                     (lVar64 < iVar73)) {
                                    dVar103 = *(double *)
                                               ((long)local_6f0.p +
                                               lVar58 * 8 +
                                               ((long)dVar102 - (long)local_6f0.begin.y) *
                                               local_6f0.jstride * 8 +
                                               (lVar64 - local_6f0.begin.z) * local_6f0.kstride * 8
                                               + lVar19 + (long)local_6f0.begin.x * -8) -
                                              *(double *)
                                               ((long)local_8c8.p +
                                               lVar58 * 8 +
                                               ((long)dVar102 - (long)local_8c8.begin.y) *
                                               local_8c8.jstride * 8 +
                                               (lVar64 - local_8c8.begin.z) * local_8c8.kstride * 8
                                               + lVar19 + (long)local_8c8.begin.x * -8);
                                  }
                                  else {
                                    lVar71 = lVar18 + lVar58 + -1;
                                    dVar103 = 0.0;
                                    if (((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                       ((lVar20 < (long)dVar102 &&
                                        (((lVar83 <= lVar69 && (lVar38 < lVar64)) &&
                                         (lVar78 <= lVar45)))))) {
                                      dVar103 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                      dVar104 = *(double *)(lVar40 + lVar58 * 8);
                                      dVar105 = *(double *)(lVar54 + -8 + lVar58 * 8);
                                      dVar90 = *(double *)(lVar39 + -8 + lVar58 * 8);
                                      dVar91 = *(double *)(lVar41 + -8 + lVar58 * 8);
                                      dVar92 = *(double *)(lVar54 + lVar58 * 8);
                                      dVar93 = *(double *)(lVar39 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar41 + lVar58 * 8);
                                      dVar103 = (((dVar91 - dVar105) +
                                                 (dVar94 - dVar92) + (dVar94 - dVar92) +
                                                 (dVar93 - dVar104) * 4.0 +
                                                 (dVar90 - dVar103) + (dVar90 - dVar103)) *
                                                 (double)local_7c8 +
                                                ((dVar91 - dVar94) +
                                                (dVar90 - dVar93) + (dVar90 - dVar93) +
                                                (dVar103 - dVar104) * 4.0 +
                                                (dVar105 - dVar92) + (dVar105 - dVar92)) *
                                                (double)local_7d0 +
                                                ((dVar91 - dVar90) +
                                                (dVar94 - dVar93) + (dVar94 - dVar93) +
                                                (dVar92 - dVar104) * 4.0 +
                                                (dVar105 - dVar103) + (dVar105 - dVar103)) *
                                                local_7d8) * dVar100 + 0.0;
                                    }
                                    iVar27 = (int)lVar58;
                                    if ((((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                        ((lVar20 < (long)dVar102 &&
                                         ((lVar83 <= lVar69 && (lVar38 < lVar64)))))) &&
                                       (lVar78 <= lVar45)) {
                                      lVar75 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                      dVar104 = *(double *)(lVar75 + lVar37 * 8);
                                      dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                      lVar80 = lVar66 + (long)(iVar28 + iVar27) * 8;
                                      dVar90 = *(double *)(lVar80 + lVar37 * 8);
                                      dVar91 = *(double *)(lVar75 + lVar82 * 8);
                                      dVar92 = *(double *)(lVar80 + lVar82 * 8);
                                      dVar93 = *(double *)(lVar54 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar39 + lVar58 * 8);
                                      dVar95 = *(double *)(lVar41 + lVar58 * 8);
                                      dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                           (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                           (dVar94 - dVar105) * 4.0 +
                                                           (dVar91 - dVar104) + (dVar91 - dVar104))
                                                           * (double)local_7c8 +
                                                          ((dVar92 - dVar95) +
                                                          (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                          (dVar104 - dVar105) * 4.0 +
                                                          (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                          (double)local_7d0 +
                                                          ((dVar92 - dVar91) +
                                                          (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                          (dVar93 - dVar105) * 4.0 +
                                                          (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                          local_7d8) * dVar100;
                                    }
                                    if ((((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                        (lVar20 <= (long)dVar102)) &&
                                       ((((long)dVar102 <= lVar69 && (lVar38 < lVar64)) &&
                                        (lVar78 <= lVar45)))) {
                                      dVar104 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                      dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                      dVar90 = *(double *)(lVar43 + -8 + lVar58 * 8);
                                      dVar91 = *(double *)(lVar39 + -8 + lVar58 * 8);
                                      dVar92 = *(double *)(lVar50 + -8 + lVar58 * 8);
                                      dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar39 + lVar58 * 8);
                                      dVar95 = *(double *)(lVar50 + lVar58 * 8);
                                      dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                           (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                           (dVar94 - dVar105) * 4.0 +
                                                           (dVar91 - dVar104) + (dVar91 - dVar104))
                                                           * (double)local_7c8 +
                                                          ((dVar92 - dVar95) +
                                                          (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                          (dVar104 - dVar105) * 4.0 +
                                                          (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                          (double)local_7d0 +
                                                          ((dVar92 - dVar91) +
                                                          (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                          (dVar93 - dVar105) * 4.0 +
                                                          (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                          local_7d8) * dVar100;
                                    }
                                    if (((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                       ((lVar20 <= (long)dVar102 &&
                                        ((((long)dVar102 <= lVar69 && (lVar38 < lVar64)) &&
                                         (lVar78 <= lVar45)))))) {
                                      lVar75 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                      dVar104 = *(double *)(lVar75 + lVar37 * 8);
                                      dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                      lVar80 = lVar32 + (long)(iVar28 + iVar27) * 8;
                                      dVar90 = *(double *)(lVar80 + lVar37 * 8);
                                      dVar91 = *(double *)(lVar75 + lVar82 * 8);
                                      dVar92 = *(double *)(lVar80 + lVar82 * 8);
                                      dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar39 + lVar58 * 8);
                                      dVar95 = *(double *)(lVar50 + lVar58 * 8);
                                      dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                           (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                           (dVar94 - dVar105) * 4.0 +
                                                           (dVar91 - dVar104) + (dVar91 - dVar104))
                                                           * (double)local_7c8 +
                                                          ((dVar92 - dVar95) +
                                                          (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                          (dVar104 - dVar105) * 4.0 +
                                                          (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                          (double)local_7d0 +
                                                          ((dVar92 - dVar91) +
                                                          (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                          (dVar93 - dVar105) * 4.0 +
                                                          (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                          local_7d8) * dVar100;
                                    }
                                    if (((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                       (((lVar20 < (long)dVar102 &&
                                         ((lVar83 <= lVar69 && (lVar38 <= lVar64)))) &&
                                        (lVar64 <= lVar45)))) {
                                      dVar104 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                      dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                      dVar90 = *(double *)(lVar54 + -8 + lVar58 * 8);
                                      dVar91 = *(double *)(lVar55 + -8 + lVar58 * 8);
                                      dVar92 = *(double *)(lVar59 + -8 + lVar58 * 8);
                                      dVar93 = *(double *)(lVar54 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                      dVar95 = *(double *)(lVar59 + lVar58 * 8);
                                      dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                           (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                           (dVar94 - dVar105) * 4.0 +
                                                           (dVar91 - dVar104) + (dVar91 - dVar104))
                                                           * (double)local_7c8 +
                                                          ((dVar92 - dVar95) +
                                                          (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                          (dVar104 - dVar105) * 4.0 +
                                                          (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                          (double)local_7d0 +
                                                          ((dVar92 - dVar91) +
                                                          (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                          (dVar93 - dVar105) * 4.0 +
                                                          (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                          local_7d8) * dVar100;
                                    }
                                    if (((((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                         (lVar20 < (long)dVar102)) &&
                                        ((lVar83 <= lVar69 && (lVar38 <= lVar64)))) &&
                                       (lVar64 <= lVar45)) {
                                      lVar75 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                      dVar104 = *(double *)(lVar75 + lVar37 * 8);
                                      dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                      lVar80 = lVar66 + (long)(iVar28 + iVar27) * 8;
                                      dVar90 = *(double *)(lVar80 + lVar37 * 8);
                                      dVar91 = *(double *)(lVar75 + lVar84 * 8);
                                      dVar92 = *(double *)(lVar80 + lVar84 * 8);
                                      dVar93 = *(double *)(lVar54 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                      dVar95 = *(double *)(lVar59 + lVar58 * 8);
                                      dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                           (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                           (dVar94 - dVar105) * 4.0 +
                                                           (dVar91 - dVar104) + (dVar91 - dVar104))
                                                           * (double)local_7c8 +
                                                          ((dVar92 - dVar95) +
                                                          (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                          (dVar104 - dVar105) * 4.0 +
                                                          (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                          (double)local_7d0 +
                                                          ((dVar92 - dVar91) +
                                                          (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                          (dVar93 - dVar105) * 4.0 +
                                                          (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                          local_7d8) * dVar100;
                                    }
                                    if (((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                       ((lVar20 <= (long)dVar102 &&
                                        ((((long)dVar102 <= lVar69 && (lVar38 <= lVar64)) &&
                                         (lVar64 <= lVar45)))))) {
                                      dVar104 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                      dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                      dVar90 = *(double *)(lVar43 + -8 + lVar58 * 8);
                                      dVar91 = *(double *)(lVar55 + -8 + lVar58 * 8);
                                      dVar92 = *(double *)(lVar42 + -8 + lVar58 * 8);
                                      dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                      dVar95 = *(double *)(lVar42 + lVar58 * 8);
                                      dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                           (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                           (dVar94 - dVar105) * 4.0 +
                                                           (dVar91 - dVar104) + (dVar91 - dVar104))
                                                           * (double)local_7c8 +
                                                          ((dVar92 - dVar95) +
                                                          (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                          (dVar104 - dVar105) * 4.0 +
                                                          (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                          (double)local_7d0 +
                                                          ((dVar92 - dVar91) +
                                                          (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                          (dVar93 - dVar105) * 4.0 +
                                                          (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                          local_7d8) * dVar100;
                                    }
                                    if (((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                       (((lVar20 <= (long)dVar102 &&
                                         (((long)dVar102 <= lVar69 && (lVar38 <= lVar64)))) &&
                                        (lVar64 <= lVar45)))) {
                                      lVar67 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                      dVar104 = *(double *)(lVar67 + lVar37 * 8);
                                      dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                      lVar71 = lVar32 + (long)(iVar28 + iVar27) * 8;
                                      dVar90 = *(double *)(lVar71 + lVar37 * 8);
                                      dVar91 = *(double *)(lVar67 + lVar84 * 8);
                                      dVar92 = *(double *)(lVar71 + lVar84 * 8);
                                      dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                      dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                      dVar95 = *(double *)(lVar42 + lVar58 * 8);
                                      dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                           (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                           (dVar94 - dVar105) * 4.0 +
                                                           (dVar91 - dVar104) + (dVar91 - dVar104))
                                                           * (double)local_7c8 +
                                                          ((dVar92 - dVar95) +
                                                          (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                          (dVar104 - dVar105) * 4.0 +
                                                          (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                          (double)local_7d0 +
                                                          ((dVar92 - dVar91) +
                                                          (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                          (dVar93 - dVar105) * 4.0 +
                                                          (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                          local_7d8) * dVar100;
                                    }
                                  }
                                  dVar101 = dVar101 + (double)((iVar26 + 2) *
                                                              (iVar25 + 2) * (iVar77 + 2)) * dVar103
                                  ;
                                  lVar67 = lVar18 + lVar58;
                                  lVar58 = lVar58 + 1;
                                  iVar53 = iVar53 + -1;
                                } while (lVar67 < (int)uVar52);
                              }
                              bVar89 = (long)dVar102 < (long)iVar76;
                              dVar102 = (double)((long)dVar102 + 1);
                            } while (bVar89);
                          }
                          bVar89 = lVar64 < iVar30;
                          lVar64 = lVar64 + 1;
                        } while (bVar89);
                        dVar101 = dVar101 * 0.015625;
                      }
                      *(double *)
                       ((local_8f8 -
                        vStack_740.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_750._12_4_,local_750._8_4_) * 8 +
                        CONCAT44(local_750._4_4_,local_750._0_4_) +
                        (lVar16 - local_728) *
                        (long)vStack_740.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start * 8 +
                       (lVar17 - (int)vStack_740.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                           dVar101;
                      lVar17 = lVar17 + 1;
                      iVar15 = iVar15 + 2;
                      iVar14 = iVar14 + 2;
                    } while (local_618.jstride._4_4_ + 1 != (int)lVar17);
                  }
                  local_8f8 = local_8f8 + 1;
                  iVar29 = iVar29 + 2;
                } while ((uint)local_618.kstride + 1 != (int)local_8f8);
              }
              lVar16 = lVar16 + 1;
              iVar68 = iVar68 + 2;
            } while (local_618.kstride._4_4_ + 1 != (int)lVar16);
          }
        }
        else if ((int)local_618.jstride <= local_618.kstride._4_4_) {
          lVar31 = (long)(int)local_818;
          iVar68 = (int)local_618.jstride * 4 + -3;
          lVar46 = (long)(int)local_790.p;
          lVar70 = (long)local_790.jstride._4_4_;
          lVar20 = (long)local_790.p._4_4_;
          lVar69 = (long)(int)local_790.kstride;
          lVar38 = (long)(int)local_790.jstride;
          lVar45 = (long)local_790.kstride._4_4_;
          local_808 = (double *)CONCAT44(local_808._4_4_,local_618.jstride._4_4_ + 1);
          do {
            iVar62 = iVar68;
            if (iVar68 < iVar61) {
              iVar62 = iVar61;
            }
            if (local_618.p._4_4_ <= (int)(uint)local_618.kstride) {
              iVar24 = (int)(lVar16 * 4);
              iVar60 = iVar24 + -3;
              if (iVar24 + -3 <= iVar61) {
                iVar60 = iVar61;
              }
              iVar30 = iVar24 + 3;
              if (iVar73 < iVar24 + 3) {
                iVar30 = iVar73;
              }
              local_7f8 = (double *)CONCAT44(local_7f8._4_4_,iVar30);
              iVar29 = local_618.p._4_4_ * 4 + -3;
              local_8f8 = (long)local_618.p._4_4_;
              do {
                iVar51 = iVar29;
                if (iVar29 < iVar56) {
                  iVar51 = iVar56;
                }
                if ((int)local_618.p <= local_618.jstride._4_4_) {
                  local_888 = (pointer)(long)iVar51;
                  iVar51 = (int)(local_8f8 * 4);
                  iVar44 = iVar51 + -3;
                  if (iVar51 + -3 <= iVar56) {
                    iVar44 = iVar56;
                  }
                  iVar76 = iVar51 + 3;
                  if (iVar85 < iVar51 + 3) {
                    iVar76 = iVar85;
                  }
                  lVar17 = (long)(int)local_618.p;
                  iVar15 = (int)local_618.p * 4 + -3;
                  iVar14 = (int)local_618.p * 4;
                  do {
                    lVar18 = (long)iVar15;
                    if (iVar15 < lVar31) {
                      lVar18 = lVar31;
                    }
                    dVar101 = 0.0;
                    if ((local_698.p
                         [(lVar16 * 4 - (long)local_698.begin.z) * local_698.kstride +
                          (local_8f8 * 4 - (long)local_698.begin.y) * local_698.jstride +
                          (lVar17 * 4 - (long)local_698.begin.x)] != 0) && (iVar60 <= iVar30)) {
                      lVar19 = lVar18 * 8;
                      uVar48 = (uint)(lVar17 * 4);
                      uVar52 = uVar48 | 3;
                      if ((int)(uint)local_828 < (int)uVar52) {
                        uVar52 = (uint)local_828;
                      }
                      iVar81 = uVar48 - 3;
                      if (iVar81 <= (int)local_818) {
                        iVar81 = (int)local_818;
                      }
                      lVar35 = CONCAT44(local_868.p._4_4_,(int)local_868.p);
                      lVar36 = CONCAT44(local_868.jstride._4_4_,(int)local_868.jstride);
                      lVar63 = CONCAT44(local_868.kstride._4_4_,(int)local_868.kstride);
                      iVar28 = ((int)lVar18 - local_868.begin.x) + 1;
                      lVar74 = lVar19 + (long)local_868.begin.x * -8 + lVar35;
                      lVar33 = lVar63 * 8;
                      lVar34 = lVar36 * 8;
                      lVar64 = (long)iVar62;
                      do {
                        if (iVar44 <= iVar76) {
                          iVar25 = iVar24 - (int)lVar64;
                          iVar77 = -iVar25;
                          if (iVar25 < 1) {
                            iVar77 = iVar25;
                          }
                          lVar78 = lVar64 + -1;
                          lVar21 = lVar64 - local_868.begin.z;
                          lVar37 = lVar63 * lVar21;
                          lVar57 = lVar78 - local_868.begin.z;
                          lVar82 = lVar63 * lVar57;
                          lVar79 = (long)(((int)lVar64 + 1) - local_868.begin.z);
                          lVar84 = lVar63 * lVar79;
                          lVar57 = lVar57 * lVar33 + lVar74;
                          lVar21 = lVar21 * lVar33 + lVar74;
                          lVar79 = lVar79 * lVar33 + lVar74;
                          dVar102 = (double)local_888;
                          do {
                            if (iVar81 <= (int)uVar52) {
                              iVar53 = iVar51 - SUB84(dVar102,0);
                              iVar25 = -iVar53;
                              if (iVar53 < 1) {
                                iVar25 = iVar53;
                              }
                              lVar83 = (long)dVar102 + -1;
                              lVar55 = (long)dVar102 - (long)local_868.begin.y;
                              lVar65 = lVar35 + lVar36 * lVar55 * 8;
                              lVar59 = lVar83 - local_868.begin.y;
                              lVar66 = lVar35 + lVar36 * lVar59 * 8;
                              lVar42 = (long)((SUB84(dVar102,0) + 1) - local_868.begin.y);
                              lVar32 = lVar35 + lVar36 * lVar42 * 8;
                              lVar55 = lVar55 * lVar34;
                              lVar39 = lVar57 + lVar55;
                              lVar40 = lVar21 + lVar55;
                              lVar59 = lVar59 * lVar34;
                              lVar41 = lVar57 + lVar59;
                              lVar54 = lVar21 + lVar59;
                              lVar42 = lVar42 * lVar34;
                              lVar55 = lVar55 + lVar79;
                              lVar59 = lVar59 + lVar79;
                              lVar50 = lVar57 + lVar42;
                              lVar43 = lVar21 + lVar42;
                              lVar42 = lVar42 + lVar79;
                              lVar58 = 0;
                              iVar53 = iVar14 - (int)lVar18;
                              do {
                                lVar67 = lVar18 + lVar58;
                                iVar26 = -iVar53;
                                if (iVar53 < 1) {
                                  iVar26 = iVar53;
                                }
                                if ((((lVar31 < lVar67) && (lVar67 < (int)(uint)local_828)) &&
                                    ((long)iVar56 < (long)dVar102)) &&
                                   ((((long)dVar102 < (long)iVar85 && (iVar61 < lVar64)) &&
                                    (lVar64 < iVar73)))) {
                                  dVar103 = *(double *)
                                             ((long)local_6f0.p +
                                             lVar58 * 8 +
                                             ((long)dVar102 - (long)local_6f0.begin.y) *
                                             local_6f0.jstride * 8 +
                                             (lVar64 - local_6f0.begin.z) * local_6f0.kstride * 8 +
                                             lVar19 + (long)local_6f0.begin.x * -8) -
                                            *(double *)
                                             ((long)local_8c8.p +
                                             lVar58 * 8 +
                                             ((long)dVar102 - (long)local_8c8.begin.y) *
                                             local_8c8.jstride * 8 +
                                             (lVar64 - local_8c8.begin.z) * local_8c8.kstride * 8 +
                                             lVar19 + (long)local_8c8.begin.x * -8);
                                }
                                else {
                                  lVar71 = lVar18 + lVar58 + -1;
                                  dVar103 = 0.0;
                                  if (((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                     ((lVar20 < (long)dVar102 &&
                                      (((lVar83 <= lVar69 && (lVar38 < lVar64)) &&
                                       (lVar78 <= lVar45)))))) {
                                    dVar103 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                    dVar104 = *(double *)(lVar40 + lVar58 * 8);
                                    dVar105 = *(double *)(lVar54 + -8 + lVar58 * 8);
                                    dVar90 = *(double *)(lVar39 + -8 + lVar58 * 8);
                                    dVar91 = *(double *)(lVar41 + -8 + lVar58 * 8);
                                    dVar92 = *(double *)(lVar54 + lVar58 * 8);
                                    dVar93 = *(double *)(lVar39 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar41 + lVar58 * 8);
                                    dVar103 = (((dVar91 - dVar105) +
                                               (dVar94 - dVar92) + (dVar94 - dVar92) +
                                               (dVar93 - dVar104) * 4.0 +
                                               (dVar90 - dVar103) + (dVar90 - dVar103)) *
                                               (double)local_7c8 +
                                              ((dVar91 - dVar94) +
                                              (dVar90 - dVar93) + (dVar90 - dVar93) +
                                              (dVar103 - dVar104) * 4.0 +
                                              (dVar105 - dVar92) + (dVar105 - dVar92)) *
                                              (double)local_7d0 +
                                              ((dVar91 - dVar90) +
                                              (dVar94 - dVar93) + (dVar94 - dVar93) +
                                              (dVar92 - dVar104) * 4.0 +
                                              (dVar105 - dVar103) + (dVar105 - dVar103)) * local_7d8
                                              ) * dVar100 + 0.0;
                                  }
                                  iVar27 = (int)lVar58;
                                  if (((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                     (((lVar20 < (long)dVar102 &&
                                       ((lVar83 <= lVar69 && (lVar38 < lVar64)))) &&
                                      (lVar78 <= lVar45)))) {
                                    lVar75 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                    dVar104 = *(double *)(lVar75 + lVar37 * 8);
                                    dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                    lVar80 = lVar66 + (long)(iVar28 + iVar27) * 8;
                                    dVar90 = *(double *)(lVar80 + lVar37 * 8);
                                    dVar91 = *(double *)(lVar75 + lVar82 * 8);
                                    dVar92 = *(double *)(lVar80 + lVar82 * 8);
                                    dVar93 = *(double *)(lVar54 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar39 + lVar58 * 8);
                                    dVar95 = *(double *)(lVar41 + lVar58 * 8);
                                    dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                         (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                         (dVar94 - dVar105) * 4.0 +
                                                         (dVar91 - dVar104) + (dVar91 - dVar104)) *
                                                         (double)local_7c8 +
                                                        ((dVar92 - dVar95) +
                                                        (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                        (dVar104 - dVar105) * 4.0 +
                                                        (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                        (double)local_7d0 +
                                                        ((dVar92 - dVar91) +
                                                        (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                        (dVar93 - dVar105) * 4.0 +
                                                        (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                        local_7d8) * dVar100;
                                  }
                                  if (((((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                       (lVar20 <= (long)dVar102)) &&
                                      (((long)dVar102 <= lVar69 && (lVar38 < lVar64)))) &&
                                     (lVar78 <= lVar45)) {
                                    dVar104 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                    dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                    dVar90 = *(double *)(lVar43 + -8 + lVar58 * 8);
                                    dVar91 = *(double *)(lVar39 + -8 + lVar58 * 8);
                                    dVar92 = *(double *)(lVar50 + -8 + lVar58 * 8);
                                    dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar39 + lVar58 * 8);
                                    dVar95 = *(double *)(lVar50 + lVar58 * 8);
                                    dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                         (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                         (dVar94 - dVar105) * 4.0 +
                                                         (dVar91 - dVar104) + (dVar91 - dVar104)) *
                                                         (double)local_7c8 +
                                                        ((dVar92 - dVar95) +
                                                        (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                        (dVar104 - dVar105) * 4.0 +
                                                        (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                        (double)local_7d0 +
                                                        ((dVar92 - dVar91) +
                                                        (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                        (dVar93 - dVar105) * 4.0 +
                                                        (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                        local_7d8) * dVar100;
                                  }
                                  if (((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                     ((lVar20 <= (long)dVar102 &&
                                      ((((long)dVar102 <= lVar69 && (lVar38 < lVar64)) &&
                                       (lVar78 <= lVar45)))))) {
                                    lVar75 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                    dVar104 = *(double *)(lVar75 + lVar37 * 8);
                                    dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                    lVar80 = lVar32 + (long)(iVar28 + iVar27) * 8;
                                    dVar90 = *(double *)(lVar80 + lVar37 * 8);
                                    dVar91 = *(double *)(lVar75 + lVar82 * 8);
                                    dVar92 = *(double *)(lVar80 + lVar82 * 8);
                                    dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar39 + lVar58 * 8);
                                    dVar95 = *(double *)(lVar50 + lVar58 * 8);
                                    dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                         (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                         (dVar94 - dVar105) * 4.0 +
                                                         (dVar91 - dVar104) + (dVar91 - dVar104)) *
                                                         (double)local_7c8 +
                                                        ((dVar92 - dVar95) +
                                                        (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                        (dVar104 - dVar105) * 4.0 +
                                                        (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                        (double)local_7d0 +
                                                        ((dVar92 - dVar91) +
                                                        (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                        (dVar93 - dVar105) * 4.0 +
                                                        (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                        local_7d8) * dVar100;
                                  }
                                  if ((((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                      ((lVar20 < (long)dVar102 &&
                                       ((lVar83 <= lVar69 && (lVar38 <= lVar64)))))) &&
                                     (lVar64 <= lVar45)) {
                                    dVar104 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                    dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                    dVar90 = *(double *)(lVar54 + -8 + lVar58 * 8);
                                    dVar91 = *(double *)(lVar55 + -8 + lVar58 * 8);
                                    dVar92 = *(double *)(lVar59 + -8 + lVar58 * 8);
                                    dVar93 = *(double *)(lVar54 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                    dVar95 = *(double *)(lVar59 + lVar58 * 8);
                                    dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                         (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                         (dVar94 - dVar105) * 4.0 +
                                                         (dVar91 - dVar104) + (dVar91 - dVar104)) *
                                                         (double)local_7c8 +
                                                        ((dVar92 - dVar95) +
                                                        (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                        (dVar104 - dVar105) * 4.0 +
                                                        (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                        (double)local_7d0 +
                                                        ((dVar92 - dVar91) +
                                                        (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                        (dVar93 - dVar105) * 4.0 +
                                                        (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                        local_7d8) * dVar100;
                                  }
                                  if ((((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                      (lVar20 < (long)dVar102)) &&
                                     (((lVar83 <= lVar69 && (lVar38 <= lVar64)) &&
                                      (lVar64 <= lVar45)))) {
                                    lVar75 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                    dVar104 = *(double *)(lVar75 + lVar37 * 8);
                                    dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                    lVar80 = lVar66 + (long)(iVar28 + iVar27) * 8;
                                    dVar90 = *(double *)(lVar80 + lVar37 * 8);
                                    dVar91 = *(double *)(lVar75 + lVar84 * 8);
                                    dVar92 = *(double *)(lVar80 + lVar84 * 8);
                                    dVar93 = *(double *)(lVar54 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                    dVar95 = *(double *)(lVar59 + lVar58 * 8);
                                    dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                         (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                         (dVar94 - dVar105) * 4.0 +
                                                         (dVar91 - dVar104) + (dVar91 - dVar104)) *
                                                         (double)local_7c8 +
                                                        ((dVar92 - dVar95) +
                                                        (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                        (dVar104 - dVar105) * 4.0 +
                                                        (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                        (double)local_7d0 +
                                                        ((dVar92 - dVar91) +
                                                        (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                        (dVar93 - dVar105) * 4.0 +
                                                        (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                        local_7d8) * dVar100;
                                  }
                                  if (((lVar46 < lVar67) && (lVar71 <= lVar70)) &&
                                     ((lVar20 <= (long)dVar102 &&
                                      ((((long)dVar102 <= lVar69 && (lVar38 <= lVar64)) &&
                                       (lVar64 <= lVar45)))))) {
                                    dVar104 = *(double *)(lVar40 + -8 + lVar58 * 8);
                                    dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                    dVar90 = *(double *)(lVar43 + -8 + lVar58 * 8);
                                    dVar91 = *(double *)(lVar55 + -8 + lVar58 * 8);
                                    dVar92 = *(double *)(lVar42 + -8 + lVar58 * 8);
                                    dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                    dVar95 = *(double *)(lVar42 + lVar58 * 8);
                                    dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                         (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                         (dVar94 - dVar105) * 4.0 +
                                                         (dVar91 - dVar104) + (dVar91 - dVar104)) *
                                                         (double)local_7c8 +
                                                        ((dVar92 - dVar95) +
                                                        (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                        (dVar104 - dVar105) * 4.0 +
                                                        (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                        (double)local_7d0 +
                                                        ((dVar92 - dVar91) +
                                                        (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                        (dVar93 - dVar105) * 4.0 +
                                                        (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                        local_7d8) * dVar100;
                                  }
                                  if (((lVar46 <= lVar67) && (lVar67 <= lVar70)) &&
                                     (((lVar20 <= (long)dVar102 &&
                                       (((long)dVar102 <= lVar69 && (lVar38 <= lVar64)))) &&
                                      (lVar64 <= lVar45)))) {
                                    lVar67 = lVar65 + (long)(iVar28 + iVar27) * 8;
                                    dVar104 = *(double *)(lVar67 + lVar37 * 8);
                                    dVar105 = *(double *)(lVar40 + lVar58 * 8);
                                    lVar71 = lVar32 + (long)(iVar28 + iVar27) * 8;
                                    dVar90 = *(double *)(lVar71 + lVar37 * 8);
                                    dVar91 = *(double *)(lVar67 + lVar84 * 8);
                                    dVar92 = *(double *)(lVar71 + lVar84 * 8);
                                    dVar93 = *(double *)(lVar43 + lVar58 * 8);
                                    dVar94 = *(double *)(lVar55 + lVar58 * 8);
                                    dVar95 = *(double *)(lVar42 + lVar58 * 8);
                                    dVar103 = dVar103 + (((dVar92 - dVar90) +
                                                         (dVar95 - dVar93) + (dVar95 - dVar93) +
                                                         (dVar94 - dVar105) * 4.0 +
                                                         (dVar91 - dVar104) + (dVar91 - dVar104)) *
                                                         (double)local_7c8 +
                                                        ((dVar92 - dVar95) +
                                                        (dVar91 - dVar94) + (dVar91 - dVar94) +
                                                        (dVar104 - dVar105) * 4.0 +
                                                        (dVar90 - dVar93) + (dVar90 - dVar93)) *
                                                        (double)local_7d0 +
                                                        ((dVar92 - dVar91) +
                                                        (dVar95 - dVar94) + (dVar95 - dVar94) +
                                                        (dVar93 - dVar105) * 4.0 +
                                                        (dVar90 - dVar104) + (dVar90 - dVar104)) *
                                                        local_7d8) * dVar100;
                                  }
                                }
                                dVar101 = dVar101 + (double)((iVar26 + 4) *
                                                            (iVar25 + 4) * (iVar77 + 4)) * dVar103;
                                lVar67 = lVar18 + lVar58;
                                lVar58 = lVar58 + 1;
                                iVar53 = iVar53 + -1;
                              } while (lVar67 < (int)uVar52);
                            }
                            bVar89 = (long)dVar102 < (long)iVar76;
                            dVar102 = (double)((long)dVar102 + 1);
                          } while (bVar89);
                        }
                        bVar89 = lVar64 < iVar30;
                        lVar64 = lVar64 + 1;
                      } while (bVar89);
                      dVar101 = dVar101 * 0.000244140625;
                    }
                    *(double *)
                     ((local_8f8 -
                      vStack_740.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                      CONCAT44(local_750._12_4_,local_750._8_4_) * 8 +
                      CONCAT44(local_750._4_4_,local_750._0_4_) +
                      (lVar16 - local_728) *
                      (long)vStack_740.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start * 8 +
                     (lVar17 - (int)vStack_740.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                         dVar101;
                    lVar17 = lVar17 + 1;
                    iVar15 = iVar15 + 4;
                    iVar14 = iVar14 + 4;
                  } while (local_618.jstride._4_4_ + 1 != (int)lVar17);
                }
                local_8f8 = local_8f8 + 1;
                iVar29 = iVar29 + 4;
              } while ((uint)local_618.kstride + 1 != (int)local_8f8);
            }
            lVar16 = lVar16 + 1;
            iVar68 = iVar68 + 4;
          } while (local_618.kstride._4_4_ + 1 != (int)lVar16);
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_5b8,*(FabArray<amrex::FArrayBox> **)local_6a8->_M_elems,
                   (MFIter *)local_508);
        lVar16 = (long)(int)local_618.jstride;
        if (iVar2 == 2) {
          if ((int)local_618.jstride <= local_618.kstride._4_4_) {
            local_7b8 = (ulong)(uint)local_618.kstride;
            lVar45 = (long)(int)local_818;
            iVar68 = local_618.p._4_4_ * 2 + -1;
            local_7c0 = (pointer)CONCAT44(local_7c0._4_4_,iVar68);
            iVar62 = (int)local_618.jstride * 2 + -1;
            local_798 = CONCAT44(local_798._4_4_,(uint)local_618.kstride + 1);
            lVar46 = (long)(int)local_790.p;
            lVar20 = (long)local_790.jstride._4_4_;
            lVar38 = (long)local_790.p._4_4_;
            lVar69 = (long)(int)local_790.kstride;
            lVar31 = (long)(int)local_790.jstride;
            lVar70 = (long)local_790.kstride._4_4_;
            do {
              local_870 = CONCAT44(local_870._4_4_,iVar62);
              iVar24 = iVar62;
              if (iVar62 < iVar61) {
                iVar24 = iVar61;
              }
              if (local_618.p._4_4_ <= (int)(uint)local_618.kstride) {
                local_808 = (double *)(lVar16 * 2);
                local_7a8 = (long)local_698.begin.y;
                local_7a0 = local_698.p +
                            ((long)local_808 - (long)local_698.begin.z) * local_698.kstride;
                iVar60 = (int)local_808;
                iVar30 = iVar60 + -1;
                if (iVar60 + -1 <= iVar61) {
                  iVar30 = iVar61;
                }
                iVar29 = iVar60 + 1;
                if (iVar73 < iVar60 + 1) {
                  iVar29 = iVar73;
                }
                local_7b0 = local_698.jstride;
                iVar51 = iVar68;
                local_a58 = (long)local_618.p._4_4_;
                do {
                  iVar44 = iVar51;
                  if (iVar51 < iVar56) {
                    iVar44 = iVar56;
                  }
                  if ((int)local_618.p <= local_618.jstride._4_4_) {
                    iVar76 = (int)(local_a58 * 2);
                    iVar14 = iVar76 + -1;
                    if (iVar76 + -1 <= iVar56) {
                      iVar14 = iVar56;
                    }
                    iVar15 = iVar76 + 1;
                    if (iVar85 < iVar76 + 1) {
                      iVar15 = iVar85;
                    }
                    lVar17 = (long)(int)local_618.p;
                    iVar28 = (int)local_618.p * 2 + -1;
                    iVar81 = (int)local_618.p * 2;
                    do {
                      lVar18 = (long)iVar28;
                      if (iVar28 < lVar45) {
                        lVar18 = lVar45;
                      }
                      dVar101 = 0.0;
                      dVar100 = 0.0;
                      if ((local_7a0[(local_a58 * 2 - local_7a8) * local_698.jstride +
                                     (lVar17 * 2 - (long)local_698.begin.x)] != 0) &&
                         (dVar100 = dVar101, iVar30 <= iVar29)) {
                        lVar19 = lVar18 * 8;
                        uVar48 = (uint)(lVar17 * 2);
                        uVar52 = uVar48 | 1;
                        if ((int)(uint)local_828 < (int)uVar52) {
                          uVar52 = (uint)local_828;
                        }
                        iVar77 = uVar48 - 1;
                        if (iVar77 <= (int)local_818) {
                          iVar77 = (int)local_818;
                        }
                        lVar34 = CONCAT44(local_868.p._4_4_,(int)local_868.p);
                        lVar64 = lVar19 + (long)local_5b8.begin.x * -8;
                        iVar25 = ((int)lVar18 - local_868.begin.x) + 1;
                        local_888 = (pointer)(lVar19 + (long)local_868.begin.x * -8 + lVar34);
                        lVar35 = CONCAT44(local_868.jstride._4_4_,(int)local_868.jstride);
                        lVar36 = CONCAT44(local_868.kstride._4_4_,(int)local_868.kstride);
                        local_7f8 = (double *)(lVar36 * 8);
                        lVar33 = lVar35 * 8;
                        lVar63 = (long)iVar24;
                        do {
                          if (iVar14 <= iVar15) {
                            iVar26 = iVar60 - (int)lVar63;
                            iVar53 = -iVar26;
                            if (iVar26 < 1) {
                              iVar53 = iVar26;
                            }
                            lVar74 = lVar63 + -1;
                            lVar82 = lVar63 - local_868.begin.z;
                            lVar84 = lVar36 * lVar82;
                            lVar57 = lVar74 - local_868.begin.z;
                            lVar21 = lVar36 * lVar57;
                            lVar83 = (long)(((int)lVar63 + 1) - local_868.begin.z);
                            lVar37 = lVar36 * lVar83;
                            lVar78 = (lVar63 - local_5b8.begin.z) * local_5b8.kstride * 8 + lVar64;
                            lVar79 = (lVar74 - local_5b8.begin.z) * local_5b8.kstride * 8 + lVar64;
                            lVar65 = lVar57 * (long)local_7f8 + (long)local_888;
                            lVar57 = lVar82 * (long)local_7f8 + (long)local_888;
                            lVar83 = lVar83 * (long)local_7f8 + (long)local_888;
                            lVar82 = (long)iVar44;
                            do {
                              if (iVar77 <= (int)uVar52) {
                                iVar27 = iVar76 - (int)lVar82;
                                iVar26 = -iVar27;
                                if (iVar27 < 1) {
                                  iVar26 = iVar27;
                                }
                                lVar66 = lVar82 + -1;
                                lVar71 = lVar82 - local_868.begin.y;
                                lVar32 = lVar34 + lVar35 * lVar71 * 8;
                                lVar87 = lVar66 - local_868.begin.y;
                                lVar39 = lVar34 + lVar35 * lVar87 * 8;
                                lVar86 = (long)(((int)lVar82 + 1) - local_868.begin.y);
                                lVar40 = lVar34 + lVar35 * lVar86 * 8;
                                lVar58 = (lVar82 - local_5b8.begin.y) * local_5b8.jstride * 8;
                                lVar50 = lVar58 + lVar78;
                                lVar59 = (lVar66 - local_5b8.begin.y) * local_5b8.jstride * 8;
                                lVar55 = lVar59 + lVar78;
                                lVar58 = lVar58 + lVar79;
                                lVar59 = lVar59 + lVar79;
                                lVar71 = lVar71 * lVar33;
                                lVar87 = lVar87 * lVar33;
                                lVar86 = lVar86 * lVar33;
                                lVar41 = lVar65 + lVar71;
                                lVar54 = lVar57 + lVar71;
                                lVar71 = lVar71 + lVar83;
                                lVar42 = lVar65 + lVar87;
                                lVar43 = lVar57 + lVar87;
                                lVar87 = lVar87 + lVar83;
                                lVar75 = lVar65 + lVar86;
                                lVar67 = lVar57 + lVar86;
                                lVar86 = lVar86 + lVar83;
                                lVar80 = 0;
                                iVar27 = iVar81 - (int)lVar18;
                                do {
                                  lVar23 = lVar18 + lVar80;
                                  iVar13 = -iVar27;
                                  if (iVar27 < 1) {
                                    iVar13 = iVar27;
                                  }
                                  if (((((lVar45 < lVar23) && (lVar23 < (int)(uint)local_828)) &&
                                       (iVar56 < lVar82)) &&
                                      ((lVar82 < iVar85 && (iVar61 < lVar63)))) && (lVar63 < iVar73)
                                     ) {
                                    dVar100 = *(double *)
                                               ((long)local_6f0.p +
                                               lVar80 * 8 +
                                               (lVar82 - local_6f0.begin.y) * local_6f0.jstride * 8
                                               + (lVar63 - local_6f0.begin.z) *
                                                 local_6f0.kstride * 8 +
                                                 lVar19 + (long)local_6f0.begin.x * -8) -
                                              *(double *)
                                               ((long)local_8c8.p +
                                               lVar80 * 8 +
                                               (lVar82 - local_8c8.begin.y) * local_8c8.jstride * 8
                                               + (lVar63 - local_8c8.begin.z) *
                                                 local_8c8.kstride * 8 +
                                                 lVar19 + (long)local_8c8.begin.x * -8);
                                  }
                                  else {
                                    lVar72 = lVar18 + lVar80 + -1;
                                    dVar100 = 0.0;
                                    if (((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                       ((lVar38 < lVar82 &&
                                        (((lVar66 <= lVar69 && (lVar31 < lVar63)) &&
                                         (lVar74 <= lVar70)))))) {
                                      dVar100 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                      dVar102 = *(double *)(lVar54 + lVar80 * 8);
                                      dVar103 = *(double *)(lVar43 + -8 + lVar80 * 8);
                                      dVar104 = *(double *)(lVar41 + -8 + lVar80 * 8);
                                      dVar105 = *(double *)(lVar42 + -8 + lVar80 * 8);
                                      dVar90 = *(double *)(lVar43 + lVar80 * 8);
                                      dVar91 = *(double *)(lVar41 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar42 + lVar80 * 8);
                                      dVar100 = (((dVar105 - dVar103) +
                                                 (dVar92 - dVar90) + (dVar92 - dVar90) +
                                                 (dVar91 - dVar102) * 4.0 +
                                                 (dVar104 - dVar100) + (dVar104 - dVar100)) *
                                                 (double)local_7c8 +
                                                ((dVar105 - dVar92) +
                                                (dVar104 - dVar91) + (dVar104 - dVar91) +
                                                (dVar100 - dVar102) * 4.0 +
                                                (dVar103 - dVar90) + (dVar103 - dVar90)) *
                                                (double)local_7d0 +
                                                ((dVar105 - dVar104) +
                                                (dVar92 - dVar91) + (dVar92 - dVar91) +
                                                (dVar90 - dVar102) * 4.0 +
                                                (dVar103 - dVar100) + (dVar103 - dVar100)) *
                                                local_7d8) *
                                                *(double *)
                                                 ((long)local_5b8.p + lVar80 * 8 + lVar59 + -8) +
                                                0.0;
                                    }
                                    iVar49 = (int)lVar80;
                                    if ((((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                        ((lVar38 < lVar82 &&
                                         ((lVar66 <= lVar69 && (lVar31 < lVar63)))))) &&
                                       (lVar74 <= lVar70)) {
                                      lVar22 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                      dVar102 = *(double *)(lVar22 + lVar84 * 8);
                                      dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                      lVar1 = lVar39 + (long)(iVar25 + iVar49) * 8;
                                      dVar104 = *(double *)(lVar1 + lVar84 * 8);
                                      dVar105 = *(double *)(lVar22 + lVar21 * 8);
                                      dVar90 = *(double *)(lVar1 + lVar21 * 8);
                                      dVar91 = *(double *)(lVar43 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar41 + lVar80 * 8);
                                      dVar93 = *(double *)(lVar42 + lVar80 * 8);
                                      dVar100 = dVar100 + (((dVar90 - dVar104) +
                                                           (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                           (dVar92 - dVar103) * 4.0 +
                                                           (dVar105 - dVar102) + (dVar105 - dVar102)
                                                           ) * (double)local_7c8 +
                                                          ((dVar90 - dVar93) +
                                                          (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                          (dVar102 - dVar103) * 4.0 +
                                                          (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                          (double)local_7d0 +
                                                          ((dVar90 - dVar105) +
                                                          (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                          (dVar91 - dVar103) * 4.0 +
                                                          (dVar104 - dVar102) + (dVar104 - dVar102))
                                                          * local_7d8) *
                                                          *(double *)
                                                           ((long)local_5b8.p + lVar80 * 8 + lVar59)
                                      ;
                                    }
                                    if ((((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                        (lVar38 <= lVar82)) &&
                                       (((lVar82 <= lVar69 && (lVar31 < lVar63)) &&
                                        (lVar74 <= lVar70)))) {
                                      dVar102 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                      dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                      dVar104 = *(double *)(lVar67 + -8 + lVar80 * 8);
                                      dVar105 = *(double *)(lVar41 + -8 + lVar80 * 8);
                                      dVar90 = *(double *)(lVar75 + -8 + lVar80 * 8);
                                      dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar41 + lVar80 * 8);
                                      dVar93 = *(double *)(lVar75 + lVar80 * 8);
                                      dVar100 = dVar100 + (((dVar90 - dVar104) +
                                                           (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                           (dVar92 - dVar103) * 4.0 +
                                                           (dVar105 - dVar102) + (dVar105 - dVar102)
                                                           ) * (double)local_7c8 +
                                                          ((dVar90 - dVar93) +
                                                          (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                          (dVar102 - dVar103) * 4.0 +
                                                          (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                          (double)local_7d0 +
                                                          ((dVar90 - dVar105) +
                                                          (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                          (dVar91 - dVar103) * 4.0 +
                                                          (dVar104 - dVar102) + (dVar104 - dVar102))
                                                          * local_7d8) *
                                                          *(double *)
                                                           ((long)local_5b8.p +
                                                           lVar80 * 8 + lVar58 + -8);
                                    }
                                    if (((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                       ((lVar38 <= lVar82 &&
                                        (((lVar82 <= lVar69 && (lVar31 < lVar63)) &&
                                         (lVar74 <= lVar70)))))) {
                                      lVar22 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                      dVar102 = *(double *)(lVar22 + lVar84 * 8);
                                      dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                      lVar1 = lVar40 + (long)(iVar25 + iVar49) * 8;
                                      dVar104 = *(double *)(lVar1 + lVar84 * 8);
                                      dVar105 = *(double *)(lVar22 + lVar21 * 8);
                                      dVar90 = *(double *)(lVar1 + lVar21 * 8);
                                      dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar41 + lVar80 * 8);
                                      dVar93 = *(double *)(lVar75 + lVar80 * 8);
                                      dVar100 = dVar100 + (((dVar90 - dVar104) +
                                                           (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                           (dVar92 - dVar103) * 4.0 +
                                                           (dVar105 - dVar102) + (dVar105 - dVar102)
                                                           ) * (double)local_7c8 +
                                                          ((dVar90 - dVar93) +
                                                          (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                          (dVar102 - dVar103) * 4.0 +
                                                          (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                          (double)local_7d0 +
                                                          ((dVar90 - dVar105) +
                                                          (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                          (dVar91 - dVar103) * 4.0 +
                                                          (dVar104 - dVar102) + (dVar104 - dVar102))
                                                          * local_7d8) *
                                                          *(double *)
                                                           ((long)local_5b8.p + lVar80 * 8 + lVar58)
                                      ;
                                    }
                                    if (((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                       (((lVar38 < lVar82 &&
                                         ((lVar66 <= lVar69 && (lVar31 <= lVar63)))) &&
                                        (lVar63 <= lVar70)))) {
                                      dVar102 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                      dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                      dVar104 = *(double *)(lVar43 + -8 + lVar80 * 8);
                                      dVar105 = *(double *)(lVar71 + -8 + lVar80 * 8);
                                      dVar90 = *(double *)(lVar87 + -8 + lVar80 * 8);
                                      dVar91 = *(double *)(lVar43 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                      dVar93 = *(double *)(lVar87 + lVar80 * 8);
                                      dVar100 = dVar100 + (((dVar90 - dVar104) +
                                                           (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                           (dVar92 - dVar103) * 4.0 +
                                                           (dVar105 - dVar102) + (dVar105 - dVar102)
                                                           ) * (double)local_7c8 +
                                                          ((dVar90 - dVar93) +
                                                          (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                          (dVar102 - dVar103) * 4.0 +
                                                          (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                          (double)local_7d0 +
                                                          ((dVar90 - dVar105) +
                                                          (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                          (dVar91 - dVar103) * 4.0 +
                                                          (dVar104 - dVar102) + (dVar104 - dVar102))
                                                          * local_7d8) *
                                                          *(double *)
                                                           ((long)local_5b8.p +
                                                           lVar80 * 8 + lVar55 + -8);
                                    }
                                    if (((((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                         (lVar38 < lVar82)) &&
                                        ((lVar66 <= lVar69 && (lVar31 <= lVar63)))) &&
                                       (lVar63 <= lVar70)) {
                                      lVar22 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                      dVar102 = *(double *)(lVar22 + lVar84 * 8);
                                      dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                      lVar1 = lVar39 + (long)(iVar25 + iVar49) * 8;
                                      dVar104 = *(double *)(lVar1 + lVar84 * 8);
                                      dVar105 = *(double *)(lVar22 + lVar37 * 8);
                                      dVar90 = *(double *)(lVar1 + lVar37 * 8);
                                      dVar91 = *(double *)(lVar43 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                      dVar93 = *(double *)(lVar87 + lVar80 * 8);
                                      dVar100 = dVar100 + (((dVar90 - dVar104) +
                                                           (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                           (dVar92 - dVar103) * 4.0 +
                                                           (dVar105 - dVar102) + (dVar105 - dVar102)
                                                           ) * (double)local_7c8 +
                                                          ((dVar90 - dVar93) +
                                                          (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                          (dVar102 - dVar103) * 4.0 +
                                                          (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                          (double)local_7d0 +
                                                          ((dVar90 - dVar105) +
                                                          (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                          (dVar91 - dVar103) * 4.0 +
                                                          (dVar104 - dVar102) + (dVar104 - dVar102))
                                                          * local_7d8) *
                                                          *(double *)
                                                           ((long)local_5b8.p + lVar80 * 8 + lVar55)
                                      ;
                                    }
                                    if (((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                       ((lVar38 <= lVar82 &&
                                        (((lVar82 <= lVar69 && (lVar31 <= lVar63)) &&
                                         (lVar63 <= lVar70)))))) {
                                      dVar102 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                      dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                      dVar104 = *(double *)(lVar67 + -8 + lVar80 * 8);
                                      dVar105 = *(double *)(lVar71 + -8 + lVar80 * 8);
                                      dVar90 = *(double *)(lVar86 + -8 + lVar80 * 8);
                                      dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                      dVar93 = *(double *)(lVar86 + lVar80 * 8);
                                      dVar100 = dVar100 + (((dVar90 - dVar104) +
                                                           (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                           (dVar92 - dVar103) * 4.0 +
                                                           (dVar105 - dVar102) + (dVar105 - dVar102)
                                                           ) * (double)local_7c8 +
                                                          ((dVar90 - dVar93) +
                                                          (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                          (dVar102 - dVar103) * 4.0 +
                                                          (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                          (double)local_7d0 +
                                                          ((dVar90 - dVar105) +
                                                          (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                          (dVar91 - dVar103) * 4.0 +
                                                          (dVar104 - dVar102) + (dVar104 - dVar102))
                                                          * local_7d8) *
                                                          *(double *)
                                                           ((long)local_5b8.p +
                                                           lVar80 * 8 + lVar50 + -8);
                                    }
                                    if (((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                       (((lVar38 <= lVar82 &&
                                         ((lVar82 <= lVar69 && (lVar31 <= lVar63)))) &&
                                        (lVar63 <= lVar70)))) {
                                      lVar23 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                      dVar102 = *(double *)(lVar23 + lVar84 * 8);
                                      dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                      lVar72 = lVar40 + (long)(iVar25 + iVar49) * 8;
                                      dVar104 = *(double *)(lVar72 + lVar84 * 8);
                                      dVar105 = *(double *)(lVar23 + lVar37 * 8);
                                      dVar90 = *(double *)(lVar72 + lVar37 * 8);
                                      dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                      dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                      dVar93 = *(double *)(lVar86 + lVar80 * 8);
                                      dVar100 = dVar100 + (((dVar90 - dVar104) +
                                                           (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                           (dVar92 - dVar103) * 4.0 +
                                                           (dVar105 - dVar102) + (dVar105 - dVar102)
                                                           ) * (double)local_7c8 +
                                                          ((dVar90 - dVar93) +
                                                          (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                          (dVar102 - dVar103) * 4.0 +
                                                          (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                          (double)local_7d0 +
                                                          ((dVar90 - dVar105) +
                                                          (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                          (dVar91 - dVar103) * 4.0 +
                                                          (dVar104 - dVar102) + (dVar104 - dVar102))
                                                          * local_7d8) *
                                                          *(double *)
                                                           ((long)local_5b8.p + lVar80 * 8 + lVar50)
                                      ;
                                    }
                                  }
                                  dVar101 = dVar101 + (double)((iVar13 + 2) *
                                                              (iVar26 + 2) * (iVar53 + 2)) * dVar100
                                  ;
                                  lVar23 = lVar18 + lVar80;
                                  lVar80 = lVar80 + 1;
                                  iVar27 = iVar27 + -1;
                                } while (lVar23 < (int)uVar52);
                              }
                              bVar89 = lVar82 < iVar15;
                              lVar82 = lVar82 + 1;
                            } while (bVar89);
                          }
                          bVar89 = lVar63 < iVar29;
                          lVar63 = lVar63 + 1;
                        } while (bVar89);
                        dVar100 = dVar101 * 0.015625;
                      }
                      *(double *)
                       ((local_a58 -
                        vStack_740.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                        CONCAT44(local_750._12_4_,local_750._8_4_) * 8 +
                        CONCAT44(local_750._4_4_,local_750._0_4_) +
                        (lVar16 - local_728) *
                        (long)vStack_740.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start * 8 +
                       (lVar17 - (int)vStack_740.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                           dVar100;
                      lVar17 = lVar17 + 1;
                      iVar28 = iVar28 + 2;
                      iVar81 = iVar81 + 2;
                    } while (local_618.jstride._4_4_ + 1 != (int)lVar17);
                  }
                  local_a58 = local_a58 + 1;
                  iVar51 = iVar51 + 2;
                } while ((uint)local_618.kstride + 1 != (int)local_a58);
              }
              lVar16 = lVar16 + 1;
              iVar62 = iVar62 + 2;
            } while (local_618.kstride._4_4_ + 1 != (int)lVar16);
          }
        }
        else if ((int)local_618.jstride <= local_618.kstride._4_4_) {
          local_7b8 = (ulong)(uint)local_618.kstride;
          lVar45 = (long)(int)local_818;
          iVar68 = local_618.p._4_4_ * 4 + -3;
          local_7c0 = (pointer)CONCAT44(local_7c0._4_4_,iVar68);
          iVar62 = (int)local_618.jstride * 4 + -3;
          local_798 = CONCAT44(local_798._4_4_,(uint)local_618.kstride + 1);
          lVar46 = (long)(int)local_790.p;
          lVar20 = (long)local_790.jstride._4_4_;
          lVar38 = (long)local_790.p._4_4_;
          lVar69 = (long)(int)local_790.kstride;
          lVar31 = (long)(int)local_790.jstride;
          lVar70 = (long)local_790.kstride._4_4_;
          do {
            local_870 = CONCAT44(local_870._4_4_,iVar62);
            iVar24 = iVar62;
            if (iVar62 < iVar61) {
              iVar24 = iVar61;
            }
            if (local_618.p._4_4_ <= (int)(uint)local_618.kstride) {
              local_808 = (double *)(lVar16 * 4);
              local_7a8 = (long)local_698.begin.y;
              local_7a0 = local_698.p +
                          ((long)local_808 - (long)local_698.begin.z) * local_698.kstride;
              iVar60 = (int)local_808;
              iVar30 = iVar60 + -3;
              if (iVar60 + -3 <= iVar61) {
                iVar30 = iVar61;
              }
              iVar29 = iVar60 + 3;
              if (iVar73 < iVar60 + 3) {
                iVar29 = iVar73;
              }
              local_7b0 = local_698.jstride;
              iVar51 = iVar68;
              local_a58 = (long)local_618.p._4_4_;
              do {
                iVar44 = iVar51;
                if (iVar51 < iVar56) {
                  iVar44 = iVar56;
                }
                if ((int)local_618.p <= local_618.jstride._4_4_) {
                  iVar76 = (int)(local_a58 * 4);
                  iVar14 = iVar76 + -3;
                  if (iVar76 + -3 <= iVar56) {
                    iVar14 = iVar56;
                  }
                  iVar15 = iVar76 + 3;
                  if (iVar85 < iVar76 + 3) {
                    iVar15 = iVar85;
                  }
                  lVar17 = (long)(int)local_618.p;
                  iVar28 = (int)local_618.p * 4 + -3;
                  iVar81 = (int)local_618.p * 4;
                  do {
                    lVar18 = (long)iVar28;
                    if (iVar28 < lVar45) {
                      lVar18 = lVar45;
                    }
                    dVar100 = 0.0;
                    if ((local_7a0[(local_a58 * 4 - local_7a8) * local_698.jstride +
                                   (lVar17 * 4 - (long)local_698.begin.x)] != 0) &&
                       (iVar30 <= iVar29)) {
                      lVar19 = lVar18 * 8;
                      uVar48 = (uint)(lVar17 * 4);
                      uVar52 = uVar48 | 3;
                      if ((int)(uint)local_828 < (int)uVar52) {
                        uVar52 = (uint)local_828;
                      }
                      iVar77 = uVar48 - 3;
                      if (iVar77 <= (int)local_818) {
                        iVar77 = (int)local_818;
                      }
                      lVar34 = CONCAT44(local_868.p._4_4_,(int)local_868.p);
                      lVar64 = lVar19 + (long)local_5b8.begin.x * -8;
                      iVar25 = ((int)lVar18 - local_868.begin.x) + 1;
                      local_888 = (pointer)(lVar19 + (long)local_868.begin.x * -8 + lVar34);
                      lVar35 = CONCAT44(local_868.jstride._4_4_,(int)local_868.jstride);
                      lVar36 = CONCAT44(local_868.kstride._4_4_,(int)local_868.kstride);
                      local_7f8 = (double *)(lVar36 * 8);
                      lVar33 = lVar35 * 8;
                      lVar63 = (long)iVar24;
                      do {
                        if (iVar14 <= iVar15) {
                          iVar26 = iVar60 - (int)lVar63;
                          iVar53 = -iVar26;
                          if (iVar26 < 1) {
                            iVar53 = iVar26;
                          }
                          lVar74 = lVar63 + -1;
                          lVar82 = lVar63 - local_868.begin.z;
                          lVar84 = lVar36 * lVar82;
                          lVar57 = lVar74 - local_868.begin.z;
                          lVar21 = lVar36 * lVar57;
                          lVar83 = (long)(((int)lVar63 + 1) - local_868.begin.z);
                          lVar37 = lVar36 * lVar83;
                          lVar78 = (lVar63 - local_5b8.begin.z) * local_5b8.kstride * 8 + lVar64;
                          lVar79 = (lVar74 - local_5b8.begin.z) * local_5b8.kstride * 8 + lVar64;
                          lVar65 = lVar57 * (long)local_7f8 + (long)local_888;
                          lVar57 = lVar82 * (long)local_7f8 + (long)local_888;
                          lVar83 = lVar83 * (long)local_7f8 + (long)local_888;
                          lVar82 = (long)iVar44;
                          do {
                            if (iVar77 <= (int)uVar52) {
                              iVar27 = iVar76 - (int)lVar82;
                              iVar26 = -iVar27;
                              if (iVar27 < 1) {
                                iVar26 = iVar27;
                              }
                              lVar66 = lVar82 + -1;
                              lVar71 = lVar82 - local_868.begin.y;
                              lVar32 = lVar34 + lVar35 * lVar71 * 8;
                              lVar87 = lVar66 - local_868.begin.y;
                              lVar39 = lVar34 + lVar35 * lVar87 * 8;
                              lVar86 = (long)(((int)lVar82 + 1) - local_868.begin.y);
                              lVar40 = lVar34 + lVar35 * lVar86 * 8;
                              lVar58 = (lVar82 - local_5b8.begin.y) * local_5b8.jstride * 8;
                              lVar50 = lVar58 + lVar78;
                              lVar59 = (lVar66 - local_5b8.begin.y) * local_5b8.jstride * 8;
                              lVar55 = lVar59 + lVar78;
                              lVar58 = lVar58 + lVar79;
                              lVar59 = lVar59 + lVar79;
                              lVar71 = lVar71 * lVar33;
                              lVar87 = lVar87 * lVar33;
                              lVar86 = lVar86 * lVar33;
                              lVar41 = lVar65 + lVar71;
                              lVar54 = lVar57 + lVar71;
                              lVar71 = lVar71 + lVar83;
                              lVar42 = lVar65 + lVar87;
                              lVar43 = lVar57 + lVar87;
                              lVar87 = lVar87 + lVar83;
                              lVar75 = lVar65 + lVar86;
                              lVar67 = lVar57 + lVar86;
                              lVar86 = lVar86 + lVar83;
                              lVar80 = 0;
                              iVar27 = iVar81 - (int)lVar18;
                              do {
                                lVar23 = lVar18 + lVar80;
                                iVar13 = -iVar27;
                                if (iVar27 < 1) {
                                  iVar13 = iVar27;
                                }
                                if ((((lVar45 < lVar23) && (lVar23 < (int)(uint)local_828)) &&
                                    (iVar56 < lVar82)) &&
                                   (((lVar82 < iVar85 && (iVar61 < lVar63)) && (lVar63 < iVar73))))
                                {
                                  dVar101 = *(double *)
                                             ((long)local_6f0.p +
                                             lVar80 * 8 +
                                             (lVar82 - local_6f0.begin.y) * local_6f0.jstride * 8 +
                                             (lVar63 - local_6f0.begin.z) * local_6f0.kstride * 8 +
                                             lVar19 + (long)local_6f0.begin.x * -8) -
                                            *(double *)
                                             ((long)local_8c8.p +
                                             lVar80 * 8 +
                                             (lVar82 - local_8c8.begin.y) * local_8c8.jstride * 8 +
                                             (lVar63 - local_8c8.begin.z) * local_8c8.kstride * 8 +
                                             lVar19 + (long)local_8c8.begin.x * -8);
                                }
                                else {
                                  lVar72 = lVar18 + lVar80 + -1;
                                  dVar101 = 0.0;
                                  if (((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                     ((lVar38 < lVar82 &&
                                      (((lVar66 <= lVar69 && (lVar31 < lVar63)) &&
                                       (lVar74 <= lVar70)))))) {
                                    dVar101 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                    dVar102 = *(double *)(lVar54 + lVar80 * 8);
                                    dVar103 = *(double *)(lVar43 + -8 + lVar80 * 8);
                                    dVar104 = *(double *)(lVar41 + -8 + lVar80 * 8);
                                    dVar105 = *(double *)(lVar42 + -8 + lVar80 * 8);
                                    dVar90 = *(double *)(lVar43 + lVar80 * 8);
                                    dVar91 = *(double *)(lVar41 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar42 + lVar80 * 8);
                                    dVar101 = (((dVar105 - dVar103) +
                                               (dVar92 - dVar90) + (dVar92 - dVar90) +
                                               (dVar91 - dVar102) * 4.0 +
                                               (dVar104 - dVar101) + (dVar104 - dVar101)) *
                                               (double)local_7c8 +
                                              ((dVar105 - dVar92) +
                                              (dVar104 - dVar91) + (dVar104 - dVar91) +
                                              (dVar101 - dVar102) * 4.0 +
                                              (dVar103 - dVar90) + (dVar103 - dVar90)) *
                                              (double)local_7d0 +
                                              ((dVar105 - dVar104) +
                                              (dVar92 - dVar91) + (dVar92 - dVar91) +
                                              (dVar90 - dVar102) * 4.0 +
                                              (dVar103 - dVar101) + (dVar103 - dVar101)) * local_7d8
                                              ) * *(double *)
                                                   ((long)local_5b8.p + lVar80 * 8 + lVar59 + -8) +
                                              0.0;
                                  }
                                  iVar49 = (int)lVar80;
                                  if (((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                     (((lVar38 < lVar82 && ((lVar66 <= lVar69 && (lVar31 < lVar63)))
                                       ) && (lVar74 <= lVar70)))) {
                                    lVar22 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                    dVar102 = *(double *)(lVar22 + lVar84 * 8);
                                    dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                    lVar1 = lVar39 + (long)(iVar25 + iVar49) * 8;
                                    dVar104 = *(double *)(lVar1 + lVar84 * 8);
                                    dVar105 = *(double *)(lVar22 + lVar21 * 8);
                                    dVar90 = *(double *)(lVar1 + lVar21 * 8);
                                    dVar91 = *(double *)(lVar43 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar41 + lVar80 * 8);
                                    dVar93 = *(double *)(lVar42 + lVar80 * 8);
                                    dVar101 = dVar101 + (((dVar90 - dVar104) +
                                                         (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                         (dVar92 - dVar103) * 4.0 +
                                                         (dVar105 - dVar102) + (dVar105 - dVar102))
                                                         * (double)local_7c8 +
                                                        ((dVar90 - dVar93) +
                                                        (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                        (dVar102 - dVar103) * 4.0 +
                                                        (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                        (double)local_7d0 +
                                                        ((dVar90 - dVar105) +
                                                        (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                        (dVar91 - dVar103) * 4.0 +
                                                        (dVar104 - dVar102) + (dVar104 - dVar102)) *
                                                        local_7d8) *
                                                        *(double *)
                                                         ((long)local_5b8.p + lVar80 * 8 + lVar59);
                                  }
                                  if (((((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                       (lVar38 <= lVar82)) &&
                                      ((lVar82 <= lVar69 && (lVar31 < lVar63)))) &&
                                     (lVar74 <= lVar70)) {
                                    dVar102 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                    dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                    dVar104 = *(double *)(lVar67 + -8 + lVar80 * 8);
                                    dVar105 = *(double *)(lVar41 + -8 + lVar80 * 8);
                                    dVar90 = *(double *)(lVar75 + -8 + lVar80 * 8);
                                    dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar41 + lVar80 * 8);
                                    dVar93 = *(double *)(lVar75 + lVar80 * 8);
                                    dVar101 = dVar101 + (((dVar90 - dVar104) +
                                                         (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                         (dVar92 - dVar103) * 4.0 +
                                                         (dVar105 - dVar102) + (dVar105 - dVar102))
                                                         * (double)local_7c8 +
                                                        ((dVar90 - dVar93) +
                                                        (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                        (dVar102 - dVar103) * 4.0 +
                                                        (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                        (double)local_7d0 +
                                                        ((dVar90 - dVar105) +
                                                        (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                        (dVar91 - dVar103) * 4.0 +
                                                        (dVar104 - dVar102) + (dVar104 - dVar102)) *
                                                        local_7d8) *
                                                        *(double *)
                                                         ((long)local_5b8.p +
                                                         lVar80 * 8 + lVar58 + -8);
                                  }
                                  if (((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                     ((lVar38 <= lVar82 &&
                                      (((lVar82 <= lVar69 && (lVar31 < lVar63)) &&
                                       (lVar74 <= lVar70)))))) {
                                    lVar22 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                    dVar102 = *(double *)(lVar22 + lVar84 * 8);
                                    dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                    lVar1 = lVar40 + (long)(iVar25 + iVar49) * 8;
                                    dVar104 = *(double *)(lVar1 + lVar84 * 8);
                                    dVar105 = *(double *)(lVar22 + lVar21 * 8);
                                    dVar90 = *(double *)(lVar1 + lVar21 * 8);
                                    dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar41 + lVar80 * 8);
                                    dVar93 = *(double *)(lVar75 + lVar80 * 8);
                                    dVar101 = dVar101 + (((dVar90 - dVar104) +
                                                         (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                         (dVar92 - dVar103) * 4.0 +
                                                         (dVar105 - dVar102) + (dVar105 - dVar102))
                                                         * (double)local_7c8 +
                                                        ((dVar90 - dVar93) +
                                                        (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                        (dVar102 - dVar103) * 4.0 +
                                                        (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                        (double)local_7d0 +
                                                        ((dVar90 - dVar105) +
                                                        (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                        (dVar91 - dVar103) * 4.0 +
                                                        (dVar104 - dVar102) + (dVar104 - dVar102)) *
                                                        local_7d8) *
                                                        *(double *)
                                                         ((long)local_5b8.p + lVar80 * 8 + lVar58);
                                  }
                                  if ((((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                      ((lVar38 < lVar82 &&
                                       ((lVar66 <= lVar69 && (lVar31 <= lVar63)))))) &&
                                     (lVar63 <= lVar70)) {
                                    dVar102 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                    dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                    dVar104 = *(double *)(lVar43 + -8 + lVar80 * 8);
                                    dVar105 = *(double *)(lVar71 + -8 + lVar80 * 8);
                                    dVar90 = *(double *)(lVar87 + -8 + lVar80 * 8);
                                    dVar91 = *(double *)(lVar43 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                    dVar93 = *(double *)(lVar87 + lVar80 * 8);
                                    dVar101 = dVar101 + (((dVar90 - dVar104) +
                                                         (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                         (dVar92 - dVar103) * 4.0 +
                                                         (dVar105 - dVar102) + (dVar105 - dVar102))
                                                         * (double)local_7c8 +
                                                        ((dVar90 - dVar93) +
                                                        (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                        (dVar102 - dVar103) * 4.0 +
                                                        (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                        (double)local_7d0 +
                                                        ((dVar90 - dVar105) +
                                                        (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                        (dVar91 - dVar103) * 4.0 +
                                                        (dVar104 - dVar102) + (dVar104 - dVar102)) *
                                                        local_7d8) *
                                                        *(double *)
                                                         ((long)local_5b8.p +
                                                         lVar80 * 8 + lVar55 + -8);
                                  }
                                  if ((((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                      (lVar38 < lVar82)) &&
                                     (((lVar66 <= lVar69 && (lVar31 <= lVar63)) &&
                                      (lVar63 <= lVar70)))) {
                                    lVar22 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                    dVar102 = *(double *)(lVar22 + lVar84 * 8);
                                    dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                    lVar1 = lVar39 + (long)(iVar25 + iVar49) * 8;
                                    dVar104 = *(double *)(lVar1 + lVar84 * 8);
                                    dVar105 = *(double *)(lVar22 + lVar37 * 8);
                                    dVar90 = *(double *)(lVar1 + lVar37 * 8);
                                    dVar91 = *(double *)(lVar43 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                    dVar93 = *(double *)(lVar87 + lVar80 * 8);
                                    dVar101 = dVar101 + (((dVar90 - dVar104) +
                                                         (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                         (dVar92 - dVar103) * 4.0 +
                                                         (dVar105 - dVar102) + (dVar105 - dVar102))
                                                         * (double)local_7c8 +
                                                        ((dVar90 - dVar93) +
                                                        (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                        (dVar102 - dVar103) * 4.0 +
                                                        (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                        (double)local_7d0 +
                                                        ((dVar90 - dVar105) +
                                                        (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                        (dVar91 - dVar103) * 4.0 +
                                                        (dVar104 - dVar102) + (dVar104 - dVar102)) *
                                                        local_7d8) *
                                                        *(double *)
                                                         ((long)local_5b8.p + lVar80 * 8 + lVar55);
                                  }
                                  if (((lVar46 < lVar23) && (lVar72 <= lVar20)) &&
                                     ((lVar38 <= lVar82 &&
                                      (((lVar82 <= lVar69 && (lVar31 <= lVar63)) &&
                                       (lVar63 <= lVar70)))))) {
                                    dVar102 = *(double *)(lVar54 + -8 + lVar80 * 8);
                                    dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                    dVar104 = *(double *)(lVar67 + -8 + lVar80 * 8);
                                    dVar105 = *(double *)(lVar71 + -8 + lVar80 * 8);
                                    dVar90 = *(double *)(lVar86 + -8 + lVar80 * 8);
                                    dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                    dVar93 = *(double *)(lVar86 + lVar80 * 8);
                                    dVar101 = dVar101 + (((dVar90 - dVar104) +
                                                         (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                         (dVar92 - dVar103) * 4.0 +
                                                         (dVar105 - dVar102) + (dVar105 - dVar102))
                                                         * (double)local_7c8 +
                                                        ((dVar90 - dVar93) +
                                                        (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                        (dVar102 - dVar103) * 4.0 +
                                                        (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                        (double)local_7d0 +
                                                        ((dVar90 - dVar105) +
                                                        (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                        (dVar91 - dVar103) * 4.0 +
                                                        (dVar104 - dVar102) + (dVar104 - dVar102)) *
                                                        local_7d8) *
                                                        *(double *)
                                                         ((long)local_5b8.p +
                                                         lVar80 * 8 + lVar50 + -8);
                                  }
                                  if (((lVar46 <= lVar23) && (lVar23 <= lVar20)) &&
                                     (((lVar38 <= lVar82 &&
                                       ((lVar82 <= lVar69 && (lVar31 <= lVar63)))) &&
                                      (lVar63 <= lVar70)))) {
                                    lVar23 = lVar32 + (long)(iVar25 + iVar49) * 8;
                                    dVar102 = *(double *)(lVar23 + lVar84 * 8);
                                    dVar103 = *(double *)(lVar54 + lVar80 * 8);
                                    lVar72 = lVar40 + (long)(iVar25 + iVar49) * 8;
                                    dVar104 = *(double *)(lVar72 + lVar84 * 8);
                                    dVar105 = *(double *)(lVar23 + lVar37 * 8);
                                    dVar90 = *(double *)(lVar72 + lVar37 * 8);
                                    dVar91 = *(double *)(lVar67 + lVar80 * 8);
                                    dVar92 = *(double *)(lVar71 + lVar80 * 8);
                                    dVar93 = *(double *)(lVar86 + lVar80 * 8);
                                    dVar101 = dVar101 + (((dVar90 - dVar104) +
                                                         (dVar93 - dVar91) + (dVar93 - dVar91) +
                                                         (dVar92 - dVar103) * 4.0 +
                                                         (dVar105 - dVar102) + (dVar105 - dVar102))
                                                         * (double)local_7c8 +
                                                        ((dVar90 - dVar93) +
                                                        (dVar105 - dVar92) + (dVar105 - dVar92) +
                                                        (dVar102 - dVar103) * 4.0 +
                                                        (dVar104 - dVar91) + (dVar104 - dVar91)) *
                                                        (double)local_7d0 +
                                                        ((dVar90 - dVar105) +
                                                        (dVar93 - dVar92) + (dVar93 - dVar92) +
                                                        (dVar91 - dVar103) * 4.0 +
                                                        (dVar104 - dVar102) + (dVar104 - dVar102)) *
                                                        local_7d8) *
                                                        *(double *)
                                                         ((long)local_5b8.p + lVar80 * 8 + lVar50);
                                  }
                                }
                                dVar100 = dVar100 + (double)((iVar13 + 4) *
                                                            (iVar26 + 4) * (iVar53 + 4)) * dVar101;
                                lVar23 = lVar18 + lVar80;
                                lVar80 = lVar80 + 1;
                                iVar27 = iVar27 + -1;
                              } while (lVar23 < (int)uVar52);
                            }
                            bVar89 = lVar82 < iVar15;
                            lVar82 = lVar82 + 1;
                          } while (bVar89);
                        }
                        bVar89 = lVar63 < iVar29;
                        lVar63 = lVar63 + 1;
                      } while (bVar89);
                      dVar100 = dVar100 * 0.000244140625;
                    }
                    *(double *)
                     ((local_a58 -
                      vStack_740.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                      CONCAT44(local_750._12_4_,local_750._8_4_) * 8 +
                      CONCAT44(local_750._4_4_,local_750._0_4_) +
                      (lVar16 - local_728) *
                      (long)vStack_740.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start * 8 +
                     (lVar17 - (int)vStack_740.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                         dVar100;
                    lVar17 = lVar17 + 1;
                    iVar28 = iVar28 + 4;
                    iVar81 = iVar81 + 4;
                  } while (local_618.jstride._4_4_ + 1 != (int)lVar17);
                }
                local_a58 = local_a58 + 1;
                iVar51 = iVar51 + 4;
              } while ((uint)local_618.kstride + 1 != (int)local_a58);
            }
            lVar16 = lVar16 + 1;
            iVar62 = iVar62 + 4;
          } while (local_618.kstride._4_4_ + 1 != (int)lVar16);
        }
      }
      MFIter::operator++((MFIter *)local_508);
    } while ((int)local_508._32_4_ < (int)local_508._40_4_);
  }
  MFIter::~MFIter((MFIter *)local_508);
  local_750._4_4_ = 0;
  local_750._0_4_ = 1;
  local_750._8_4_ = 0;
  local_750._12_4_ = 0;
  vStack_740.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_740.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_740.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8c8.p = (double *)&PTR__FabFactory_00712918;
  MultiFab::MultiFab((MultiFab *)local_508,
                     &(((FabArray<amrex::FArrayBox> *)&local_548->super_FabArrayBase)->
                      super_FabArrayBase).boxarray,
                     &(((FabArray<amrex::FArrayBox> *)&local_548->super_FabArrayBase)->
                      super_FabArrayBase).distributionMap,1,0,(MFInfo *)local_750,
                     (FabFactory<amrex::FArrayBox> *)&local_8c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_740);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)local_508,0.0,0,local_43c,&local_448);
  PVar246 = Geometry::periodicity(local_550);
  local_750._0_4_ = PVar246.period.vect[0];
  local_750._4_4_ = PVar246.period.vect[1];
  local_750._8_4_ = PVar246.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)local_508,(FabArray<amrex::FArrayBox> *)local_330,
             (Periodicity *)local_750,ADD);
  puVar10 = (this->super_MLNodeLinOp).m_cc_fine_mask.
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            .
            super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_02 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(this->super_MLNodeLinOp).m_dirichlet_mask.
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_6a0].
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  puVar11 = (this->super_MLNodeLinOp).m_nd_fine_mask.
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            .
            super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_888 = (this->super_MLNodeLinOp).m_has_fine_bndry.
              super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = *(undefined8 **)
             &(this->m_sigma).
              super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
              .
              super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_6a0].
              super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
              .
              super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  MFIter::MFIter((MFIter *)local_750,&local_6b0->super_FabArrayBase,&local_344);
  iVar61 = local_62c[1];
  iVar56 = local_62c[0];
  iVar2 = local_630;
  LVar4 = local_640;
  LVar3 = local_650;
  if ((int)vStack_740.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_728) {
    dVar102 = local_538 * 0.027777777777777776 * local_538;
    dVar103 = local_530 * 0.027777777777777776 * local_530;
    dVar101 = local_528 * 0.027777777777777776 * local_528;
    lVar16 = (long)(int)local_638;
    iVar85 = (int)local_648;
    iVar73 = local_648._4_4_;
    iVar68 = local_658._4_4_;
    dVar100 = *(double *)(&DAT_0067f160 + (ulong)(((int)local_658 - 0x66U & 0xfffffffb) == 0) * 8);
    iVar62 = local_638._4_4_;
    iVar24 = (int)uStack_624;
    do {
      iVar60 = (int)vStack_740.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_710 != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar60 = (local_710->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(int)vStack_740.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage];
      }
      if (*(int *)(*(long *)((long)local_888[local_6a0]._M_t.
                                   super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                            + 0xf0) + (long)iVar60 * 4) != 0) {
        MFIter::tilebox(&local_5d4,(MFIter *)local_750);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_8c8,local_6b0,(MFIter *)local_750);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_6f0,local_548,(MFIter *)local_750);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_868,local_510,(MFIter *)local_750);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_698,this_02,(MFIter *)local_750);
        lVar20 = local_6a0;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_5b8,
                   (FabArray<amrex::IArrayBox> *)
                   puVar11[local_6a0]._M_t.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                   (MFIter *)local_750);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_618,
                   (FabArray<amrex::IArrayBox> *)
                   puVar10[lVar20]._M_t.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                   (MFIter *)local_750);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_790,(FabArray<amrex::FArrayBox> *)local_508,(MFIter *)local_750);
        this_03 = (FabArray<amrex::FArrayBox> *)*puVar12;
        if (this_03 == (FabArray<amrex::FArrayBox> *)0x0) {
          if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
            dVar104 = this->m_const_sigma;
            lVar45 = (long)local_5d4.smallend.vect[0];
            lVar20 = lVar45 * 8;
            lVar38 = lVar45 * 4;
            iVar60 = local_5d4.smallend.vect[2];
            do {
              if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
                iVar30 = iVar60 + -1;
                lVar46 = (long)local_5d4.smallend.vect[1];
                do {
                  iVar29 = (int)lVar46;
                  if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                    lVar31 = lVar46 + -1;
                    lVar54 = lVar31 - local_618.begin.y;
                    lVar36 = lVar46 - local_6f0.begin.y;
                    lVar63 = lVar31 - local_6f0.begin.y;
                    lVar57 = lVar46 - local_618.begin.y;
                    lVar69 = CONCAT44(local_618.jstride._4_4_,(int)local_618.jstride);
                    lVar74 = CONCAT44(local_618.kstride._4_4_,(uint)local_618.kstride) *
                             (long)(iVar60 - local_618.begin.z);
                    lVar83 = lVar57 * lVar69 * 4;
                    lVar43 = lVar69 * 4 * lVar54;
                    lVar78 = local_6f0.jstride * lVar36;
                    lVar79 = local_6f0.jstride * lVar63;
                    lVar70 = (long)((iVar29 + 1) - local_6f0.begin.y);
                    lVar82 = local_6f0.jstride * lVar70;
                    lVar84 = local_6f0.jstride * 8;
                    lVar36 = lVar36 * lVar84;
                    lVar63 = lVar63 * lVar84;
                    lVar84 = lVar84 * lVar70;
                    lVar32 = local_6f0.kstride * (iVar60 - local_6f0.begin.z);
                    lVar39 = local_6f0.kstride * (iVar30 - local_6f0.begin.z);
                    lVar17 = (long)((iVar60 + 1) - local_6f0.begin.z);
                    lVar40 = local_6f0.kstride * lVar17;
                    lVar21 = local_6f0.kstride * 8;
                    lVar70 = (iVar30 - local_6f0.begin.z) * lVar21;
                    lVar35 = (iVar60 - local_6f0.begin.z) * lVar21;
                    lVar21 = lVar21 * lVar17;
                    lVar64 = (long)local_6f0.begin.x;
                    iVar51 = (local_5d4.smallend.vect[0] + 1) - local_6f0.begin.x;
                    lVar17 = lVar36 + lVar70 + lVar64 * -8 + lVar20;
                    lVar18 = lVar36 + lVar35 + lVar64 * -8 + lVar20;
                    lVar19 = lVar63 + lVar70 + lVar64 * -8 + lVar20;
                    lVar33 = lVar63 + lVar35 + lVar64 * -8 + lVar20;
                    lVar34 = lVar70 + lVar84 + lVar64 * -8 + lVar20;
                    lVar35 = lVar35 + lVar84 + lVar64 * -8 + lVar20;
                    lVar36 = lVar36 + lVar21 + lVar64 * -8 + lVar20;
                    lVar63 = lVar63 + lVar21 + lVar64 * -8 + lVar20;
                    lVar64 = lVar21 + lVar84 + lVar64 * -8 + lVar20;
                    lVar42 = CONCAT44(local_618.kstride._4_4_,(uint)local_618.kstride) * 4;
                    lVar37 = (iVar30 - local_618.begin.z) * lVar42;
                    lVar42 = lVar42 * (iVar60 - local_618.begin.z);
                    lVar84 = (long)local_618.begin.x;
                    lVar70 = CONCAT44(local_618.p._4_4_,(int)local_618.p);
                    lVar21 = lVar70 + lVar38;
                    lVar66 = lVar83 + lVar37 + lVar84 * -4 + lVar21;
                    lVar65 = lVar37 + lVar43 + lVar84 * -4 + lVar21;
                    lVar37 = (long)local_b64;
                    lVar41 = (long)local_b58;
                    lVar50 = 0;
                    do {
                      if ((*(int *)((long)local_698.p +
                                   lVar50 * 4 +
                                   (lVar46 - local_698.begin.y) * local_698.jstride * 4 +
                                   (iVar60 - local_698.begin.z) * local_698.kstride * 4 +
                                   (long)local_698.begin.x * -4 + lVar38) == 0) &&
                         (*(int *)((long)local_5b8.p +
                                  lVar50 * 4 +
                                  (iVar60 - local_5b8.begin.z) * local_5b8.kstride * 4 +
                                  (lVar46 - local_5b8.begin.y) * local_5b8.jstride * 4 +
                                  (long)local_5b8.begin.x * -4 + lVar38) == 1)) {
                        lVar55 = lVar45 + lVar50;
                        lVar58 = lVar45 + lVar50 + -1;
                        dVar105 = 0.0;
                        if (((lVar37 < lVar55) &&
                            (((lVar58 <= lVar41 && (local_b60 < lVar46)) && (lVar31 <= local_b54))))
                           && (((local_b5c < iVar60 && (iVar30 <= local_b50)) &&
                               (*(int *)(lVar65 + -4 + lVar50 * 4) == 0)))) {
                          dVar105 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18 + -8);
                          dVar90 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar33 + -8);
                          dVar92 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar17 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar19 + -8);
                          dVar94 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar33);
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar17);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar19);
                          dVar105 = (((dVar93 - dVar91) +
                                     (dVar96 - dVar94) + (dVar96 - dVar94) +
                                     (dVar95 - dVar90) * 4.0 +
                                     (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                    ((dVar93 - dVar96) +
                                    (dVar92 - dVar95) + (dVar92 - dVar95) +
                                    (dVar105 - dVar90) * 4.0 + (dVar91 - dVar94) + (dVar91 - dVar94)
                                    ) * dVar102 +
                                    ((dVar93 - dVar92) +
                                    (dVar96 - dVar95) + (dVar96 - dVar95) +
                                    (dVar94 - dVar90) * 4.0 +
                                    (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) * dVar104 +
                                    0.0;
                        }
                        iVar44 = (int)lVar50;
                        if (((lVar37 <= lVar55) && (lVar55 <= lVar41)) &&
                           ((local_b60 < lVar46 &&
                            ((((lVar31 <= local_b54 && (local_b5c < iVar60)) &&
                              (iVar30 <= local_b50)) && (*(int *)(lVar65 + lVar50 * 4) == 0)))))) {
                          lVar59 = (long)(iVar51 + iVar44);
                          dVar90 = local_6f0.p[lVar78 + lVar59 + lVar32];
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar92 = local_6f0.p[lVar79 + lVar59 + lVar32];
                          dVar93 = local_6f0.p[lVar78 + lVar59 + lVar39];
                          dVar94 = local_6f0.p[lVar79 + lVar59 + lVar39];
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar33);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar17);
                          dVar111 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar19);
                          dVar105 = dVar105 + (((dVar94 - dVar92) +
                                               (dVar111 - dVar95) + (dVar111 - dVar95) +
                                               (dVar96 - dVar91) * 4.0 +
                                               (dVar93 - dVar90) + (dVar93 - dVar90)) * dVar101 +
                                              ((dVar94 - dVar111) +
                                              (dVar93 - dVar96) + (dVar93 - dVar96) +
                                              (dVar90 - dVar91) * 4.0 +
                                              (dVar92 - dVar95) + (dVar92 - dVar95)) * dVar102 +
                                              ((dVar94 - dVar93) +
                                              (dVar111 - dVar96) + (dVar111 - dVar96) +
                                              (dVar95 - dVar91) * 4.0 +
                                              (dVar92 - dVar90) + (dVar92 - dVar90)) * dVar103) *
                                              dVar104;
                        }
                        if (((lVar37 < lVar55) && (lVar58 <= lVar41)) &&
                           ((((local_b60 <= lVar46 &&
                              ((lVar46 <= local_b54 && (local_b5c < iVar60)))) &&
                             (iVar30 <= local_b50)) && (*(int *)(lVar66 + -4 + lVar50 * 4) == 0))))
                        {
                          dVar90 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18 + -8);
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar92 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar35 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar17 + -8);
                          dVar94 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar34 + -8);
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar35);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar17);
                          dVar111 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar34);
                          dVar105 = dVar105 + (((dVar94 - dVar92) +
                                               (dVar111 - dVar95) + (dVar111 - dVar95) +
                                               (dVar96 - dVar91) * 4.0 +
                                               (dVar93 - dVar90) + (dVar93 - dVar90)) * dVar101 +
                                              ((dVar94 - dVar111) +
                                              (dVar93 - dVar96) + (dVar93 - dVar96) +
                                              (dVar90 - dVar91) * 4.0 +
                                              (dVar92 - dVar95) + (dVar92 - dVar95)) * dVar102 +
                                              ((dVar94 - dVar93) +
                                              (dVar111 - dVar96) + (dVar111 - dVar96) +
                                              (dVar95 - dVar91) * 4.0 +
                                              (dVar92 - dVar90) + (dVar92 - dVar90)) * dVar103) *
                                              dVar104;
                        }
                        if ((((lVar37 <= lVar55) && (lVar55 <= lVar41)) && (local_b60 <= lVar46)) &&
                           (((lVar46 <= local_b54 && (local_b5c < iVar60)) &&
                            ((iVar30 <= local_b50 && (*(int *)(lVar66 + lVar50 * 4) == 0)))))) {
                          lVar59 = (long)(iVar51 + iVar44);
                          dVar90 = local_6f0.p[lVar78 + lVar59 + lVar32];
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar92 = local_6f0.p[lVar82 + lVar59 + lVar32];
                          dVar93 = local_6f0.p[lVar78 + lVar59 + lVar39];
                          dVar94 = local_6f0.p[lVar82 + lVar59 + lVar39];
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar35);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar17);
                          dVar111 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar34);
                          dVar105 = dVar105 + (((dVar94 - dVar92) +
                                               (dVar111 - dVar95) + (dVar111 - dVar95) +
                                               (dVar96 - dVar91) * 4.0 +
                                               (dVar93 - dVar90) + (dVar93 - dVar90)) * dVar101 +
                                              ((dVar94 - dVar111) +
                                              (dVar93 - dVar96) + (dVar93 - dVar96) +
                                              (dVar90 - dVar91) * 4.0 +
                                              (dVar92 - dVar95) + (dVar92 - dVar95)) * dVar102 +
                                              ((dVar94 - dVar93) +
                                              (dVar111 - dVar96) + (dVar111 - dVar96) +
                                              (dVar95 - dVar91) * 4.0 +
                                              (dVar92 - dVar90) + (dVar92 - dVar90)) * dVar103) *
                                              dVar104;
                        }
                        if ((((lVar37 < lVar55) && (lVar58 <= lVar41)) &&
                            ((local_b60 < lVar46 &&
                             (((lVar31 <= local_b54 && (local_b5c <= iVar60)) &&
                              (iVar60 <= local_b50)))))) &&
                           (*(int *)(lVar70 + (lVar69 * lVar54 + lVar45 + lVar74) * 4 + lVar84 * -4
                                     + -4 + lVar50 * 4) == 0)) {
                          dVar90 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18 + -8);
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar92 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar33 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar36 + -8);
                          dVar94 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar63 + -8);
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar33);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar36);
                          dVar111 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar63);
                          dVar105 = dVar105 + (((dVar94 - dVar92) +
                                               (dVar111 - dVar95) + (dVar111 - dVar95) +
                                               (dVar96 - dVar91) * 4.0 +
                                               (dVar93 - dVar90) + (dVar93 - dVar90)) * dVar101 +
                                              ((dVar94 - dVar111) +
                                              (dVar93 - dVar96) + (dVar93 - dVar96) +
                                              (dVar90 - dVar91) * 4.0 +
                                              (dVar92 - dVar95) + (dVar92 - dVar95)) * dVar102 +
                                              ((dVar94 - dVar93) +
                                              (dVar111 - dVar96) + (dVar111 - dVar96) +
                                              (dVar95 - dVar91) * 4.0 +
                                              (dVar92 - dVar90) + (dVar92 - dVar90)) * dVar103) *
                                              dVar104;
                        }
                        if (((((lVar37 <= lVar55) && (lVar55 <= lVar41)) &&
                             ((local_b60 < lVar46 &&
                              ((lVar31 <= local_b54 && (local_b5c <= iVar60)))))) &&
                            (iVar60 <= local_b50)) &&
                           (*(int *)(lVar43 + lVar42 + lVar84 * -4 + lVar21 + lVar50 * 4) == 0)) {
                          lVar59 = (long)(iVar51 + iVar44);
                          dVar90 = local_6f0.p[lVar78 + lVar59 + lVar32];
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar92 = local_6f0.p[lVar79 + lVar59 + lVar32];
                          dVar93 = local_6f0.p[lVar78 + lVar59 + lVar40];
                          dVar94 = local_6f0.p[lVar79 + lVar59 + lVar40];
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar33);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar36);
                          dVar111 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar63);
                          dVar105 = dVar105 + (((dVar94 - dVar92) +
                                               (dVar111 - dVar95) + (dVar111 - dVar95) +
                                               (dVar96 - dVar91) * 4.0 +
                                               (dVar93 - dVar90) + (dVar93 - dVar90)) * dVar101 +
                                              ((dVar94 - dVar111) +
                                              (dVar93 - dVar96) + (dVar93 - dVar96) +
                                              (dVar90 - dVar91) * 4.0 +
                                              (dVar92 - dVar95) + (dVar92 - dVar95)) * dVar102 +
                                              ((dVar94 - dVar93) +
                                              (dVar111 - dVar96) + (dVar111 - dVar96) +
                                              (dVar95 - dVar91) * 4.0 +
                                              (dVar92 - dVar90) + (dVar92 - dVar90)) * dVar103) *
                                              dVar104;
                        }
                        if ((((((lVar37 < lVar55) && (lVar58 <= lVar41)) && (local_b60 <= lVar46))
                             && ((lVar46 <= local_b54 && (local_b5c <= iVar60)))) &&
                            (iVar60 <= local_b50)) &&
                           (*(int *)(lVar70 + (lVar69 * lVar57 + lVar45 + lVar74) * 4 + lVar84 * -4
                                     + -4 + lVar50 * 4) == 0)) {
                          dVar90 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18 + -8);
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar92 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar35 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar36 + -8);
                          dVar94 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar64 + -8);
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar35);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar36);
                          dVar111 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar64);
                          dVar105 = dVar105 + (((dVar94 - dVar92) +
                                               (dVar111 - dVar95) + (dVar111 - dVar95) +
                                               (dVar96 - dVar91) * 4.0 +
                                               (dVar93 - dVar90) + (dVar93 - dVar90)) * dVar101 +
                                              ((dVar94 - dVar111) +
                                              (dVar93 - dVar96) + (dVar93 - dVar96) +
                                              (dVar90 - dVar91) * 4.0 +
                                              (dVar92 - dVar95) + (dVar92 - dVar95)) * dVar102 +
                                              ((dVar94 - dVar93) +
                                              (dVar111 - dVar96) + (dVar111 - dVar96) +
                                              (dVar95 - dVar91) * 4.0 +
                                              (dVar92 - dVar90) + (dVar92 - dVar90)) * dVar103) *
                                              dVar104;
                        }
                        if ((((lVar37 <= lVar55) && (lVar55 <= lVar41)) &&
                            ((local_b60 <= lVar46 &&
                             (((lVar46 <= local_b54 && (local_b5c <= iVar60)) &&
                              (iVar60 <= local_b50)))))) &&
                           (*(int *)(lVar42 + lVar83 + lVar84 * -4 + lVar21 + lVar50 * 4) == 0)) {
                          lVar55 = (long)(iVar51 + iVar44);
                          dVar90 = local_6f0.p[lVar78 + lVar55 + lVar32];
                          dVar91 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar18);
                          dVar92 = local_6f0.p[lVar82 + lVar55 + lVar32];
                          dVar93 = local_6f0.p[lVar78 + lVar55 + lVar40];
                          dVar94 = local_6f0.p[lVar82 + lVar55 + lVar40];
                          dVar95 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar35);
                          dVar96 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar36);
                          dVar111 = *(double *)((long)local_6f0.p + lVar50 * 8 + lVar64);
                          dVar105 = dVar105 + (((dVar94 - dVar92) +
                                               (dVar111 - dVar95) + (dVar111 - dVar95) +
                                               (dVar96 - dVar91) * 4.0 +
                                               (dVar93 - dVar90) + (dVar93 - dVar90)) * dVar101 +
                                              ((dVar94 - dVar111) +
                                              (dVar93 - dVar96) + (dVar93 - dVar96) +
                                              (dVar90 - dVar91) * 4.0 +
                                              (dVar92 - dVar95) + (dVar92 - dVar95)) * dVar102 +
                                              ((dVar94 - dVar93) +
                                              (dVar111 - dVar96) + (dVar111 - dVar96) +
                                              (dVar95 - dVar91) * 4.0 +
                                              (dVar92 - dVar90) + (dVar92 - dVar90)) * dVar103) *
                                              dVar104;
                        }
                        dVar90 = 1.0;
                        if (bVar88) {
                          if (((lVar16 - lVar45 != lVar50) ||
                              ((dVar90 = 2.0, iVar85 != 0x66 && (dVar90 = 2.0, iVar85 != 0x6a)))) &&
                             (dVar90 = 1.0, iVar56 - local_5d4.smallend.vect[0] == iVar44)) {
                            dVar90 = dVar100;
                          }
                          if (((iVar62 == iVar29) && ((iVar73 == 0x6a || (iVar73 == 0x66)))) ||
                             ((iVar61 == iVar29 && ((iVar68 == 0x6a || (iVar68 == 0x66)))))) {
                            dVar90 = dVar90 + dVar90;
                          }
                          if (((iVar2 == iVar60) && ((LVar4 == inflow || (LVar4 == Neumann)))) ||
                             ((iVar24 == iVar60 && ((LVar3 == inflow || (LVar3 == Neumann)))))) {
                            dVar90 = dVar90 + dVar90;
                          }
                        }
                        local_8c8.p
                        [lVar45 + (((lVar46 - local_8c8.begin.y) * local_8c8.jstride +
                                   (iVar60 - local_8c8.begin.z) * local_8c8.kstride + lVar50) -
                                  (long)local_8c8.begin.x)] =
                             (double)(*(double *)
                                       ((long)(iVar60 - local_868.begin.z) *
                                        CONCAT44(local_868.kstride._4_4_,(int)local_868.kstride) * 8
                                        + (lVar46 - local_868.begin.y) *
                                          CONCAT44(local_868.jstride._4_4_,(int)local_868.jstride) *
                                          8 + (long)local_868.begin.x * -8 +
                                        CONCAT44(local_868.p._4_4_,(int)local_868.p) + lVar20 +
                                       lVar50 * 8) -
                                     (dVar105 +
                                     *(double *)
                                      ((long)(iVar60 - local_790.begin.z) *
                                       CONCAT44(local_790.kstride._4_4_,(int)local_790.kstride) * 8
                                       + (lVar46 - local_790.begin.y) *
                                         CONCAT44(local_790.jstride._4_4_,(int)local_790.jstride) *
                                         8 + (long)local_790.begin.x * -8 +
                                       CONCAT44(local_790.p._4_4_,(int)local_790.p) + lVar20 +
                                      lVar50 * 8)) * dVar90);
                      }
                      lVar50 = lVar50 + 1;
                    } while ((local_5d4.bigend.vect[0] - local_5d4.smallend.vect[0]) + 1 !=
                             (int)lVar50);
                  }
                  lVar46 = lVar46 + 1;
                } while (iVar29 + 1 != local_5d4.bigend.vect[1] + 1);
              }
              iVar60 = iVar60 + 1;
            } while (iVar60 != local_5d4.bigend.vect[2] + 1);
          }
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_388,this_03,(MFIter *)local_750);
          if (local_5d4.smallend.vect[2] <= local_5d4.bigend.vect[2]) {
            lVar45 = (long)local_5d4.smallend.vect[0];
            lVar20 = lVar45 * 8;
            lVar38 = lVar45 * 4;
            iVar60 = local_5d4.smallend.vect[2];
            do {
              if (local_5d4.smallend.vect[1] <= local_5d4.bigend.vect[1]) {
                iVar30 = iVar60 + -1;
                lVar46 = (long)local_5d4.smallend.vect[1];
                do {
                  iVar29 = (int)lVar46;
                  if (local_5d4.smallend.vect[0] <= local_5d4.bigend.vect[0]) {
                    lVar31 = lVar46 + -1;
                    lVar39 = lVar31 - local_618.begin.y;
                    lVar55 = lVar31 - local_388.begin.y;
                    lVar36 = lVar46 - local_6f0.begin.y;
                    lVar63 = lVar31 - local_6f0.begin.y;
                    lVar58 = lVar46 - local_618.begin.y;
                    lVar83 = lVar46 - local_388.begin.y;
                    lVar79 = local_388.kstride * (iVar60 - local_388.begin.z);
                    lVar69 = CONCAT44(local_618.jstride._4_4_,(int)local_618.jstride);
                    lVar65 = CONCAT44(local_618.kstride._4_4_,(uint)local_618.kstride) *
                             (long)(iVar60 - local_618.begin.z);
                    lVar59 = lVar83 * local_388.jstride * 8;
                    lVar75 = local_388.jstride * 8 * lVar55;
                    lVar71 = lVar58 * lVar69 * 4;
                    lVar80 = lVar69 * 4 * lVar39;
                    lVar82 = local_6f0.jstride * lVar36;
                    lVar84 = local_6f0.jstride * lVar63;
                    lVar70 = (long)((iVar29 + 1) - local_6f0.begin.y);
                    lVar21 = local_6f0.jstride * lVar70;
                    lVar64 = local_6f0.jstride * 8;
                    lVar36 = lVar36 * lVar64;
                    lVar63 = lVar63 * lVar64;
                    lVar64 = lVar64 * lVar70;
                    lVar40 = local_6f0.kstride * (iVar60 - local_6f0.begin.z);
                    lVar41 = local_6f0.kstride * (iVar30 - local_6f0.begin.z);
                    lVar17 = (long)((iVar60 + 1) - local_6f0.begin.z);
                    lVar54 = local_6f0.kstride * lVar17;
                    lVar70 = local_6f0.kstride * 8;
                    lVar34 = (iVar30 - local_6f0.begin.z) * lVar70;
                    lVar35 = (iVar60 - local_6f0.begin.z) * lVar70;
                    lVar70 = lVar70 * lVar17;
                    lVar74 = (long)local_6f0.begin.x;
                    iVar51 = (local_5d4.smallend.vect[0] + 1) - local_6f0.begin.x;
                    lVar17 = lVar36 + lVar34 + lVar74 * -8 + lVar20;
                    lVar18 = lVar36 + lVar35 + lVar74 * -8 + lVar20;
                    lVar19 = lVar63 + lVar34 + lVar74 * -8 + lVar20;
                    lVar33 = lVar63 + lVar35 + lVar74 * -8 + lVar20;
                    lVar34 = lVar34 + lVar64 + lVar74 * -8 + lVar20;
                    lVar35 = lVar35 + lVar64 + lVar74 * -8 + lVar20;
                    lVar36 = lVar36 + lVar70 + lVar74 * -8 + lVar20;
                    lVar63 = lVar63 + lVar70 + lVar74 * -8 + lVar20;
                    lVar64 = lVar70 + lVar64 + lVar74 * -8 + lVar20;
                    lVar86 = CONCAT44(local_618.kstride._4_4_,(uint)local_618.kstride) * 4;
                    lVar74 = (iVar30 - local_618.begin.z) * lVar86;
                    lVar86 = lVar86 * (iVar60 - local_618.begin.z);
                    lVar78 = (long)(iVar30 - local_388.begin.z) * local_388.kstride * 8;
                    lVar42 = local_388.kstride * 8 * (long)(iVar60 - local_388.begin.z);
                    lVar66 = (long)local_618.begin.x;
                    lVar70 = CONCAT44(local_618.p._4_4_,(int)local_618.p);
                    lVar32 = lVar70 + lVar38;
                    lVar37 = lVar71 + lVar74 + lVar66 * -4 + lVar32;
                    lVar67 = lVar74 + lVar80 + lVar66 * -4 + lVar32;
                    lVar57 = (long)local_388.begin.x;
                    lVar74 = lVar59 + lVar78 + lVar57 * -8 + lVar20;
                    lVar78 = lVar78 + lVar75 + lVar57 * -8 + lVar20;
                    lVar87 = (long)local_b64;
                    lVar50 = (long)local_b58;
                    lVar43 = 0;
                    do {
                      if ((*(int *)((long)local_698.p +
                                   lVar43 * 4 +
                                   (lVar46 - local_698.begin.y) * local_698.jstride * 4 +
                                   (iVar60 - local_698.begin.z) * local_698.kstride * 4 +
                                   (long)local_698.begin.x * -4 + lVar38) == 0) &&
                         (*(int *)((long)local_5b8.p +
                                  lVar43 * 4 +
                                  (iVar60 - local_5b8.begin.z) * local_5b8.kstride * 4 +
                                  (lVar46 - local_5b8.begin.y) * local_5b8.jstride * 4 +
                                  (long)local_5b8.begin.x * -4 + lVar38) == 1)) {
                        lVar23 = lVar45 + lVar43;
                        lVar72 = lVar45 + lVar43 + -1;
                        dVar104 = 0.0;
                        if (((lVar87 < lVar23) &&
                            (((lVar72 <= lVar50 && (local_b60 < lVar46)) && (lVar31 <= local_b54))))
                           && (((local_b5c < iVar60 && (iVar30 <= local_b50)) &&
                               (*(int *)(lVar67 + -4 + lVar43 * 4) == 0)))) {
                          dVar104 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18 + -8);
                          dVar105 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar33 + -8);
                          dVar91 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar17 + -8);
                          dVar92 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar19 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar33);
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar17);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar19);
                          dVar104 = (((dVar92 - dVar90) +
                                     (dVar95 - dVar93) + (dVar95 - dVar93) +
                                     (dVar94 - dVar105) * 4.0 +
                                     (dVar91 - dVar104) + (dVar91 - dVar104)) * dVar101 +
                                    ((dVar92 - dVar95) +
                                    (dVar91 - dVar94) + (dVar91 - dVar94) +
                                    (dVar104 - dVar105) * 4.0 +
                                    (dVar90 - dVar93) + (dVar90 - dVar93)) * dVar102 +
                                    ((dVar92 - dVar91) +
                                    (dVar95 - dVar94) + (dVar95 - dVar94) +
                                    (dVar93 - dVar105) * 4.0 +
                                    (dVar90 - dVar104) + (dVar90 - dVar104)) * dVar103) *
                                    *(double *)((long)local_388.p + lVar43 * 8 + lVar78 + -8) + 0.0;
                        }
                        iVar44 = (int)lVar43;
                        if (((lVar87 <= lVar23) && (lVar23 <= lVar50)) &&
                           ((local_b60 < lVar46 &&
                            ((((lVar31 <= local_b54 && (local_b5c < iVar60)) &&
                              (iVar30 <= local_b50)) && (*(int *)(lVar67 + lVar43 * 4) == 0)))))) {
                          lVar22 = (long)(iVar51 + iVar44);
                          dVar105 = local_6f0.p[lVar82 + lVar22 + lVar40];
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar91 = local_6f0.p[lVar84 + lVar22 + lVar40];
                          dVar92 = local_6f0.p[lVar82 + lVar22 + lVar41];
                          dVar93 = local_6f0.p[lVar84 + lVar22 + lVar41];
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar33);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar17);
                          dVar96 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar19);
                          dVar104 = dVar104 + (((dVar93 - dVar91) +
                                               (dVar96 - dVar94) + (dVar96 - dVar94) +
                                               (dVar95 - dVar90) * 4.0 +
                                               (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                              ((dVar93 - dVar96) +
                                              (dVar92 - dVar95) + (dVar92 - dVar95) +
                                              (dVar105 - dVar90) * 4.0 +
                                              (dVar91 - dVar94) + (dVar91 - dVar94)) * dVar102 +
                                              ((dVar93 - dVar92) +
                                              (dVar96 - dVar95) + (dVar96 - dVar95) +
                                              (dVar94 - dVar90) * 4.0 +
                                              (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) *
                                              *(double *)((long)local_388.p + lVar43 * 8 + lVar78);
                        }
                        if (((lVar87 < lVar23) && (lVar72 <= lVar50)) &&
                           ((((local_b60 <= lVar46 &&
                              ((lVar46 <= local_b54 && (local_b5c < iVar60)))) &&
                             (iVar30 <= local_b50)) && (*(int *)(lVar37 + -4 + lVar43 * 4) == 0))))
                        {
                          dVar105 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18 + -8);
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar91 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar35 + -8);
                          dVar92 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar17 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar34 + -8);
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar35);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar17);
                          dVar96 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar34);
                          dVar104 = dVar104 + (((dVar93 - dVar91) +
                                               (dVar96 - dVar94) + (dVar96 - dVar94) +
                                               (dVar95 - dVar90) * 4.0 +
                                               (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                              ((dVar93 - dVar96) +
                                              (dVar92 - dVar95) + (dVar92 - dVar95) +
                                              (dVar105 - dVar90) * 4.0 +
                                              (dVar91 - dVar94) + (dVar91 - dVar94)) * dVar102 +
                                              ((dVar93 - dVar92) +
                                              (dVar96 - dVar95) + (dVar96 - dVar95) +
                                              (dVar94 - dVar90) * 4.0 +
                                              (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) *
                                              *(double *)
                                               ((long)local_388.p + lVar43 * 8 + lVar74 + -8);
                        }
                        if ((((lVar87 <= lVar23) && (lVar23 <= lVar50)) && (local_b60 <= lVar46)) &&
                           (((lVar46 <= local_b54 && (local_b5c < iVar60)) &&
                            ((iVar30 <= local_b50 && (*(int *)(lVar37 + lVar43 * 4) == 0)))))) {
                          lVar22 = (long)(iVar51 + iVar44);
                          dVar105 = local_6f0.p[lVar82 + lVar22 + lVar40];
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar91 = local_6f0.p[lVar21 + lVar22 + lVar40];
                          dVar92 = local_6f0.p[lVar82 + lVar22 + lVar41];
                          dVar93 = local_6f0.p[lVar21 + lVar22 + lVar41];
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar35);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar17);
                          dVar96 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar34);
                          dVar104 = dVar104 + (((dVar93 - dVar91) +
                                               (dVar96 - dVar94) + (dVar96 - dVar94) +
                                               (dVar95 - dVar90) * 4.0 +
                                               (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                              ((dVar93 - dVar96) +
                                              (dVar92 - dVar95) + (dVar92 - dVar95) +
                                              (dVar105 - dVar90) * 4.0 +
                                              (dVar91 - dVar94) + (dVar91 - dVar94)) * dVar102 +
                                              ((dVar93 - dVar92) +
                                              (dVar96 - dVar95) + (dVar96 - dVar95) +
                                              (dVar94 - dVar90) * 4.0 +
                                              (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) *
                                              *(double *)((long)local_388.p + lVar43 * 8 + lVar74);
                        }
                        if ((((lVar87 < lVar23) && (lVar72 <= lVar50)) &&
                            ((local_b60 < lVar46 &&
                             (((lVar31 <= local_b54 && (local_b5c <= iVar60)) &&
                              (iVar60 <= local_b50)))))) &&
                           (*(int *)((lVar69 * lVar39 + lVar45 + lVar65) * 4 + lVar66 * -4 + lVar70
                                     + -4 + lVar43 * 4) == 0)) {
                          dVar105 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18 + -8);
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar91 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar33 + -8);
                          dVar92 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar36 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar63 + -8);
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar33);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar36);
                          dVar96 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar63);
                          dVar104 = dVar104 + (((dVar93 - dVar91) +
                                               (dVar96 - dVar94) + (dVar96 - dVar94) +
                                               (dVar95 - dVar90) * 4.0 +
                                               (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                              ((dVar93 - dVar96) +
                                              (dVar92 - dVar95) + (dVar92 - dVar95) +
                                              (dVar105 - dVar90) * 4.0 +
                                              (dVar91 - dVar94) + (dVar91 - dVar94)) * dVar102 +
                                              ((dVar93 - dVar92) +
                                              (dVar96 - dVar95) + (dVar96 - dVar95) +
                                              (dVar94 - dVar90) * 4.0 +
                                              (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) *
                                              local_388.p
                                              [(local_388.jstride * lVar55 + lVar45 + lVar79 +
                                               lVar43 + -1) - lVar57];
                        }
                        if ((((lVar87 <= lVar23) && (lVar23 <= lVar50)) &&
                            ((local_b60 < lVar46 && ((lVar31 <= local_b54 && (local_b5c <= iVar60)))
                             ))) && ((iVar60 <= local_b50 &&
                                     (*(int *)(lVar80 + lVar86 + lVar66 * -4 + lVar32 + lVar43 * 4)
                                      == 0)))) {
                          lVar22 = (long)(iVar51 + iVar44);
                          dVar105 = local_6f0.p[lVar82 + lVar22 + lVar40];
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar91 = local_6f0.p[lVar84 + lVar22 + lVar40];
                          dVar92 = local_6f0.p[lVar82 + lVar22 + lVar54];
                          dVar93 = local_6f0.p[lVar84 + lVar22 + lVar54];
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar33);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar36);
                          dVar96 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar63);
                          dVar104 = dVar104 + (((dVar93 - dVar91) +
                                               (dVar96 - dVar94) + (dVar96 - dVar94) +
                                               (dVar95 - dVar90) * 4.0 +
                                               (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                              ((dVar93 - dVar96) +
                                              (dVar92 - dVar95) + (dVar92 - dVar95) +
                                              (dVar105 - dVar90) * 4.0 +
                                              (dVar91 - dVar94) + (dVar91 - dVar94)) * dVar102 +
                                              ((dVar93 - dVar92) +
                                              (dVar96 - dVar95) + (dVar96 - dVar95) +
                                              (dVar94 - dVar90) * 4.0 +
                                              (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) *
                                              *(double *)
                                               ((long)local_388.p +
                                               lVar43 * 8 + lVar75 + lVar42 + lVar57 * -8 + lVar20);
                        }
                        if (((((lVar87 < lVar23) && (lVar72 <= lVar50)) && (local_b60 <= lVar46)) &&
                            ((lVar46 <= local_b54 && (local_b5c <= iVar60)))) &&
                           ((iVar60 <= local_b50 &&
                            (*(int *)(lVar70 + (lVar69 * lVar58 + lVar45 + lVar65) * 4 + lVar66 * -4
                                      + -4 + lVar43 * 4) == 0)))) {
                          dVar105 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18 + -8);
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar91 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar35 + -8);
                          dVar92 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar36 + -8);
                          dVar93 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar64 + -8);
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar35);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar36);
                          dVar96 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar64);
                          dVar104 = dVar104 + (((dVar93 - dVar91) +
                                               (dVar96 - dVar94) + (dVar96 - dVar94) +
                                               (dVar95 - dVar90) * 4.0 +
                                               (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                              ((dVar93 - dVar96) +
                                              (dVar92 - dVar95) + (dVar92 - dVar95) +
                                              (dVar105 - dVar90) * 4.0 +
                                              (dVar91 - dVar94) + (dVar91 - dVar94)) * dVar102 +
                                              ((dVar93 - dVar92) +
                                              (dVar96 - dVar95) + (dVar96 - dVar95) +
                                              (dVar94 - dVar90) * 4.0 +
                                              (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) *
                                              local_388.p
                                              [(local_388.jstride * lVar83 + lVar45 + lVar79 +
                                               lVar43 + -1) - lVar57];
                        }
                        if (((lVar87 <= lVar23) && (lVar23 <= lVar50)) &&
                           (((local_b60 <= lVar46 &&
                             (((lVar46 <= local_b54 && (local_b5c <= iVar60)) &&
                              (iVar60 <= local_b50)))) &&
                            (*(int *)(lVar86 + lVar71 + lVar66 * -4 + lVar32 + lVar43 * 4) == 0))))
                        {
                          lVar23 = (long)(iVar51 + iVar44);
                          dVar105 = local_6f0.p[lVar82 + lVar23 + lVar40];
                          dVar90 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar18);
                          dVar91 = local_6f0.p[lVar21 + lVar23 + lVar40];
                          dVar92 = local_6f0.p[lVar82 + lVar23 + lVar54];
                          dVar93 = local_6f0.p[lVar21 + lVar23 + lVar54];
                          dVar94 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar35);
                          dVar95 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar36);
                          dVar96 = *(double *)((long)local_6f0.p + lVar43 * 8 + lVar64);
                          dVar104 = dVar104 + (((dVar93 - dVar91) +
                                               (dVar96 - dVar94) + (dVar96 - dVar94) +
                                               (dVar95 - dVar90) * 4.0 +
                                               (dVar92 - dVar105) + (dVar92 - dVar105)) * dVar101 +
                                              ((dVar93 - dVar96) +
                                              (dVar92 - dVar95) + (dVar92 - dVar95) +
                                              (dVar105 - dVar90) * 4.0 +
                                              (dVar91 - dVar94) + (dVar91 - dVar94)) * dVar102 +
                                              ((dVar93 - dVar92) +
                                              (dVar96 - dVar95) + (dVar96 - dVar95) +
                                              (dVar94 - dVar90) * 4.0 +
                                              (dVar91 - dVar105) + (dVar91 - dVar105)) * dVar103) *
                                              *(double *)
                                               ((long)local_388.p +
                                               lVar43 * 8 + lVar42 + lVar59 + lVar57 * -8 + lVar20);
                        }
                        dVar105 = 1.0;
                        if (bVar88) {
                          if (((lVar16 - lVar45 != lVar43) ||
                              ((dVar105 = 2.0, iVar85 != 0x66 && (dVar105 = 2.0, iVar85 != 0x6a))))
                             && (dVar105 = 1.0, local_62c[0] - local_5d4.smallend.vect[0] == iVar44)
                             ) {
                            dVar105 = dVar100;
                          }
                          if ((local_638._4_4_ == iVar29) &&
                             ((local_648._4_4_ == 0x6a || (local_648._4_4_ == 0x66)))) {
                            dVar105 = dVar105 + dVar105;
                          }
                          else if ((local_62c[1] == iVar29) &&
                                  ((local_658._4_4_ == 0x6a || (local_658._4_4_ == 0x66)))) {
                            dVar105 = dVar105 + dVar105;
                          }
                          if (((local_630 == iVar60) && ((LVar4 == inflow || (LVar4 == Neumann))))
                             || (((int)uStack_624 == iVar60 &&
                                 ((LVar3 == inflow || (LVar3 == Neumann)))))) {
                            dVar105 = dVar105 + dVar105;
                          }
                        }
                        local_8c8.p
                        [lVar45 + (((lVar46 - local_8c8.begin.y) * local_8c8.jstride +
                                   (iVar60 - local_8c8.begin.z) * local_8c8.kstride + lVar43) -
                                  (long)local_8c8.begin.x)] =
                             (double)(*(double *)
                                       ((long)(iVar60 - local_868.begin.z) *
                                        CONCAT44(local_868.kstride._4_4_,(int)local_868.kstride) * 8
                                        + (lVar46 - local_868.begin.y) *
                                          CONCAT44(local_868.jstride._4_4_,(int)local_868.jstride) *
                                          8 + (long)local_868.begin.x * -8 +
                                        CONCAT44(local_868.p._4_4_,(int)local_868.p) + lVar20 +
                                       lVar43 * 8) -
                                     (dVar104 +
                                     *(double *)
                                      ((long)(iVar60 - local_790.begin.z) *
                                       CONCAT44(local_790.kstride._4_4_,(int)local_790.kstride) * 8
                                       + (lVar46 - local_790.begin.y) *
                                         CONCAT44(local_790.jstride._4_4_,(int)local_790.jstride) *
                                         8 + (long)local_790.begin.x * -8 +
                                       CONCAT44(local_790.p._4_4_,(int)local_790.p) + lVar20 +
                                      lVar43 * 8)) * dVar105);
                      }
                      lVar43 = lVar43 + 1;
                    } while ((local_5d4.bigend.vect[0] - local_5d4.smallend.vect[0]) + 1 !=
                             (int)lVar43);
                  }
                  lVar46 = lVar46 + 1;
                } while (iVar29 + 1 != local_5d4.bigend.vect[1] + 1);
              }
              iVar60 = iVar60 + 1;
            } while (iVar60 != local_5d4.bigend.vect[2] + 1);
          }
        }
      }
      MFIter::operator++((MFIter *)local_750);
    } while ((int)vStack_740.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_728);
  }
  MFIter::~MFIter((MFIter *)local_750);
  EB_set_covered((MultiFab *)local_6b0,0.0);
  MultiFab::~MultiFab((MultiFab *)local_508);
  MultiFab::~MultiFab((MultiFab *)local_330);
  if (local_7e0 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(((FabArray<amrex::FArrayBox> *)&local_7e0->super_FabArrayBase)->super_FabArrayBase).
      _vptr_FabArrayBase[1])();
  }
  MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
MLNodeLaplacian::reflux (int crse_amrlev,
                         MultiFab& res, const MultiFab& crse_sol, const MultiFab& crse_rhs,
                         MultiFab& a_fine_res, MultiFab& fine_sol, const MultiFab& fine_rhs) const
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(crse_amrlev,res,crse_sol,crse_rhs,a_fine_res,fine_sol,fine_rhs);
#else
    //
    //  Note that the residue we copmute on a coarse/fine node is not a
    //  composite divergence.  It has been restricted so that it is suitable
    //  as RHS for our geometric mulitgrid solver with a MG hirerachy
    //  including multiple AMR levels.
    //

    BL_PROFILE("MLNodeLaplacian::reflux()");

    const int amrrr = AMRRefRatio(crse_amrlev);
    AMREX_ALWAYS_ASSERT(amrrr == 2 || m_coarsening_strategy == CoarseningStrategy::Sigma);

    const Geometry& cgeom = m_geom[crse_amrlev  ][0];
    const Geometry& fgeom = m_geom[crse_amrlev+1][0];
    const auto cdxinv = cgeom.InvCellSizeArray();
    const auto fdxinv = fgeom.InvCellSizeArray();
    const Box& c_cc_domain = cgeom.Domain();
    const Box& c_cc_domain_p = cgeom.growPeriodicDomain(1);
    const Box& c_nd_domain = amrex::surroundingNodes(c_cc_domain);
    const Box& f_nd_domain = amrex::surroundingNodes(fgeom.Domain());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    bool neumann_doubling = false;
    if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            neumann_doubling = neumann_doubling || (lobc[idim] == LinOpBCType::inflow  ||
                                                    lobc[idim] == LinOpBCType::Neumann ||
                                                    hibc[idim] == LinOpBCType::inflow  ||
                                                    hibc[idim] == LinOpBCType::Neumann);
        }
    }

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const BoxArray& fba = fine_sol.boxArray();
    const DistributionMapping& fdm = fine_sol.DistributionMap();

    const iMultiFab& fdmsk = *m_dirichlet_mask[crse_amrlev+1][0];
    const auto& stencil    =  m_nosigma_stencil[crse_amrlev+1];

    MultiFab fine_res_for_coarse(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    std::unique_ptr<MultiFab> tmp_fine_res;
    if (amrrr == 4 && !a_fine_res.nGrowVect().allGE(IntVect(3))) {
        tmp_fine_res = std::make_unique<MultiFab>(a_fine_res.boxArray(),
                                                  a_fine_res.DistributionMap(), 1, 3);
        MultiFab::Copy(*tmp_fine_res, a_fine_res, 0, 0, 1, 0);
    }
    MultiFab& fine_res = (tmp_fine_res) ? *tmp_fine_res :  a_fine_res;

    fine_res.FillBoundary(fgeom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine_res_for_coarse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& cfab = fine_res_for_coarse.array(mfi);
        Array4<Real const> const& ffab = fine_res.const_array(mfi);
        Array4<int const> const& mfab = fdmsk.const_array(mfi);
        if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<2>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<4>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            }
        } else {
            Array4<Real const> const& stfab = stencil->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
            });
        }
    }
    res.ParallelCopy(fine_res_for_coarse, cgeom.periodicity());

    MultiFab fine_contrib(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    const auto& fsigma = m_sigma[crse_amrlev+1][0][0];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine_contrib,mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& cbx = mfi.tilebox();
        const Box& fvbx = amrex::refine(mfi.validbox(),amrrr);
        const Box& cc_fvbx = amrex::enclosedCells(fvbx);

        Array4<Real> const& farr = fine_contrib.array(mfi);
        Array4<Real const> const& resarr = fine_res.const_array(mfi);
        Array4<Real const> const& rhsarr = fine_rhs.const_array(mfi);
        Array4<Real const> const& solarr = fine_sol.const_array(mfi);
        Array4<int const> const& marr = fdmsk.const_array(mfi);

        if (fsigma) {
            Array4<Real const> const& sigarr = fsigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,is_rz,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,is_rz,fdxinv);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,fdxinv);
                });
            }
#endif
        } else {
            Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 1)
            amrex::ignore_unused(const_sigma);
#elif (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,is_rz,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,is_rz,fdxinv);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,fdxinv);
                });
            }
#endif
        }
    }

    MultiFab fine_contrib_on_crse(crse_sol.boxArray(), crse_sol.DistributionMap(), 1, 0);
    fine_contrib_on_crse.setVal(0.0);
    fine_contrib_on_crse.ParallelAdd(fine_contrib, cgeom.periodicity());

    const iMultiFab& cdmsk = *m_dirichlet_mask[crse_amrlev][0];
    const auto& nd_mask     = m_nd_fine_mask[crse_amrlev];
    const auto& cc_mask     = m_cc_fine_mask[crse_amrlev];
    const auto& has_fine_bndry = m_has_fine_bndry[crse_amrlev];

    const auto& csigma = m_sigma[crse_amrlev][0][0];

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(res,mfi_info); mfi.isValid(); ++mfi)
    {
        if ((*has_fine_bndry)[mfi])
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& resarr = res.array(mfi);
            Array4<Real const> const& csolarr = crse_sol.const_array(mfi);
            Array4<Real const> const& crhsarr = crse_rhs.const_array(mfi);
            Array4<int const> const& cdmskarr = cdmsk.const_array(mfi);
            Array4<int const> const& ndmskarr = nd_mask->const_array(mfi);
            Array4<int const> const& ccmskarr = cc_mask->const_array(mfi);
            Array4<Real const> const& fcocarr = fine_contrib_on_crse.const_array(mfi);

            if (csigma) {
                Array4<Real const> const& csigarr = csigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib(i,j,k,resarr,csolarr,crhsarr,csigarr,
                                           cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                           cdxinv,c_cc_domain_p,c_nd_domain,
                                           is_rz,
                                           lobc,hibc, neumann_doubling);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib(i,j,k,resarr,csolarr,crhsarr,csigarr,
                                           cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                           cdxinv,c_cc_domain_p,c_nd_domain,
                                           lobc,hibc, neumann_doubling);
                });
#endif
            } else {
                Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 1)
                amrex::ignore_unused(const_sigma);
#elif (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib_cs(i,j,k,resarr,csolarr,crhsarr,const_sigma,
                                              cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                              cdxinv,c_cc_domain_p,c_nd_domain,
                                              is_rz,
                                              lobc,hibc, neumann_doubling);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib_cs(i,j,k,resarr,csolarr,crhsarr,const_sigma,
                                              cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                              cdxinv,c_cc_domain_p,c_nd_domain,
                                              lobc,hibc, neumann_doubling);
                });
#endif
            }
        }
    }
#ifdef AMREX_USE_EB
    // Make sure to zero out the residual on any nodes completely surrounded by covered cells
    amrex::EB_set_covered(res,0.0);
#endif
#endif
}